

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<8,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  long lVar23;
  RTCFilterFunctionN p_Var24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  uint uVar92;
  ulong uVar93;
  ulong uVar94;
  long lVar95;
  uint uVar96;
  long lVar97;
  uint uVar98;
  uint uVar99;
  uint uVar100;
  bool bVar101;
  float fVar102;
  float fVar132;
  float fVar134;
  __m128 a;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar104;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar116 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar136;
  undefined1 auVar119 [32];
  float fVar103;
  undefined1 auVar120 [32];
  float fVar133;
  float fVar135;
  float fVar137;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar111 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar115 [16];
  undefined1 auVar131 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar141;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar173;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar172;
  float fVar174;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar175;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar192;
  float fVar193;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar194;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar182 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar198;
  float fVar225;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar223;
  float fVar224;
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar216 [32];
  float fVar229;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar230;
  float fVar253;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [28];
  float fVar252;
  float fVar254;
  float fVar255;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar256;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar291;
  float fVar292;
  undefined1 auVar294 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  float fVar257;
  float fVar258;
  float fVar281;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [28];
  float fVar277;
  float fVar279;
  float fVar283;
  float fVar285;
  undefined1 auVar266 [32];
  float fVar278;
  float fVar280;
  float fVar282;
  float fVar284;
  float fVar286;
  float fVar287;
  float fVar288;
  undefined1 auVar267 [32];
  float fVar289;
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar290;
  float fVar303;
  float fVar306;
  undefined1 auVar293 [16];
  float fVar304;
  float fVar305;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar313;
  float fVar314;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [28];
  float fVar312;
  float fVar315;
  undefined1 auVar298 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [64];
  undefined1 auVar322 [16];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [16];
  float fVar340;
  float fVar341;
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar342 [16];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  float fVar349;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [64];
  float fVar365;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [64];
  undefined1 auVar382 [16];
  float fVar381;
  float fVar391;
  float fVar392;
  float fVar394;
  float fVar395;
  float fVar396;
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  float fVar393;
  float fVar397;
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar400 [16];
  float fVar398;
  float fVar399;
  float fVar405;
  float fVar407;
  float fVar411;
  float fVar413;
  float fVar415;
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  float fVar406;
  float fVar408;
  float fVar409;
  float fVar410;
  float fVar412;
  float fVar414;
  float fVar416;
  float fVar417;
  undefined1 auVar404 [32];
  undefined1 auVar418 [16];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [64];
  float fVar423;
  undefined1 auVar422 [28];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  undefined1 local_ca0 [8];
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  float local_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined1 local_c50 [8];
  float fStack_c48;
  float fStack_c44;
  RTCFilterFunctionNArguments local_b90;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 (*local_ad0) [16];
  ulong local_ac8;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [16];
  undefined1 local_a30 [8];
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 auStack_990 [16];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 auStack_970 [16];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  Primitive *local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  RTCHitN local_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined8 local_770;
  undefined8 uStack_768;
  undefined1 local_760 [16];
  uint local_750;
  uint uStack_74c;
  uint uStack_748;
  uint uStack_744;
  undefined1 auStack_740 [16];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar18 = prim[1];
  uVar93 = (ulong)(byte)PVar18;
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 4 + 6)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 4 + 10)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 5 + 6)));
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 5 + 10)));
  auVar294 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 6 + 6)));
  lVar95 = uVar93 * 0x25;
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 6 + 10)));
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0xf + 6)));
  auVar178 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0xf + 10)));
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 10)));
  fVar198 = *(float *)(prim + lVar95 + 0x12);
  auVar30 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar144 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar144 = vinsertps_avx(auVar144,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar30 = vsubps_avx(auVar30,*(undefined1 (*) [16])(prim + lVar95 + 6));
  local_c50._4_4_ = fVar198 * auVar30._4_4_;
  local_c50._0_4_ = fVar198 * auVar30._0_4_;
  fStack_c48 = fVar198 * auVar30._8_4_;
  fStack_c44 = fVar198 * auVar30._12_4_;
  auVar342._0_4_ = fVar198 * auVar144._0_4_;
  auVar342._4_4_ = fVar198 * auVar144._4_4_;
  auVar342._8_4_ = fVar198 * auVar144._8_4_;
  auVar342._12_4_ = fVar198 * auVar144._12_4_;
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0x11 + 6)));
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0x11 + 10)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0x1a + 6)));
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0x1a + 10)));
  auStack_970 = auVar34;
  _local_980 = auVar33;
  auVar183._16_16_ = auVar206;
  auVar183._0_16_ = auVar35;
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0x1b + 6)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0x1b + 10)));
  auVar216._16_16_ = auVar209;
  auVar216._0_16_ = auVar294;
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0x1c + 6)));
  auVar350._16_16_ = auVar178;
  auVar350._0_16_ = auVar108;
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0x1c + 10)));
  auVar183 = vcvtdq2ps_avx(auVar183);
  auVar126 = vcvtdq2ps_avx(auVar216);
  auVar242._16_16_ = auVar36;
  auVar242._0_16_ = auVar203;
  _local_9a0 = vcvtdq2ps_avx(auVar242);
  auVar243._16_16_ = auVar144;
  auVar243._0_16_ = auVar30;
  auVar25 = vcvtdq2ps_avx(auVar243);
  auVar383._16_16_ = auVar114;
  auVar383._0_16_ = auVar37;
  auVar323._16_16_ = auVar34;
  auVar323._0_16_ = auVar33;
  auVar331._16_16_ = auVar206;
  auVar331._0_16_ = auVar35;
  auVar30 = vshufps_avx(auVar342,auVar342,0x55);
  auVar144 = vshufps_avx(auVar342,auVar342,0xaa);
  fVar198 = auVar144._0_4_;
  fVar289 = auVar144._4_4_;
  fVar223 = auVar144._8_4_;
  fVar104 = auVar144._12_4_;
  fVar226 = auVar30._0_4_;
  fVar227 = auVar30._4_4_;
  fVar228 = auVar30._8_4_;
  fVar230 = auVar30._12_4_;
  auVar26 = vcvtdq2ps_avx(_local_980);
  auVar27 = vcvtdq2ps_avx(auVar350);
  auVar28 = vcvtdq2ps_avx(auVar383);
  auVar29 = vcvtdq2ps_avx(auVar323);
  auVar245 = vcvtdq2ps_avx(auVar331);
  auVar30 = vshufps_avx(auVar342,auVar342,0);
  fVar224 = auVar30._0_4_;
  fVar175 = auVar30._4_4_;
  fVar225 = auVar30._8_4_;
  fVar192 = auVar30._12_4_;
  auVar401._0_4_ = fVar224 * auVar26._0_4_ + fVar226 * auVar183._0_4_ + fVar198 * auVar126._0_4_;
  auVar401._4_4_ = fVar175 * auVar26._4_4_ + fVar227 * auVar183._4_4_ + fVar289 * auVar126._4_4_;
  auVar401._8_4_ = fVar225 * auVar26._8_4_ + fVar228 * auVar183._8_4_ + fVar223 * auVar126._8_4_;
  auVar401._12_4_ = fVar192 * auVar26._12_4_ + fVar230 * auVar183._12_4_ + fVar104 * auVar126._12_4_
  ;
  auVar401._16_4_ = fVar224 * auVar26._16_4_ + fVar226 * auVar183._16_4_ + fVar198 * auVar126._16_4_
  ;
  auVar401._20_4_ = fVar175 * auVar26._20_4_ + fVar227 * auVar183._20_4_ + fVar289 * auVar126._20_4_
  ;
  auVar401._24_4_ = fVar225 * auVar26._24_4_ + fVar228 * auVar183._24_4_ + fVar223 * auVar126._24_4_
  ;
  auVar401._28_4_ = 0;
  auVar384._0_4_ = fVar224 * auVar27._0_4_ + fVar226 * local_9a0._0_4_ + fVar198 * auVar25._0_4_;
  auVar384._4_4_ = fVar175 * auVar27._4_4_ + fVar227 * local_9a0._4_4_ + fVar289 * auVar25._4_4_;
  auVar384._8_4_ = fVar225 * auVar27._8_4_ + fVar228 * local_9a0._8_4_ + fVar223 * auVar25._8_4_;
  auVar384._12_4_ = fVar192 * auVar27._12_4_ + fVar230 * local_9a0._12_4_ + fVar104 * auVar25._12_4_
  ;
  auVar384._16_4_ = fVar224 * auVar27._16_4_ + fVar226 * local_9a0._16_4_ + fVar198 * auVar25._16_4_
  ;
  auVar384._20_4_ = fVar175 * auVar27._20_4_ + fVar227 * local_9a0._20_4_ + fVar289 * auVar25._20_4_
  ;
  auVar384._24_4_ = fVar225 * auVar27._24_4_ + fVar228 * local_9a0._24_4_ + fVar223 * auVar25._24_4_
  ;
  auVar384._28_4_ = 0;
  auVar351._0_4_ = fVar224 * auVar28._0_4_ + fVar226 * auVar29._0_4_ + fVar198 * auVar245._0_4_;
  auVar351._4_4_ = fVar175 * auVar28._4_4_ + fVar227 * auVar29._4_4_ + fVar289 * auVar245._4_4_;
  auVar351._8_4_ = fVar225 * auVar28._8_4_ + fVar228 * auVar29._8_4_ + fVar223 * auVar245._8_4_;
  auVar351._12_4_ = fVar192 * auVar28._12_4_ + fVar230 * auVar29._12_4_ + fVar104 * auVar245._12_4_;
  auVar351._16_4_ = fVar224 * auVar28._16_4_ + fVar226 * auVar29._16_4_ + fVar198 * auVar245._16_4_;
  auVar351._20_4_ = fVar175 * auVar28._20_4_ + fVar227 * auVar29._20_4_ + fVar289 * auVar245._20_4_;
  auVar351._24_4_ = fVar225 * auVar28._24_4_ + fVar228 * auVar29._24_4_ + fVar223 * auVar245._24_4_;
  auVar351._28_4_ = fVar104 + 0.0 + 0.0;
  auVar30 = vshufps_avx(_local_c50,_local_c50,0x55);
  auVar144 = vshufps_avx(_local_c50,_local_c50,0xaa);
  fVar226 = auVar144._0_4_;
  fVar227 = auVar144._4_4_;
  fVar228 = auVar144._8_4_;
  fVar230 = auVar144._12_4_;
  fVar198 = auVar30._0_4_;
  fVar223 = auVar30._4_4_;
  fVar224 = auVar30._8_4_;
  fVar225 = auVar30._12_4_;
  fVar229 = auVar126._28_4_ + 0.0;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar93 * 7 + 6);
  auVar30 = vpmovsxwd_avx(auVar30);
  auVar144._8_8_ = 0;
  auVar144._0_8_ = *(ulong *)(prim + uVar93 * 7 + 0xe);
  auVar144 = vpmovsxwd_avx(auVar144);
  auVar33 = vshufps_avx(_local_c50,_local_c50,0);
  fVar289 = auVar33._0_4_;
  fVar104 = auVar33._4_4_;
  fVar175 = auVar33._8_4_;
  fVar192 = auVar33._12_4_;
  auVar184._0_4_ = auVar26._0_4_ * fVar289 + auVar183._0_4_ * fVar198 + fVar226 * auVar126._0_4_;
  auVar184._4_4_ = auVar26._4_4_ * fVar104 + auVar183._4_4_ * fVar223 + fVar227 * auVar126._4_4_;
  auVar184._8_4_ = auVar26._8_4_ * fVar175 + auVar183._8_4_ * fVar224 + fVar228 * auVar126._8_4_;
  auVar184._12_4_ = auVar26._12_4_ * fVar192 + auVar183._12_4_ * fVar225 + fVar230 * auVar126._12_4_
  ;
  auVar184._16_4_ = auVar26._16_4_ * fVar289 + auVar183._16_4_ * fVar198 + fVar226 * auVar126._16_4_
  ;
  auVar184._20_4_ = auVar26._20_4_ * fVar104 + auVar183._20_4_ * fVar223 + fVar227 * auVar126._20_4_
  ;
  auVar184._24_4_ = auVar26._24_4_ * fVar175 + auVar183._24_4_ * fVar224 + fVar228 * auVar126._24_4_
  ;
  auVar184._28_4_ = fVar230 + fVar229;
  auVar158._0_4_ = fVar289 * auVar27._0_4_ + fVar198 * local_9a0._0_4_ + fVar226 * auVar25._0_4_;
  auVar158._4_4_ = fVar104 * auVar27._4_4_ + fVar223 * local_9a0._4_4_ + fVar227 * auVar25._4_4_;
  auVar158._8_4_ = fVar175 * auVar27._8_4_ + fVar224 * local_9a0._8_4_ + fVar228 * auVar25._8_4_;
  auVar158._12_4_ = fVar192 * auVar27._12_4_ + fVar225 * local_9a0._12_4_ + fVar230 * auVar25._12_4_
  ;
  auVar158._16_4_ = fVar289 * auVar27._16_4_ + fVar198 * local_9a0._16_4_ + fVar226 * auVar25._16_4_
  ;
  auVar158._20_4_ = fVar104 * auVar27._20_4_ + fVar223 * local_9a0._20_4_ + fVar227 * auVar25._20_4_
  ;
  auVar158._24_4_ = fVar175 * auVar27._24_4_ + fVar224 * local_9a0._24_4_ + fVar228 * auVar25._24_4_
  ;
  auVar158._28_4_ = auVar27._28_4_ + auVar25._28_4_ + 0.0;
  auVar266._8_4_ = 0x7fffffff;
  auVar266._0_8_ = 0x7fffffff7fffffff;
  auVar266._12_4_ = 0x7fffffff;
  auVar266._16_4_ = 0x7fffffff;
  auVar266._20_4_ = 0x7fffffff;
  auVar266._24_4_ = 0x7fffffff;
  auVar266._28_4_ = 0x7fffffff;
  auVar116._0_4_ = fVar289 * auVar28._0_4_ + auVar29._0_4_ * fVar198 + fVar226 * auVar245._0_4_;
  auVar116._4_4_ = fVar104 * auVar28._4_4_ + auVar29._4_4_ * fVar223 + fVar227 * auVar245._4_4_;
  auVar116._8_4_ = fVar175 * auVar28._8_4_ + auVar29._8_4_ * fVar224 + fVar228 * auVar245._8_4_;
  auVar116._12_4_ = fVar192 * auVar28._12_4_ + auVar29._12_4_ * fVar225 + fVar230 * auVar245._12_4_;
  auVar116._16_4_ = fVar289 * auVar28._16_4_ + auVar29._16_4_ * fVar198 + fVar226 * auVar245._16_4_;
  auVar116._20_4_ = fVar104 * auVar28._20_4_ + auVar29._20_4_ * fVar223 + fVar227 * auVar245._20_4_;
  auVar116._24_4_ = fVar175 * auVar28._24_4_ + auVar29._24_4_ * fVar224 + fVar228 * auVar245._24_4_;
  auVar116._28_4_ = fVar229 + fVar225 + fVar230;
  auVar183 = vandps_avx(auVar401,auVar266);
  auVar332._8_4_ = 0x219392ef;
  auVar332._0_8_ = 0x219392ef219392ef;
  auVar332._12_4_ = 0x219392ef;
  auVar332._16_4_ = 0x219392ef;
  auVar332._20_4_ = 0x219392ef;
  auVar332._24_4_ = 0x219392ef;
  auVar332._28_4_ = 0x219392ef;
  auVar183 = vcmpps_avx(auVar183,auVar332,1);
  auVar126 = vblendvps_avx(auVar401,auVar332,auVar183);
  auVar183 = vandps_avx(auVar384,auVar266);
  auVar183 = vcmpps_avx(auVar183,auVar332,1);
  auVar25 = vblendvps_avx(auVar384,auVar332,auVar183);
  auVar183 = vandps_avx(auVar351,auVar266);
  auVar183 = vcmpps_avx(auVar183,auVar332,1);
  auVar26 = vrcpps_avx(auVar126);
  auVar183 = vblendvps_avx(auVar351,auVar332,auVar183);
  auVar352._8_4_ = 0x3f800000;
  auVar352._0_8_ = 0x3f8000003f800000;
  auVar352._12_4_ = 0x3f800000;
  auVar352._16_4_ = 0x3f800000;
  auVar352._20_4_ = 0x3f800000;
  auVar352._24_4_ = 0x3f800000;
  auVar352._28_4_ = 0x3f800000;
  fVar198 = auVar26._0_4_;
  fVar223 = auVar26._4_4_;
  auVar27._4_4_ = auVar126._4_4_ * fVar223;
  auVar27._0_4_ = auVar126._0_4_ * fVar198;
  fVar224 = auVar26._8_4_;
  auVar27._8_4_ = auVar126._8_4_ * fVar224;
  fVar225 = auVar26._12_4_;
  auVar27._12_4_ = auVar126._12_4_ * fVar225;
  fVar226 = auVar26._16_4_;
  auVar27._16_4_ = auVar126._16_4_ * fVar226;
  fVar227 = auVar26._20_4_;
  auVar27._20_4_ = auVar126._20_4_ * fVar227;
  fVar228 = auVar26._24_4_;
  auVar27._24_4_ = auVar126._24_4_ * fVar228;
  auVar27._28_4_ = auVar126._28_4_;
  auVar28 = vsubps_avx(auVar352,auVar27);
  fVar198 = fVar198 + fVar198 * auVar28._0_4_;
  fVar223 = fVar223 + fVar223 * auVar28._4_4_;
  fVar224 = fVar224 + fVar224 * auVar28._8_4_;
  fVar225 = fVar225 + fVar225 * auVar28._12_4_;
  fVar226 = fVar226 + fVar226 * auVar28._16_4_;
  fVar227 = fVar227 + fVar227 * auVar28._20_4_;
  fVar228 = fVar228 + fVar228 * auVar28._24_4_;
  auVar27 = vrcpps_avx(auVar25);
  fVar230 = auVar27._0_4_;
  fVar229 = auVar27._4_4_;
  auVar126._4_4_ = fVar229 * auVar25._4_4_;
  auVar126._0_4_ = fVar230 * auVar25._0_4_;
  fVar252 = auVar27._8_4_;
  auVar126._8_4_ = fVar252 * auVar25._8_4_;
  fVar253 = auVar27._12_4_;
  auVar126._12_4_ = fVar253 * auVar25._12_4_;
  fVar254 = auVar27._16_4_;
  auVar126._16_4_ = fVar254 * auVar25._16_4_;
  fVar255 = auVar27._20_4_;
  auVar126._20_4_ = fVar255 * auVar25._20_4_;
  fVar256 = auVar27._24_4_;
  auVar126._24_4_ = fVar256 * auVar25._24_4_;
  auVar126._28_4_ = auVar25._28_4_;
  auVar25 = vsubps_avx(auVar352,auVar126);
  auVar126 = vrcpps_avx(auVar183);
  fVar230 = fVar230 + fVar230 * auVar25._0_4_;
  fVar229 = fVar229 + fVar229 * auVar25._4_4_;
  fVar252 = fVar252 + fVar252 * auVar25._8_4_;
  fVar253 = fVar253 + fVar253 * auVar25._12_4_;
  fVar254 = fVar254 + fVar254 * auVar25._16_4_;
  fVar255 = fVar255 + fVar255 * auVar25._20_4_;
  fVar256 = fVar256 + fVar256 * auVar25._24_4_;
  fVar257 = auVar126._0_4_;
  fVar277 = auVar126._4_4_;
  auVar29._4_4_ = fVar277 * auVar183._4_4_;
  auVar29._0_4_ = fVar257 * auVar183._0_4_;
  fVar279 = auVar126._8_4_;
  auVar29._8_4_ = fVar279 * auVar183._8_4_;
  fVar281 = auVar126._12_4_;
  auVar29._12_4_ = fVar281 * auVar183._12_4_;
  fVar283 = auVar126._16_4_;
  auVar29._16_4_ = fVar283 * auVar183._16_4_;
  fVar285 = auVar126._20_4_;
  auVar29._20_4_ = fVar285 * auVar183._20_4_;
  fVar287 = auVar126._24_4_;
  auVar29._24_4_ = fVar287 * auVar183._24_4_;
  auVar29._28_4_ = auVar183._28_4_;
  auVar183 = vsubps_avx(auVar352,auVar29);
  fVar257 = fVar257 + fVar257 * auVar183._0_4_;
  fVar277 = fVar277 + fVar277 * auVar183._4_4_;
  fVar279 = fVar279 + fVar279 * auVar183._8_4_;
  fVar281 = fVar281 + fVar281 * auVar183._12_4_;
  fVar283 = fVar283 + fVar283 * auVar183._16_4_;
  fVar285 = fVar285 + fVar285 * auVar183._20_4_;
  fVar287 = fVar287 + fVar287 * auVar183._24_4_;
  auVar35 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) -
                                         *(float *)(prim + lVar95 + 0x16)) *
                                        *(float *)(prim + lVar95 + 0x1a))),0);
  auVar324._16_16_ = auVar144;
  auVar324._0_16_ = auVar30;
  auVar183 = vcvtdq2ps_avx(auVar324);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar93 * 0xb + 6);
  auVar30 = vpmovsxwd_avx(auVar33);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar93 * 0xb + 0xe);
  auVar144 = vpmovsxwd_avx(auVar34);
  auVar333._16_16_ = auVar144;
  auVar333._0_16_ = auVar30;
  auVar126 = vcvtdq2ps_avx(auVar333);
  auVar126 = vsubps_avx(auVar126,auVar183);
  fVar289 = auVar35._0_4_;
  fVar104 = auVar35._4_4_;
  fVar175 = auVar35._8_4_;
  fVar192 = auVar35._12_4_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar93 * 9 + 6);
  auVar30 = vpmovsxwd_avx(auVar35);
  auVar325._0_4_ = auVar126._0_4_ * fVar289 + auVar183._0_4_;
  auVar325._4_4_ = auVar126._4_4_ * fVar104 + auVar183._4_4_;
  auVar325._8_4_ = auVar126._8_4_ * fVar175 + auVar183._8_4_;
  auVar325._12_4_ = auVar126._12_4_ * fVar192 + auVar183._12_4_;
  auVar325._16_4_ = auVar126._16_4_ * fVar289 + auVar183._16_4_;
  auVar325._20_4_ = auVar126._20_4_ * fVar104 + auVar183._20_4_;
  auVar325._24_4_ = auVar126._24_4_ * fVar175 + auVar183._24_4_;
  auVar325._28_4_ = auVar126._28_4_ + auVar183._28_4_;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + uVar93 * 9 + 0xe);
  auVar144 = vpmovsxwd_avx(auVar206);
  auVar334._16_16_ = auVar144;
  auVar334._0_16_ = auVar30;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = *(ulong *)(prim + uVar93 * 0xd + 6);
  auVar30 = vpmovsxwd_avx(auVar294);
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *(ulong *)(prim + uVar93 * 0xd + 0xe);
  auVar144 = vpmovsxwd_avx(auVar209);
  auVar183 = vcvtdq2ps_avx(auVar334);
  auVar343._16_16_ = auVar144;
  auVar343._0_16_ = auVar30;
  auVar126 = vcvtdq2ps_avx(auVar343);
  auVar126 = vsubps_avx(auVar126,auVar183);
  auVar335._0_4_ = auVar183._0_4_ + auVar126._0_4_ * fVar289;
  auVar335._4_4_ = auVar183._4_4_ + auVar126._4_4_ * fVar104;
  auVar335._8_4_ = auVar183._8_4_ + auVar126._8_4_ * fVar175;
  auVar335._12_4_ = auVar183._12_4_ + auVar126._12_4_ * fVar192;
  auVar335._16_4_ = auVar183._16_4_ + auVar126._16_4_ * fVar289;
  auVar335._20_4_ = auVar183._20_4_ + auVar126._20_4_ * fVar104;
  auVar335._24_4_ = auVar183._24_4_ + auVar126._24_4_ * fVar175;
  auVar335._28_4_ = auVar183._28_4_ + auVar126._28_4_;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar93 * 0x12 + 6);
  auVar30 = vpmovsxwd_avx(auVar108);
  auVar178._8_8_ = 0;
  auVar178._0_8_ = *(ulong *)(prim + uVar93 * 0x12 + 0xe);
  auVar144 = vpmovsxwd_avx(auVar178);
  auVar344._16_16_ = auVar144;
  auVar344._0_16_ = auVar30;
  auVar183 = vcvtdq2ps_avx(auVar344);
  auVar203._8_8_ = 0;
  auVar203._0_8_ = *(ulong *)(prim + uVar93 * 0x16 + 6);
  auVar30 = vpmovsxwd_avx(auVar203);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar93 * 0x16 + 0xe);
  auVar144 = vpmovsxwd_avx(auVar36);
  auVar353._16_16_ = auVar144;
  auVar353._0_16_ = auVar30;
  auVar126 = vcvtdq2ps_avx(auVar353);
  auVar126 = vsubps_avx(auVar126,auVar183);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar93 * 0x14 + 6);
  auVar30 = vpmovsxwd_avx(auVar37);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar93 * 0x14 + 0xe);
  auVar144 = vpmovsxwd_avx(auVar114);
  auVar345._0_4_ = auVar183._0_4_ + auVar126._0_4_ * fVar289;
  auVar345._4_4_ = auVar183._4_4_ + auVar126._4_4_ * fVar104;
  auVar345._8_4_ = auVar183._8_4_ + auVar126._8_4_ * fVar175;
  auVar345._12_4_ = auVar183._12_4_ + auVar126._12_4_ * fVar192;
  auVar345._16_4_ = auVar183._16_4_ + auVar126._16_4_ * fVar289;
  auVar345._20_4_ = auVar183._20_4_ + auVar126._20_4_ * fVar104;
  auVar345._24_4_ = auVar183._24_4_ + auVar126._24_4_ * fVar175;
  auVar345._28_4_ = auVar183._28_4_ + auVar126._28_4_;
  auVar354._16_16_ = auVar144;
  auVar354._0_16_ = auVar30;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar93 * 0x18 + 6);
  auVar30 = vpmovsxwd_avx(auVar110);
  auVar183 = vcvtdq2ps_avx(auVar354);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar93 * 0x18 + 0xe);
  auVar144 = vpmovsxwd_avx(auVar9);
  auVar366._16_16_ = auVar144;
  auVar366._0_16_ = auVar30;
  auVar126 = vcvtdq2ps_avx(auVar366);
  auVar126 = vsubps_avx(auVar126,auVar183);
  auVar355._0_4_ = auVar183._0_4_ + auVar126._0_4_ * fVar289;
  auVar355._4_4_ = auVar183._4_4_ + auVar126._4_4_ * fVar104;
  auVar355._8_4_ = auVar183._8_4_ + auVar126._8_4_ * fVar175;
  auVar355._12_4_ = auVar183._12_4_ + auVar126._12_4_ * fVar192;
  auVar355._16_4_ = auVar183._16_4_ + auVar126._16_4_ * fVar289;
  auVar355._20_4_ = auVar183._20_4_ + auVar126._20_4_ * fVar104;
  auVar355._24_4_ = auVar183._24_4_ + auVar126._24_4_ * fVar175;
  auVar355._28_4_ = auVar183._28_4_ + auVar126._28_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar93 * 0x1d + 6);
  auVar30 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar93 * 0x1d + 0xe);
  auVar144 = vpmovsxwd_avx(auVar11);
  auVar367._16_16_ = auVar144;
  auVar367._0_16_ = auVar30;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar93 * 0x21 + 6);
  auVar30 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar93 * 0x21 + 0xe);
  auVar144 = vpmovsxwd_avx(auVar13);
  auVar385._16_16_ = auVar144;
  auVar385._0_16_ = auVar30;
  auVar183 = vcvtdq2ps_avx(auVar367);
  auVar126 = vcvtdq2ps_avx(auVar385);
  auVar126 = vsubps_avx(auVar126,auVar183);
  auVar368._0_4_ = auVar183._0_4_ + auVar126._0_4_ * fVar289;
  auVar368._4_4_ = auVar183._4_4_ + auVar126._4_4_ * fVar104;
  auVar368._8_4_ = auVar183._8_4_ + auVar126._8_4_ * fVar175;
  auVar368._12_4_ = auVar183._12_4_ + auVar126._12_4_ * fVar192;
  auVar368._16_4_ = auVar183._16_4_ + auVar126._16_4_ * fVar289;
  auVar368._20_4_ = auVar183._20_4_ + auVar126._20_4_ * fVar104;
  auVar368._24_4_ = auVar183._24_4_ + auVar126._24_4_ * fVar175;
  auVar368._28_4_ = auVar183._28_4_ + auVar126._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar93 * 0x1f + 6);
  auVar30 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar93 * 0x1f + 0xe);
  auVar144 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar93 * 0x23 + 6);
  auVar33 = vpmovsxwd_avx(auVar16);
  auVar386._16_16_ = auVar144;
  auVar386._0_16_ = auVar30;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar93 * 0x23 + 0xe);
  auVar30 = vpmovsxwd_avx(auVar17);
  auVar402._16_16_ = auVar30;
  auVar402._0_16_ = auVar33;
  auVar183 = vcvtdq2ps_avx(auVar386);
  auVar126 = vcvtdq2ps_avx(auVar402);
  auVar126 = vsubps_avx(auVar126,auVar183);
  auVar387._0_4_ = auVar183._0_4_ + auVar126._0_4_ * fVar289;
  auVar387._4_4_ = auVar183._4_4_ + auVar126._4_4_ * fVar104;
  auVar387._8_4_ = auVar183._8_4_ + auVar126._8_4_ * fVar175;
  auVar387._12_4_ = auVar183._12_4_ + auVar126._12_4_ * fVar192;
  auVar387._16_4_ = auVar183._16_4_ + auVar126._16_4_ * fVar289;
  auVar387._20_4_ = auVar183._20_4_ + auVar126._20_4_ * fVar104;
  auVar387._24_4_ = auVar183._24_4_ + auVar126._24_4_ * fVar175;
  auVar387._28_4_ = auVar183._28_4_ + fVar192;
  auVar183 = vsubps_avx(auVar325,auVar184);
  auVar293._0_4_ = fVar198 * auVar183._0_4_;
  auVar293._4_4_ = fVar223 * auVar183._4_4_;
  auVar293._8_4_ = fVar224 * auVar183._8_4_;
  auVar293._12_4_ = fVar225 * auVar183._12_4_;
  auVar245._16_4_ = fVar226 * auVar183._16_4_;
  auVar245._0_16_ = auVar293;
  auVar245._20_4_ = fVar227 * auVar183._20_4_;
  auVar245._24_4_ = fVar228 * auVar183._24_4_;
  auVar245._28_4_ = auVar183._28_4_;
  auVar183 = vsubps_avx(auVar335,auVar184);
  auVar199._0_4_ = fVar198 * auVar183._0_4_;
  auVar199._4_4_ = fVar223 * auVar183._4_4_;
  auVar199._8_4_ = fVar224 * auVar183._8_4_;
  auVar199._12_4_ = fVar225 * auVar183._12_4_;
  auVar38._16_4_ = fVar226 * auVar183._16_4_;
  auVar38._0_16_ = auVar199;
  auVar38._20_4_ = fVar227 * auVar183._20_4_;
  auVar38._24_4_ = fVar228 * auVar183._24_4_;
  auVar38._28_4_ = auVar26._28_4_ + auVar28._28_4_;
  auVar183 = vsubps_avx(auVar345,auVar158);
  auVar176._0_4_ = fVar230 * auVar183._0_4_;
  auVar176._4_4_ = fVar229 * auVar183._4_4_;
  auVar176._8_4_ = fVar252 * auVar183._8_4_;
  auVar176._12_4_ = fVar253 * auVar183._12_4_;
  auVar26._16_4_ = fVar254 * auVar183._16_4_;
  auVar26._0_16_ = auVar176;
  auVar26._20_4_ = fVar255 * auVar183._20_4_;
  auVar26._24_4_ = fVar256 * auVar183._24_4_;
  auVar26._28_4_ = auVar183._28_4_;
  auVar183 = vsubps_avx(auVar355,auVar158);
  auVar231._0_4_ = fVar230 * auVar183._0_4_;
  auVar231._4_4_ = fVar229 * auVar183._4_4_;
  auVar231._8_4_ = fVar252 * auVar183._8_4_;
  auVar231._12_4_ = fVar253 * auVar183._12_4_;
  auVar28._16_4_ = fVar254 * auVar183._16_4_;
  auVar28._0_16_ = auVar231;
  auVar28._20_4_ = fVar255 * auVar183._20_4_;
  auVar28._24_4_ = fVar256 * auVar183._24_4_;
  auVar28._28_4_ = auVar27._28_4_ + auVar25._28_4_;
  auVar183 = vsubps_avx(auVar368,auVar116);
  auVar142._0_4_ = fVar257 * auVar183._0_4_;
  auVar142._4_4_ = fVar277 * auVar183._4_4_;
  auVar142._8_4_ = fVar279 * auVar183._8_4_;
  auVar142._12_4_ = fVar281 * auVar183._12_4_;
  auVar25._16_4_ = fVar283 * auVar183._16_4_;
  auVar25._0_16_ = auVar142;
  auVar25._20_4_ = fVar285 * auVar183._20_4_;
  auVar25._24_4_ = fVar287 * auVar183._24_4_;
  auVar25._28_4_ = auVar183._28_4_;
  auVar183 = vsubps_avx(auVar387,auVar116);
  auVar105._0_4_ = fVar257 * auVar183._0_4_;
  auVar105._4_4_ = fVar277 * auVar183._4_4_;
  auVar105._8_4_ = fVar279 * auVar183._8_4_;
  auVar105._12_4_ = fVar281 * auVar183._12_4_;
  auVar246._16_4_ = fVar283 * auVar183._16_4_;
  auVar246._0_16_ = auVar105;
  auVar246._20_4_ = fVar285 * auVar183._20_4_;
  auVar246._24_4_ = fVar287 * auVar183._24_4_;
  auVar246._28_4_ = auVar183._28_4_;
  auVar30 = vpminsd_avx(auVar245._16_16_,auVar38._16_16_);
  auVar144 = vpminsd_avx(auVar293,auVar199);
  auVar336._16_16_ = auVar30;
  auVar336._0_16_ = auVar144;
  auVar30 = vpminsd_avx(auVar26._16_16_,auVar28._16_16_);
  auVar144 = vpminsd_avx(auVar176,auVar231);
  auVar346._16_16_ = auVar30;
  auVar346._0_16_ = auVar144;
  auVar183 = vmaxps_avx(auVar336,auVar346);
  auVar30 = vpminsd_avx(auVar25._16_16_,auVar246._16_16_);
  auVar144 = vpminsd_avx(auVar142,auVar105);
  auVar403._16_16_ = auVar30;
  auVar403._0_16_ = auVar144;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar419._4_4_ = uVar8;
  auVar419._0_4_ = uVar8;
  auVar419._8_4_ = uVar8;
  auVar419._12_4_ = uVar8;
  auVar419._16_4_ = uVar8;
  auVar419._20_4_ = uVar8;
  auVar419._24_4_ = uVar8;
  auVar419._28_4_ = uVar8;
  auVar126 = vmaxps_avx(auVar403,auVar419);
  auVar183 = vmaxps_avx(auVar183,auVar126);
  local_420._4_4_ = auVar183._4_4_ * 0.99999964;
  local_420._0_4_ = auVar183._0_4_ * 0.99999964;
  local_420._8_4_ = auVar183._8_4_ * 0.99999964;
  local_420._12_4_ = auVar183._12_4_ * 0.99999964;
  local_420._16_4_ = auVar183._16_4_ * 0.99999964;
  local_420._20_4_ = auVar183._20_4_ * 0.99999964;
  local_420._24_4_ = auVar183._24_4_ * 0.99999964;
  local_420._28_4_ = auVar183._28_4_;
  auVar30 = vpmaxsd_avx(auVar245._16_16_,auVar38._16_16_);
  auVar144 = vpmaxsd_avx(auVar293,auVar199);
  auVar217._16_16_ = auVar30;
  auVar217._0_16_ = auVar144;
  auVar30 = vpmaxsd_avx(auVar26._16_16_,auVar28._16_16_);
  auVar144 = vpmaxsd_avx(auVar176,auVar231);
  auVar185._16_16_ = auVar30;
  auVar185._0_16_ = auVar144;
  auVar183 = vminps_avx(auVar217,auVar185);
  auVar30 = vpmaxsd_avx(auVar25._16_16_,auVar246._16_16_);
  auVar144 = vpmaxsd_avx(auVar142,auVar105);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar159._4_4_ = uVar8;
  auVar159._0_4_ = uVar8;
  auVar159._8_4_ = uVar8;
  auVar159._12_4_ = uVar8;
  auVar159._16_4_ = uVar8;
  auVar159._20_4_ = uVar8;
  auVar159._24_4_ = uVar8;
  auVar159._28_4_ = uVar8;
  auVar117._16_16_ = auVar30;
  auVar117._0_16_ = auVar144;
  auVar126 = vminps_avx(auVar117,auVar159);
  auVar183 = vminps_avx(auVar183,auVar126);
  auVar39._4_4_ = auVar183._4_4_ * 1.0000004;
  auVar39._0_4_ = auVar183._0_4_ * 1.0000004;
  auVar39._8_4_ = auVar183._8_4_ * 1.0000004;
  auVar39._12_4_ = auVar183._12_4_ * 1.0000004;
  auVar39._16_4_ = auVar183._16_4_ * 1.0000004;
  auVar39._20_4_ = auVar183._20_4_ * 1.0000004;
  auVar39._24_4_ = auVar183._24_4_ * 1.0000004;
  auVar39._28_4_ = auVar183._28_4_;
  auVar183 = vcmpps_avx(local_420,auVar39,2);
  auVar30 = vpshufd_avx(ZEXT116((byte)PVar18),0);
  auVar160._16_16_ = auVar30;
  auVar160._0_16_ = auVar30;
  auVar126 = vcvtdq2ps_avx(auVar160);
  auVar126 = vcmpps_avx(_DAT_01f7b060,auVar126,1);
  auVar183 = vandps_avx(auVar183,auVar126);
  auVar161._16_16_ = mm_lookupmask_ps._240_16_;
  auVar161._0_16_ = mm_lookupmask_ps._240_16_;
  uVar96 = vmovmskps_avx(auVar183);
  local_540 = vblendps_avx(auVar161,ZEXT832(0) << 0x20,0x80);
  local_ad0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_8d0 = prim;
LAB_00a9cfa5:
  local_8c8 = (ulong)uVar96;
  if (local_8c8 == 0) {
    return;
  }
  lVar95 = 0;
  if (local_8c8 != 0) {
    for (; (uVar96 >> lVar95 & 1) == 0; lVar95 = lVar95 + 1) {
    }
  }
  uVar96 = *(uint *)(local_8d0 + 2);
  local_ac8 = (ulong)*(uint *)(local_8d0 + lVar95 * 4 + 6);
  pGVar19 = (context->scene->geometries).items[uVar96].ptr;
  uVar93 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                           local_ac8 *
                           pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar198 = (pGVar19->time_range).lower;
  fVar198 = pGVar19->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar198) / ((pGVar19->time_range).upper - fVar198));
  auVar30 = vroundss_avx(ZEXT416((uint)fVar198),ZEXT416((uint)fVar198),9);
  auVar30 = vminss_avx(auVar30,ZEXT416((uint)(pGVar19->fnumTimeSegments + -1.0)));
  auVar30 = vmaxss_avx(ZEXT816(0) << 0x20,auVar30);
  fVar198 = fVar198 - auVar30._0_4_;
  _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar97 = (long)(int)auVar30._0_4_ * 0x38;
  lVar21 = *(long *)(_Var20 + 0x10 + lVar97);
  lVar22 = *(long *)(_Var20 + 0x38 + lVar97);
  lVar23 = *(long *)(_Var20 + 0x48 + lVar97);
  auVar30 = vshufps_avx(ZEXT416((uint)fVar198),ZEXT416((uint)fVar198),0);
  pfVar1 = (float *)(lVar22 + uVar93 * lVar23);
  fVar175 = auVar30._0_4_;
  fVar225 = auVar30._4_4_;
  fVar192 = auVar30._8_4_;
  fVar226 = auVar30._12_4_;
  pfVar2 = (float *)(lVar22 + (uVar93 + 1) * lVar23);
  pfVar3 = (float *)(lVar22 + (uVar93 + 2) * lVar23);
  pfVar4 = (float *)(lVar22 + lVar23 * (uVar93 + 3));
  lVar22 = *(long *)(_Var20 + lVar97);
  auVar30 = vshufps_avx(ZEXT416((uint)(1.0 - fVar198)),ZEXT416((uint)(1.0 - fVar198)),0);
  pfVar5 = (float *)(lVar22 + lVar21 * uVar93);
  fVar289 = auVar30._0_4_;
  fVar223 = auVar30._4_4_;
  fVar104 = auVar30._8_4_;
  fVar224 = auVar30._12_4_;
  pfVar6 = (float *)(lVar22 + lVar21 * (uVar93 + 1));
  pfVar7 = (float *)(lVar22 + lVar21 * (uVar93 + 2));
  auVar177._0_4_ = fVar175 * *pfVar1 + fVar289 * *pfVar5;
  auVar177._4_4_ = fVar225 * pfVar1[1] + fVar223 * pfVar5[1];
  auVar177._8_4_ = fVar192 * pfVar1[2] + fVar104 * pfVar5[2];
  auVar177._12_4_ = fVar226 * pfVar1[3] + fVar224 * pfVar5[3];
  auVar143._0_4_ = fVar289 * *pfVar6 + fVar175 * *pfVar2;
  auVar143._4_4_ = fVar223 * pfVar6[1] + fVar225 * pfVar2[1];
  auVar143._8_4_ = fVar104 * pfVar6[2] + fVar192 * pfVar2[2];
  auVar143._12_4_ = fVar224 * pfVar6[3] + fVar226 * pfVar2[3];
  pfVar1 = (float *)(lVar22 + lVar21 * (uVar93 + 3));
  auVar200._0_4_ = fVar289 * *pfVar7 + fVar175 * *pfVar3;
  auVar200._4_4_ = fVar223 * pfVar7[1] + fVar225 * pfVar3[1];
  auVar200._8_4_ = fVar104 * pfVar7[2] + fVar192 * pfVar3[2];
  auVar200._12_4_ = fVar224 * pfVar7[3] + fVar226 * pfVar3[3];
  auVar30 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar144 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar198 = *(float *)(ray + k * 4 + 0x40);
  auVar382._4_4_ = fVar198;
  auVar382._0_4_ = fVar198;
  auVar382._8_4_ = fVar198;
  auVar382._12_4_ = fVar198;
  fStack_ab0 = fVar198;
  _local_ac0 = auVar382;
  fStack_aac = fVar198;
  fStack_aa8 = fVar198;
  fStack_aa4 = fVar198;
  auVar259._0_4_ = fVar289 * *pfVar1 + fVar175 * *pfVar4;
  auVar259._4_4_ = fVar223 * pfVar1[1] + fVar225 * pfVar4[1];
  auVar259._8_4_ = fVar104 * pfVar1[2] + fVar192 * pfVar4[2];
  auVar259._12_4_ = fVar224 * pfVar1[3] + fVar226 * pfVar4[3];
  fVar289 = *(float *)(ray + k * 4 + 0x50);
  auVar400._4_4_ = fVar289;
  auVar400._0_4_ = fVar289;
  auVar400._8_4_ = fVar289;
  auVar400._12_4_ = fVar289;
  fStack_6f0 = fVar289;
  _local_700 = auVar400;
  fStack_6ec = fVar289;
  fStack_6e8 = fVar289;
  fStack_6e4 = fVar289;
  auVar30 = vunpcklps_avx(auVar382,auVar400);
  fVar223 = *(float *)(ray + k * 4 + 0x60);
  auVar418._4_4_ = fVar223;
  auVar418._0_4_ = fVar223;
  auVar418._8_4_ = fVar223;
  auVar418._12_4_ = fVar223;
  fStack_890 = fVar223;
  _local_8a0 = auVar418;
  fStack_88c = fVar223;
  fStack_888 = fVar223;
  fStack_884 = fVar223;
  _local_a30 = vinsertps_avx(auVar30,auVar418,0x28);
  auVar106._0_4_ = (auVar177._0_4_ + auVar143._0_4_ + auVar200._0_4_ + auVar259._0_4_) * 0.25;
  auVar106._4_4_ = (auVar177._4_4_ + auVar143._4_4_ + auVar200._4_4_ + auVar259._4_4_) * 0.25;
  auVar106._8_4_ = (auVar177._8_4_ + auVar143._8_4_ + auVar200._8_4_ + auVar259._8_4_) * 0.25;
  auVar106._12_4_ = (auVar177._12_4_ + auVar143._12_4_ + auVar200._12_4_ + auVar259._12_4_) * 0.25;
  auVar30 = vsubps_avx(auVar106,auVar144);
  auVar30 = vdpps_avx(auVar30,_local_a30,0x7f);
  local_a40 = vdpps_avx(_local_a30,_local_a30,0x7f);
  auVar33 = vrcpss_avx(local_a40,local_a40);
  fVar104 = auVar30._0_4_ * auVar33._0_4_ * (2.0 - local_a40._0_4_ * auVar33._0_4_);
  auVar33 = vshufps_avx(ZEXT416((uint)fVar104),ZEXT416((uint)fVar104),0);
  auVar232._0_4_ = auVar144._0_4_ + local_a30._0_4_ * auVar33._0_4_;
  auVar232._4_4_ = auVar144._4_4_ + local_a30._4_4_ * auVar33._4_4_;
  auVar232._8_4_ = auVar144._8_4_ + local_a30._8_4_ * auVar33._8_4_;
  auVar232._12_4_ = auVar144._12_4_ + local_a30._12_4_ * auVar33._12_4_;
  auVar30 = vblendps_avx(auVar232,_DAT_01f45a50,8);
  auVar34 = vsubps_avx(auVar177,auVar30);
  auVar35 = vsubps_avx(auVar200,auVar30);
  auVar206 = vsubps_avx(auVar143,auVar30);
  auVar294 = vsubps_avx(auVar259,auVar30);
  auVar30 = vshufps_avx(auVar34,auVar34,0);
  register0x00001250 = auVar30;
  _local_1e0 = auVar30;
  auVar30 = vshufps_avx(auVar34,auVar34,0x55);
  local_a60._16_16_ = auVar30;
  local_a60._0_16_ = auVar30;
  auVar30 = vshufps_avx(auVar34,auVar34,0xaa);
  local_3a0._16_16_ = auVar30;
  local_3a0._0_16_ = auVar30;
  auVar30 = vshufps_avx(auVar34,auVar34,0xff);
  auVar144 = vshufps_avx(auVar206,auVar206,0);
  auVar298._16_16_ = auVar144;
  auVar298._0_16_ = auVar144;
  auVar144 = vshufps_avx(auVar206,auVar206,0x55);
  local_960._16_16_ = auVar144;
  local_960._0_16_ = auVar144;
  auVar144 = vshufps_avx(auVar206,auVar206,0xaa);
  auVar373._16_16_ = auVar144;
  auVar373._0_16_ = auVar144;
  _local_980 = auVar206;
  auVar144 = vshufps_avx(auVar206,auVar206,0xff);
  local_9e0._16_16_ = auVar144;
  local_9e0._0_16_ = auVar144;
  auVar144 = vshufps_avx(auVar35,auVar35,0);
  local_3c0._16_16_ = auVar144;
  local_3c0._0_16_ = auVar144;
  auVar144 = vshufps_avx(auVar35,auVar35,0x55);
  local_3e0._16_16_ = auVar144;
  local_3e0._0_16_ = auVar144;
  auVar144 = vshufps_avx(auVar35,auVar35,0xaa);
  register0x00001290 = auVar144;
  _local_200 = auVar144;
  auVar144 = vshufps_avx(auVar35,auVar35,0xff);
  register0x00001290 = auVar144;
  _local_220 = auVar144;
  auVar144 = vshufps_avx(auVar294,auVar294,0);
  register0x00001290 = auVar144;
  _local_240 = auVar144;
  auVar144 = vshufps_avx(auVar294,auVar294,0x55);
  register0x00001290 = auVar144;
  _local_260 = auVar144;
  auVar144 = vshufps_avx(auVar294,auVar294,0xaa);
  register0x00001290 = auVar144;
  _local_280 = auVar144;
  _local_9a0 = auVar294;
  auVar144 = vshufps_avx(auVar294,auVar294,0xff);
  register0x00001290 = auVar144;
  _local_2a0 = auVar144;
  auVar144 = ZEXT416((uint)(fVar198 * fVar198 + fVar289 * fVar289 + fVar223 * fVar223));
  auVar144 = vshufps_avx(auVar144,auVar144,0);
  local_2c0._16_16_ = auVar144;
  local_2c0._0_16_ = auVar144;
  fVar198 = *(float *)(ray + k * 4 + 0x30);
  local_8f0 = ZEXT416((uint)fVar104);
  auVar421 = ZEXT3264(local_960);
  auVar144 = vshufps_avx(ZEXT416((uint)(fVar198 - fVar104)),ZEXT416((uint)(fVar198 - fVar104)),0);
  local_400._16_16_ = auVar144;
  local_400._0_16_ = auVar144;
  local_7d0 = vpshufd_avx(ZEXT416(uVar96),0);
  local_7e0 = vpshufd_avx(ZEXT416(*(uint *)(local_8d0 + lVar95 * 4 + 6)),0);
  register0x00001210 = auVar33;
  _local_8c0 = auVar33;
  uVar99 = 0;
  uVar98 = 1;
  auVar118._8_4_ = 0x7fffffff;
  auVar118._0_8_ = 0x7fffffff7fffffff;
  auVar118._12_4_ = 0x7fffffff;
  auVar118._16_4_ = 0x7fffffff;
  auVar118._20_4_ = 0x7fffffff;
  auVar118._24_4_ = 0x7fffffff;
  auVar118._28_4_ = 0x7fffffff;
  local_5e0 = vandps_avx(local_2c0,auVar118);
  auVar144 = vsqrtss_avx(local_a40,local_a40);
  auVar33 = vsqrtss_avx(local_a40,local_a40);
  auVar358 = ZEXT3264(local_a60);
  auVar302 = ZEXT3264(local_9e0);
  local_630 = ZEXT816(0x3f80000000000000);
  local_5c0 = auVar298;
  local_b40 = auVar373;
  do {
    auVar218._8_4_ = 0x3f800000;
    auVar218._0_8_ = 0x3f8000003f800000;
    auVar218._12_4_ = 0x3f800000;
    auVar218._16_4_ = 0x3f800000;
    auVar218._20_4_ = 0x3f800000;
    auVar218._24_4_ = 0x3f800000;
    auVar218._28_4_ = 0x3f800000;
    auVar206 = vmovshdup_avx(local_630);
    auVar209 = vsubps_avx(auVar206,local_630);
    auVar206 = vshufps_avx(local_630,local_630,0);
    auVar294 = vshufps_avx(auVar209,auVar209,0);
    fVar141 = auVar294._0_4_;
    fVar172 = auVar294._4_4_;
    fVar173 = auVar294._8_4_;
    fVar174 = auVar294._12_4_;
    fVar102 = auVar206._0_4_;
    auVar162._0_4_ = fVar102 + fVar141 * 0.0;
    fVar132 = auVar206._4_4_;
    auVar162._4_4_ = fVar132 + fVar172 * 0.14285715;
    fVar134 = auVar206._8_4_;
    auVar162._8_4_ = fVar134 + fVar173 * 0.2857143;
    fVar136 = auVar206._12_4_;
    auVar162._12_4_ = fVar136 + fVar174 * 0.42857146;
    auVar162._16_4_ = fVar102 + fVar141 * 0.5714286;
    auVar162._20_4_ = fVar132 + fVar172 * 0.71428573;
    auVar162._24_4_ = fVar134 + fVar173 * 0.8571429;
    auVar162._28_4_ = fVar136 + fVar174;
    auVar183 = vsubps_avx(auVar218,auVar162);
    fVar289 = auVar298._28_4_;
    fVar104 = auVar183._0_4_;
    fVar224 = auVar183._4_4_;
    fVar175 = auVar183._8_4_;
    fVar225 = auVar183._12_4_;
    fVar192 = auVar183._16_4_;
    fVar226 = auVar183._20_4_;
    fVar227 = auVar183._24_4_;
    fVar256 = auVar302._28_4_ + fVar289 + auVar373._28_4_ + 1.0 + 1.0;
    fVar223 = local_3a0._28_4_;
    fVar290 = local_3c0._0_4_ * auVar162._0_4_ + auVar298._0_4_ * fVar104;
    fVar303 = local_3c0._4_4_ * auVar162._4_4_ + auVar298._4_4_ * fVar224;
    fVar306 = local_3c0._8_4_ * auVar162._8_4_ + auVar298._8_4_ * fVar175;
    fVar309 = local_3c0._12_4_ * auVar162._12_4_ + auVar298._12_4_ * fVar225;
    fVar312 = local_3c0._16_4_ * auVar162._16_4_ + auVar298._16_4_ * fVar192;
    fVar315 = local_3c0._20_4_ * auVar162._20_4_ + auVar298._20_4_ * fVar226;
    fVar318 = local_3c0._24_4_ * auVar162._24_4_ + auVar298._24_4_ * fVar227;
    fVar228 = local_3e0._0_4_ * auVar162._0_4_ + auVar421._0_4_ * fVar104;
    fVar230 = local_3e0._4_4_ * auVar162._4_4_ + auVar421._4_4_ * fVar224;
    fVar229 = local_3e0._8_4_ * auVar162._8_4_ + auVar421._8_4_ * fVar175;
    fVar252 = local_3e0._12_4_ * auVar162._12_4_ + auVar421._12_4_ * fVar225;
    fVar253 = local_3e0._16_4_ * auVar162._16_4_ + auVar421._16_4_ * fVar192;
    fVar254 = local_3e0._20_4_ * auVar162._20_4_ + auVar421._20_4_ * fVar226;
    fVar255 = local_3e0._24_4_ * auVar162._24_4_ + auVar421._24_4_ * fVar227;
    fVar257 = (float)local_200._0_4_ * auVar162._0_4_ + auVar373._0_4_ * fVar104;
    fVar277 = (float)local_200._4_4_ * auVar162._4_4_ + auVar373._4_4_ * fVar224;
    fVar279 = fStack_1f8 * auVar162._8_4_ + auVar373._8_4_ * fVar175;
    fVar281 = fStack_1f4 * auVar162._12_4_ + auVar373._12_4_ * fVar225;
    fVar283 = fStack_1f0 * auVar162._16_4_ + auVar373._16_4_ * fVar192;
    fVar285 = fStack_1ec * auVar162._20_4_ + auVar373._20_4_ * fVar226;
    fVar287 = fStack_1e8 * auVar162._24_4_ + auVar373._24_4_ * fVar227;
    fVar258 = (float)local_220._0_4_ * auVar162._0_4_ + auVar302._0_4_ * fVar104;
    fVar278 = (float)local_220._4_4_ * auVar162._4_4_ + auVar302._4_4_ * fVar224;
    fVar280 = fStack_218 * auVar162._8_4_ + auVar302._8_4_ * fVar175;
    fVar282 = fStack_214 * auVar162._12_4_ + auVar302._12_4_ * fVar225;
    fVar284 = fStack_210 * auVar162._16_4_ + auVar302._16_4_ * fVar192;
    fVar286 = fStack_20c * auVar162._20_4_ + auVar302._20_4_ * fVar226;
    fVar288 = fStack_208 * auVar162._24_4_ + auVar302._24_4_ * fVar227;
    fVar417 = fVar223 + fVar289;
    fVar397 = auVar30._12_4_ + fVar223;
    auVar337._0_4_ =
         fVar104 * (auVar298._0_4_ * auVar162._0_4_ + fVar104 * (float)local_1e0._0_4_) +
         auVar162._0_4_ * fVar290;
    auVar337._4_4_ =
         fVar224 * (auVar298._4_4_ * auVar162._4_4_ + fVar224 * (float)local_1e0._4_4_) +
         auVar162._4_4_ * fVar303;
    auVar337._8_4_ =
         fVar175 * (auVar298._8_4_ * auVar162._8_4_ + fVar175 * fStack_1d8) +
         auVar162._8_4_ * fVar306;
    auVar337._12_4_ =
         fVar225 * (auVar298._12_4_ * auVar162._12_4_ + fVar225 * fStack_1d4) +
         auVar162._12_4_ * fVar309;
    auVar337._16_4_ =
         fVar192 * (auVar298._16_4_ * auVar162._16_4_ + fVar192 * fStack_1d0) +
         auVar162._16_4_ * fVar312;
    auVar337._20_4_ =
         fVar226 * (auVar298._20_4_ * auVar162._20_4_ + fVar226 * fStack_1cc) +
         auVar162._20_4_ * fVar315;
    auVar337._24_4_ =
         fVar227 * (auVar298._24_4_ * auVar162._24_4_ + fVar227 * fStack_1c8) +
         auVar162._24_4_ * fVar318;
    auVar337._28_4_ = local_3c0._28_4_ + fVar223;
    auVar356._0_4_ =
         fVar104 * (auVar421._0_4_ * auVar162._0_4_ + auVar358._0_4_ * fVar104) +
         auVar162._0_4_ * fVar228;
    auVar356._4_4_ =
         fVar224 * (auVar421._4_4_ * auVar162._4_4_ + auVar358._4_4_ * fVar224) +
         auVar162._4_4_ * fVar230;
    auVar356._8_4_ =
         fVar175 * (auVar421._8_4_ * auVar162._8_4_ + auVar358._8_4_ * fVar175) +
         auVar162._8_4_ * fVar229;
    auVar356._12_4_ =
         fVar225 * (auVar421._12_4_ * auVar162._12_4_ + auVar358._12_4_ * fVar225) +
         auVar162._12_4_ * fVar252;
    auVar356._16_4_ =
         fVar192 * (auVar421._16_4_ * auVar162._16_4_ + auVar358._16_4_ * fVar192) +
         auVar162._16_4_ * fVar253;
    auVar356._20_4_ =
         fVar226 * (auVar421._20_4_ * auVar162._20_4_ + auVar358._20_4_ * fVar226) +
         auVar162._20_4_ * fVar254;
    auVar356._24_4_ =
         fVar227 * (auVar421._24_4_ * auVar162._24_4_ + auVar358._24_4_ * fVar227) +
         auVar162._24_4_ * fVar255;
    auVar356._28_4_ = local_3e0._28_4_ + fVar223;
    auVar369._0_4_ =
         fVar104 * (auVar373._0_4_ * auVar162._0_4_ + local_3a0._0_4_ * fVar104) +
         auVar162._0_4_ * fVar257;
    auVar369._4_4_ =
         fVar224 * (auVar373._4_4_ * auVar162._4_4_ + local_3a0._4_4_ * fVar224) +
         auVar162._4_4_ * fVar277;
    auVar369._8_4_ =
         fVar175 * (auVar373._8_4_ * auVar162._8_4_ + local_3a0._8_4_ * fVar175) +
         auVar162._8_4_ * fVar279;
    auVar369._12_4_ =
         fVar225 * (auVar373._12_4_ * auVar162._12_4_ + local_3a0._12_4_ * fVar225) +
         auVar162._12_4_ * fVar281;
    auVar369._16_4_ =
         fVar192 * (auVar373._16_4_ * auVar162._16_4_ + local_3a0._16_4_ * fVar192) +
         auVar162._16_4_ * fVar283;
    auVar369._20_4_ =
         fVar226 * (auVar373._20_4_ * auVar162._20_4_ + local_3a0._20_4_ * fVar226) +
         auVar162._20_4_ * fVar285;
    auVar369._24_4_ =
         fVar227 * (auVar373._24_4_ * auVar162._24_4_ + local_3a0._24_4_ * fVar227) +
         auVar162._24_4_ * fVar287;
    auVar369._28_4_ = fStack_1e4 + fVar223;
    auVar326._0_4_ =
         auVar162._0_4_ * fVar258 +
         fVar104 * (auVar302._0_4_ * auVar162._0_4_ + auVar30._0_4_ * fVar104);
    auVar326._4_4_ =
         auVar162._4_4_ * fVar278 +
         fVar224 * (auVar302._4_4_ * auVar162._4_4_ + auVar30._4_4_ * fVar224);
    auVar326._8_4_ =
         auVar162._8_4_ * fVar280 +
         fVar175 * (auVar302._8_4_ * auVar162._8_4_ + auVar30._8_4_ * fVar175);
    auVar326._12_4_ =
         auVar162._12_4_ * fVar282 +
         fVar225 * (auVar302._12_4_ * auVar162._12_4_ + auVar30._12_4_ * fVar225);
    auVar326._16_4_ =
         auVar162._16_4_ * fVar284 +
         fVar192 * (auVar302._16_4_ * auVar162._16_4_ + auVar30._0_4_ * fVar192);
    auVar326._20_4_ =
         auVar162._20_4_ * fVar286 +
         fVar226 * (auVar302._20_4_ * auVar162._20_4_ + auVar30._4_4_ * fVar226);
    auVar326._24_4_ =
         auVar162._24_4_ * fVar288 +
         fVar227 * (auVar302._24_4_ * auVar162._24_4_ + auVar30._8_4_ * fVar227);
    auVar326._28_4_ = fStack_1e4 + fStack_204;
    auVar119._0_4_ =
         (auVar162._0_4_ * (float)local_240._0_4_ + local_3c0._0_4_ * fVar104) * auVar162._0_4_ +
         fVar104 * fVar290;
    auVar119._4_4_ =
         (auVar162._4_4_ * (float)local_240._4_4_ + local_3c0._4_4_ * fVar224) * auVar162._4_4_ +
         fVar224 * fVar303;
    auVar119._8_4_ =
         (auVar162._8_4_ * fStack_238 + local_3c0._8_4_ * fVar175) * auVar162._8_4_ +
         fVar175 * fVar306;
    auVar119._12_4_ =
         (auVar162._12_4_ * fStack_234 + local_3c0._12_4_ * fVar225) * auVar162._12_4_ +
         fVar225 * fVar309;
    auVar119._16_4_ =
         (auVar162._16_4_ * fStack_230 + local_3c0._16_4_ * fVar192) * auVar162._16_4_ +
         fVar192 * fVar312;
    auVar119._20_4_ =
         (auVar162._20_4_ * fStack_22c + local_3c0._20_4_ * fVar226) * auVar162._20_4_ +
         fVar226 * fVar315;
    auVar119._24_4_ =
         (auVar162._24_4_ * fStack_228 + local_3c0._24_4_ * fVar227) * auVar162._24_4_ +
         fVar227 * fVar318;
    auVar119._28_4_ = fStack_1e4 + fVar256 + auVar302._28_4_;
    auVar219._0_4_ =
         (auVar162._0_4_ * (float)local_260._0_4_ + local_3e0._0_4_ * fVar104) * auVar162._0_4_ +
         fVar104 * fVar228;
    auVar219._4_4_ =
         (auVar162._4_4_ * (float)local_260._4_4_ + local_3e0._4_4_ * fVar224) * auVar162._4_4_ +
         fVar224 * fVar230;
    auVar219._8_4_ =
         (auVar162._8_4_ * fStack_258 + local_3e0._8_4_ * fVar175) * auVar162._8_4_ +
         fVar175 * fVar229;
    auVar219._12_4_ =
         (auVar162._12_4_ * fStack_254 + local_3e0._12_4_ * fVar225) * auVar162._12_4_ +
         fVar225 * fVar252;
    auVar219._16_4_ =
         (auVar162._16_4_ * fStack_250 + local_3e0._16_4_ * fVar192) * auVar162._16_4_ +
         fVar192 * fVar253;
    auVar219._20_4_ =
         (auVar162._20_4_ * fStack_24c + local_3e0._20_4_ * fVar226) * auVar162._20_4_ +
         fVar226 * fVar254;
    auVar219._24_4_ =
         (auVar162._24_4_ * fStack_248 + local_3e0._24_4_ * fVar227) * auVar162._24_4_ +
         fVar227 * fVar255;
    auVar219._28_4_ = fStack_1e4 + fVar256 + 1.0;
    auVar244._0_4_ =
         (auVar162._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar104) *
         auVar162._0_4_ + fVar104 * fVar257;
    auVar244._4_4_ =
         (auVar162._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar224) *
         auVar162._4_4_ + fVar224 * fVar277;
    auVar244._8_4_ =
         (auVar162._8_4_ * fStack_278 + fStack_1f8 * fVar175) * auVar162._8_4_ + fVar175 * fVar279;
    auVar244._12_4_ =
         (auVar162._12_4_ * fStack_274 + fStack_1f4 * fVar225) * auVar162._12_4_ + fVar225 * fVar281
    ;
    auVar244._16_4_ =
         (auVar162._16_4_ * fStack_270 + fStack_1f0 * fVar192) * auVar162._16_4_ + fVar192 * fVar283
    ;
    auVar244._20_4_ =
         (auVar162._20_4_ * fStack_26c + fStack_1ec * fVar226) * auVar162._20_4_ + fVar226 * fVar285
    ;
    auVar244._24_4_ =
         (auVar162._24_4_ * fStack_268 + fStack_1e8 * fVar227) * auVar162._24_4_ + fVar227 * fVar287
    ;
    auVar244._28_4_ = fVar397 + fVar289 + 1.0;
    auVar267._0_4_ =
         (auVar162._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar104) *
         auVar162._0_4_ + fVar104 * fVar258;
    auVar267._4_4_ =
         (auVar162._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar224) *
         auVar162._4_4_ + fVar224 * fVar278;
    auVar267._8_4_ =
         (auVar162._8_4_ * fStack_298 + fStack_218 * fVar175) * auVar162._8_4_ + fVar175 * fVar280;
    auVar267._12_4_ =
         (auVar162._12_4_ * fStack_294 + fStack_214 * fVar225) * auVar162._12_4_ + fVar225 * fVar282
    ;
    auVar267._16_4_ =
         (auVar162._16_4_ * fStack_290 + fStack_210 * fVar192) * auVar162._16_4_ + fVar192 * fVar284
    ;
    auVar267._20_4_ =
         (auVar162._20_4_ * fStack_28c + fStack_20c * fVar226) * auVar162._20_4_ + fVar226 * fVar286
    ;
    auVar267._24_4_ =
         (auVar162._24_4_ * fStack_288 + fStack_208 * fVar227) * auVar162._24_4_ + fVar227 * fVar288
    ;
    auVar267._28_4_ = fVar417 + fVar223 + fVar289;
    fVar291 = auVar337._0_4_ * fVar104 + auVar162._0_4_ * auVar119._0_4_;
    fVar304 = auVar337._4_4_ * fVar224 + auVar162._4_4_ * auVar119._4_4_;
    fVar307 = auVar337._8_4_ * fVar175 + auVar162._8_4_ * auVar119._8_4_;
    fVar310 = auVar337._12_4_ * fVar225 + auVar162._12_4_ * auVar119._12_4_;
    fVar313 = auVar337._16_4_ * fVar192 + auVar162._16_4_ * auVar119._16_4_;
    fVar316 = auVar337._20_4_ * fVar226 + auVar162._20_4_ * auVar119._20_4_;
    fVar319 = auVar337._24_4_ * fVar227 + auVar162._24_4_ * auVar119._24_4_;
    fVar321 = fVar417 + fStack_1e4;
    local_aa0._0_4_ = auVar356._0_4_ * fVar104 + auVar162._0_4_ * auVar219._0_4_;
    local_aa0._4_4_ = auVar356._4_4_ * fVar224 + auVar162._4_4_ * auVar219._4_4_;
    local_aa0._8_4_ = auVar356._8_4_ * fVar175 + auVar162._8_4_ * auVar219._8_4_;
    local_aa0._12_4_ = auVar356._12_4_ * fVar225 + auVar162._12_4_ * auVar219._12_4_;
    local_aa0._16_4_ = auVar356._16_4_ * fVar192 + auVar162._16_4_ * auVar219._16_4_;
    local_aa0._20_4_ = auVar356._20_4_ * fVar226 + auVar162._20_4_ * auVar219._20_4_;
    local_aa0._24_4_ = auVar356._24_4_ * fVar227 + auVar162._24_4_ * auVar219._24_4_;
    local_aa0._28_4_ = fStack_1e4 + fVar397;
    local_320._0_4_ = auVar369._0_4_ * fVar104 + auVar162._0_4_ * auVar244._0_4_;
    local_320._4_4_ = auVar369._4_4_ * fVar224 + auVar162._4_4_ * auVar244._4_4_;
    local_320._8_4_ = auVar369._8_4_ * fVar175 + auVar162._8_4_ * auVar244._8_4_;
    local_320._12_4_ = auVar369._12_4_ * fVar225 + auVar162._12_4_ * auVar244._12_4_;
    local_320._16_4_ = auVar369._16_4_ * fVar192 + auVar162._16_4_ * auVar244._16_4_;
    local_320._20_4_ = auVar369._20_4_ * fVar226 + auVar162._20_4_ * auVar244._20_4_;
    local_320._24_4_ = auVar369._24_4_ * fVar227 + auVar162._24_4_ * auVar244._24_4_;
    local_320._28_4_ = fVar397 + fStack_1e4;
    local_ca0._0_4_ = auVar209._0_4_;
    local_660._0_4_ = fVar104 * auVar326._0_4_ + auVar162._0_4_ * auVar267._0_4_;
    local_660._4_4_ = fVar224 * auVar326._4_4_ + auVar162._4_4_ * auVar267._4_4_;
    local_660._8_4_ = fVar175 * auVar326._8_4_ + auVar162._8_4_ * auVar267._8_4_;
    local_660._12_4_ = fVar225 * auVar326._12_4_ + auVar162._12_4_ * auVar267._12_4_;
    local_660._16_4_ = fVar192 * auVar326._16_4_ + auVar162._16_4_ * auVar267._16_4_;
    local_660._20_4_ = fVar226 * auVar326._20_4_ + auVar162._20_4_ * auVar267._20_4_;
    local_660._24_4_ = fVar227 * auVar326._24_4_ + auVar162._24_4_ * auVar267._24_4_;
    local_660._28_4_ = auVar183._28_4_ + auVar162._28_4_;
    auVar183 = vsubps_avx(auVar119,auVar337);
    auVar25 = vsubps_avx(auVar219,auVar356);
    auVar126 = vsubps_avx(auVar244,auVar369);
    auVar26 = vsubps_avx(auVar267,auVar326);
    auVar206 = vshufps_avx(ZEXT416((uint)((float)local_ca0._0_4_ * 0.04761905)),
                           ZEXT416((uint)((float)local_ca0._0_4_ * 0.04761905)),0);
    fVar257 = auVar206._0_4_;
    fVar381 = fVar257 * auVar183._0_4_ * 3.0;
    fVar277 = auVar206._4_4_;
    fVar391 = fVar277 * auVar183._4_4_ * 3.0;
    local_9c0._4_4_ = fVar391;
    local_9c0._0_4_ = fVar381;
    fVar287 = auVar206._8_4_;
    fVar392 = fVar287 * auVar183._8_4_ * 3.0;
    local_9c0._8_4_ = fVar392;
    fVar252 = auVar206._12_4_;
    fVar393 = fVar252 * auVar183._12_4_ * 3.0;
    local_9c0._12_4_ = fVar393;
    fVar394 = fVar257 * auVar183._16_4_ * 3.0;
    local_9c0._16_4_ = fVar394;
    fVar395 = fVar277 * auVar183._20_4_ * 3.0;
    local_9c0._20_4_ = fVar395;
    fVar396 = fVar287 * auVar183._24_4_ * 3.0;
    local_9c0._24_4_ = fVar396;
    local_9c0._28_4_ = fVar397;
    fVar365 = fVar257 * auVar25._0_4_ * 3.0;
    fVar375 = fVar277 * auVar25._4_4_ * 3.0;
    auVar40._4_4_ = fVar375;
    auVar40._0_4_ = fVar365;
    fVar376 = fVar287 * auVar25._8_4_ * 3.0;
    auVar40._8_4_ = fVar376;
    fVar377 = fVar252 * auVar25._12_4_ * 3.0;
    auVar40._12_4_ = fVar377;
    fVar378 = fVar257 * auVar25._16_4_ * 3.0;
    auVar40._16_4_ = fVar378;
    fVar379 = fVar277 * auVar25._20_4_ * 3.0;
    auVar40._20_4_ = fVar379;
    fVar380 = fVar287 * auVar25._24_4_ * 3.0;
    auVar40._24_4_ = fVar380;
    auVar40._28_4_ = auVar369._28_4_;
    fVar398 = fVar257 * auVar126._0_4_ * 3.0;
    fVar405 = fVar277 * auVar126._4_4_ * 3.0;
    auVar41._4_4_ = fVar405;
    auVar41._0_4_ = fVar398;
    fVar407 = fVar287 * auVar126._8_4_ * 3.0;
    auVar41._8_4_ = fVar407;
    fVar409 = fVar252 * auVar126._12_4_ * 3.0;
    auVar41._12_4_ = fVar409;
    fVar411 = fVar257 * auVar126._16_4_ * 3.0;
    auVar41._16_4_ = fVar411;
    fVar413 = fVar277 * auVar126._20_4_ * 3.0;
    auVar41._20_4_ = fVar413;
    fVar415 = fVar287 * auVar126._24_4_ * 3.0;
    auVar41._24_4_ = fVar415;
    auVar41._28_4_ = fVar417;
    fVar225 = fVar257 * auVar26._0_4_ * 3.0;
    fVar192 = fVar277 * auVar26._4_4_ * 3.0;
    auVar42._4_4_ = fVar192;
    auVar42._0_4_ = fVar225;
    fVar229 = fVar287 * auVar26._8_4_ * 3.0;
    auVar42._8_4_ = fVar229;
    fVar252 = fVar252 * auVar26._12_4_ * 3.0;
    auVar42._12_4_ = fVar252;
    fVar257 = fVar257 * auVar26._16_4_ * 3.0;
    auVar42._16_4_ = fVar257;
    fVar277 = fVar277 * auVar26._20_4_ * 3.0;
    auVar42._20_4_ = fVar277;
    fVar287 = fVar287 * auVar26._24_4_ * 3.0;
    auVar42._24_4_ = fVar287;
    auVar42._28_4_ = auVar25._28_4_;
    auVar183 = vperm2f128_avx(local_aa0,local_aa0,1);
    auVar183 = vshufps_avx(auVar183,local_aa0,0x30);
    auVar26 = vshufps_avx(local_aa0,auVar183,0x29);
    auVar183 = vperm2f128_avx(local_320,local_320,1);
    auVar183 = vshufps_avx(auVar183,local_320,0x30);
    auVar27 = vshufps_avx(local_320,auVar183,0x29);
    auVar126 = vsubps_avx(local_660,auVar42);
    auVar183 = vperm2f128_avx(auVar126,auVar126,1);
    auVar183 = vshufps_avx(auVar183,auVar126,0x30);
    local_680 = vshufps_avx(auVar126,auVar183,0x29);
    local_560 = vsubps_avx(auVar26,local_aa0);
    local_340 = vsubps_avx(auVar27,local_320);
    fVar223 = local_560._0_4_;
    fVar226 = local_560._4_4_;
    auVar43._4_4_ = fVar405 * fVar226;
    auVar43._0_4_ = fVar398 * fVar223;
    fVar253 = local_560._8_4_;
    auVar43._8_4_ = fVar407 * fVar253;
    fVar279 = local_560._12_4_;
    auVar43._12_4_ = fVar409 * fVar279;
    fVar278 = local_560._16_4_;
    auVar43._16_4_ = fVar411 * fVar278;
    fVar290 = local_560._20_4_;
    auVar43._20_4_ = fVar413 * fVar290;
    fVar318 = local_560._24_4_;
    auVar43._24_4_ = fVar415 * fVar318;
    auVar43._28_4_ = auVar126._28_4_;
    fVar104 = local_340._0_4_;
    fVar227 = local_340._4_4_;
    auVar44._4_4_ = fVar375 * fVar227;
    auVar44._0_4_ = fVar365 * fVar104;
    fVar254 = local_340._8_4_;
    auVar44._8_4_ = fVar376 * fVar254;
    fVar281 = local_340._12_4_;
    auVar44._12_4_ = fVar377 * fVar281;
    fVar280 = local_340._16_4_;
    auVar44._16_4_ = fVar378 * fVar280;
    fVar303 = local_340._20_4_;
    auVar44._20_4_ = fVar379 * fVar303;
    fVar31 = local_340._24_4_;
    auVar44._24_4_ = fVar380 * fVar31;
    auVar44._28_4_ = auVar183._28_4_;
    auVar29 = vsubps_avx(auVar44,auVar43);
    auVar88._4_4_ = fVar304;
    auVar88._0_4_ = fVar291;
    auVar88._8_4_ = fVar307;
    auVar88._12_4_ = fVar310;
    auVar88._16_4_ = fVar313;
    auVar88._20_4_ = fVar316;
    auVar88._24_4_ = fVar319;
    auVar88._28_4_ = fVar321;
    auVar183 = vperm2f128_avx(auVar88,auVar88,1);
    auVar183 = vshufps_avx(auVar183,auVar88,0x30);
    auVar28 = vshufps_avx(auVar88,auVar183,0x29);
    local_580 = vsubps_avx(auVar28,auVar88);
    auVar45._4_4_ = fVar391 * fVar227;
    auVar45._0_4_ = fVar381 * fVar104;
    auVar45._8_4_ = fVar392 * fVar254;
    auVar45._12_4_ = fVar393 * fVar281;
    auVar45._16_4_ = fVar394 * fVar280;
    auVar45._20_4_ = fVar395 * fVar303;
    auVar45._24_4_ = fVar396 * fVar31;
    auVar45._28_4_ = auVar28._28_4_;
    fVar224 = local_580._0_4_;
    fVar228 = local_580._4_4_;
    auVar46._4_4_ = fVar405 * fVar228;
    auVar46._0_4_ = fVar398 * fVar224;
    fVar255 = local_580._8_4_;
    auVar46._8_4_ = fVar407 * fVar255;
    fVar283 = local_580._12_4_;
    auVar46._12_4_ = fVar409 * fVar283;
    fVar282 = local_580._16_4_;
    auVar46._16_4_ = fVar411 * fVar282;
    fVar306 = local_580._20_4_;
    auVar46._20_4_ = fVar413 * fVar306;
    fVar32 = local_580._24_4_;
    auVar46._24_4_ = fVar415 * fVar32;
    auVar46._28_4_ = auVar337._28_4_;
    auVar245 = vsubps_avx(auVar46,auVar45);
    auVar47._4_4_ = fVar375 * fVar228;
    auVar47._0_4_ = fVar365 * fVar224;
    auVar47._8_4_ = fVar376 * fVar255;
    auVar47._12_4_ = fVar377 * fVar283;
    auVar47._16_4_ = fVar378 * fVar282;
    auVar47._20_4_ = fVar379 * fVar306;
    auVar47._24_4_ = fVar380 * fVar32;
    auVar47._28_4_ = auVar337._28_4_;
    auVar48._4_4_ = fVar391 * fVar226;
    auVar48._0_4_ = fVar381 * fVar223;
    auVar48._8_4_ = fVar392 * fVar253;
    auVar48._12_4_ = fVar393 * fVar279;
    auVar48._16_4_ = fVar394 * fVar278;
    auVar48._20_4_ = fVar395 * fVar290;
    auVar48._24_4_ = fVar396 * fVar318;
    auVar48._28_4_ = auVar356._28_4_;
    auVar38 = vsubps_avx(auVar48,auVar47);
    fVar289 = auVar38._28_4_;
    auVar220._0_4_ = fVar224 * fVar224 + fVar223 * fVar223 + fVar104 * fVar104;
    auVar220._4_4_ = fVar228 * fVar228 + fVar226 * fVar226 + fVar227 * fVar227;
    auVar220._8_4_ = fVar255 * fVar255 + fVar253 * fVar253 + fVar254 * fVar254;
    auVar220._12_4_ = fVar283 * fVar283 + fVar279 * fVar279 + fVar281 * fVar281;
    auVar220._16_4_ = fVar282 * fVar282 + fVar278 * fVar278 + fVar280 * fVar280;
    auVar220._20_4_ = fVar306 * fVar306 + fVar290 * fVar290 + fVar303 * fVar303;
    auVar220._24_4_ = fVar32 * fVar32 + fVar318 * fVar318 + fVar31 * fVar31;
    auVar220._28_4_ = fVar289 + fVar289 + auVar29._28_4_;
    auVar183 = vrcpps_avx(auVar220);
    fVar258 = auVar183._0_4_;
    fVar286 = auVar183._4_4_;
    auVar49._4_4_ = fVar286 * auVar220._4_4_;
    auVar49._0_4_ = fVar258 * auVar220._0_4_;
    fVar288 = auVar183._8_4_;
    auVar49._8_4_ = fVar288 * auVar220._8_4_;
    fVar312 = auVar183._12_4_;
    auVar49._12_4_ = fVar312 * auVar220._12_4_;
    fVar315 = auVar183._16_4_;
    auVar49._16_4_ = fVar315 * auVar220._16_4_;
    fVar340 = auVar183._20_4_;
    auVar49._20_4_ = fVar340 * auVar220._20_4_;
    fVar341 = auVar183._24_4_;
    auVar49._24_4_ = fVar341 * auVar220._24_4_;
    auVar49._28_4_ = auVar356._28_4_;
    auVar120._8_4_ = 0x3f800000;
    auVar120._0_8_ = 0x3f8000003f800000;
    auVar120._12_4_ = 0x3f800000;
    auVar120._16_4_ = 0x3f800000;
    auVar120._20_4_ = 0x3f800000;
    auVar120._24_4_ = 0x3f800000;
    auVar120._28_4_ = 0x3f800000;
    auVar246 = vsubps_avx(auVar120,auVar49);
    fVar258 = fVar258 + fVar258 * auVar246._0_4_;
    fVar286 = fVar286 + fVar286 * auVar246._4_4_;
    fVar288 = fVar288 + fVar288 * auVar246._8_4_;
    fVar312 = fVar312 + fVar312 * auVar246._12_4_;
    fVar315 = fVar315 + fVar315 * auVar246._16_4_;
    fVar340 = fVar340 + fVar340 * auVar246._20_4_;
    fVar341 = fVar341 + fVar341 * auVar246._24_4_;
    auVar126 = vperm2f128_avx(auVar40,auVar40,1);
    auVar126 = vshufps_avx(auVar126,auVar40,0x30);
    local_b20 = vshufps_avx(auVar40,auVar126,0x29);
    auVar126 = vperm2f128_avx(auVar41,auVar41,1);
    auVar126 = vshufps_avx(auVar126,auVar41,0x30);
    local_a80 = vshufps_avx(auVar41,auVar126,0x29);
    fVar103 = local_a80._0_4_;
    fVar133 = local_a80._4_4_;
    auVar50._4_4_ = fVar133 * fVar226;
    auVar50._0_4_ = fVar103 * fVar223;
    fVar135 = local_a80._8_4_;
    auVar50._8_4_ = fVar135 * fVar253;
    fVar137 = local_a80._12_4_;
    auVar50._12_4_ = fVar137 * fVar279;
    fVar138 = local_a80._16_4_;
    auVar50._16_4_ = fVar138 * fVar278;
    fVar139 = local_a80._20_4_;
    auVar50._20_4_ = fVar139 * fVar290;
    fVar140 = local_a80._24_4_;
    auVar50._24_4_ = fVar140 * fVar318;
    auVar50._28_4_ = auVar126._28_4_;
    fVar175 = local_b20._0_4_;
    fVar230 = local_b20._4_4_;
    auVar51._4_4_ = fVar227 * fVar230;
    auVar51._0_4_ = fVar104 * fVar175;
    fVar256 = local_b20._8_4_;
    auVar51._8_4_ = fVar254 * fVar256;
    fVar285 = local_b20._12_4_;
    auVar51._12_4_ = fVar281 * fVar285;
    fVar284 = local_b20._16_4_;
    auVar51._16_4_ = fVar280 * fVar284;
    fVar309 = local_b20._20_4_;
    auVar51._20_4_ = fVar303 * fVar309;
    fVar423 = local_b20._24_4_;
    auVar51._24_4_ = fVar31 * fVar423;
    auVar51._28_4_ = auVar369._28_4_;
    auVar39 = vsubps_avx(auVar51,auVar50);
    auVar126 = vperm2f128_avx(local_9c0,local_9c0,1);
    auVar126 = vshufps_avx(auVar126,local_9c0,0x30);
    local_920 = vshufps_avx(local_9c0,auVar126,0x29);
    fVar399 = local_920._0_4_;
    fVar406 = local_920._4_4_;
    auVar52._4_4_ = fVar406 * fVar227;
    auVar52._0_4_ = fVar399 * fVar104;
    fVar408 = local_920._8_4_;
    auVar52._8_4_ = fVar408 * fVar254;
    fVar410 = local_920._12_4_;
    auVar52._12_4_ = fVar410 * fVar281;
    fVar412 = local_920._16_4_;
    auVar52._16_4_ = fVar412 * fVar280;
    fVar414 = local_920._20_4_;
    auVar52._20_4_ = fVar414 * fVar303;
    fVar416 = local_920._24_4_;
    auVar52._24_4_ = fVar416 * fVar31;
    auVar52._28_4_ = auVar126._28_4_;
    auVar53._4_4_ = fVar228 * fVar133;
    auVar53._0_4_ = fVar224 * fVar103;
    auVar53._8_4_ = fVar255 * fVar135;
    auVar53._12_4_ = fVar283 * fVar137;
    auVar53._16_4_ = fVar282 * fVar138;
    auVar53._20_4_ = fVar306 * fVar139;
    auVar53._24_4_ = fVar32 * fVar140;
    auVar53._28_4_ = fVar397;
    auVar126 = vsubps_avx(auVar53,auVar52);
    auVar54._4_4_ = fVar228 * fVar230;
    auVar54._0_4_ = fVar224 * fVar175;
    auVar54._8_4_ = fVar255 * fVar256;
    auVar54._12_4_ = fVar283 * fVar285;
    auVar54._16_4_ = fVar282 * fVar284;
    auVar54._20_4_ = fVar306 * fVar309;
    auVar54._24_4_ = fVar32 * fVar423;
    auVar54._28_4_ = fVar397;
    auVar55._4_4_ = fVar406 * fVar226;
    auVar55._0_4_ = fVar399 * fVar223;
    auVar55._8_4_ = fVar408 * fVar253;
    auVar55._12_4_ = fVar410 * fVar279;
    auVar55._16_4_ = fVar412 * fVar278;
    auVar55._20_4_ = fVar414 * fVar290;
    fVar397 = local_920._28_4_;
    auVar55._24_4_ = fVar416 * fVar318;
    auVar55._28_4_ = fVar397;
    auVar116 = vsubps_avx(auVar55,auVar54);
    auVar56._4_4_ =
         fVar286 * (auVar29._4_4_ * auVar29._4_4_ +
                   auVar38._4_4_ * auVar38._4_4_ + auVar245._4_4_ * auVar245._4_4_);
    auVar56._0_4_ =
         fVar258 * (auVar29._0_4_ * auVar29._0_4_ +
                   auVar38._0_4_ * auVar38._0_4_ + auVar245._0_4_ * auVar245._0_4_);
    auVar56._8_4_ =
         fVar288 * (auVar29._8_4_ * auVar29._8_4_ +
                   auVar38._8_4_ * auVar38._8_4_ + auVar245._8_4_ * auVar245._8_4_);
    auVar56._12_4_ =
         fVar312 * (auVar29._12_4_ * auVar29._12_4_ +
                   auVar38._12_4_ * auVar38._12_4_ + auVar245._12_4_ * auVar245._12_4_);
    auVar56._16_4_ =
         fVar315 * (auVar29._16_4_ * auVar29._16_4_ +
                   auVar38._16_4_ * auVar38._16_4_ + auVar245._16_4_ * auVar245._16_4_);
    auVar56._20_4_ =
         fVar340 * (auVar29._20_4_ * auVar29._20_4_ +
                   auVar38._20_4_ * auVar38._20_4_ + auVar245._20_4_ * auVar245._20_4_);
    auVar56._24_4_ =
         fVar341 * (auVar29._24_4_ * auVar29._24_4_ +
                   auVar38._24_4_ * auVar38._24_4_ + auVar245._24_4_ * auVar245._24_4_);
    auVar56._28_4_ = auVar29._28_4_ + fVar289 + auVar245._28_4_;
    auVar57._4_4_ =
         (auVar39._4_4_ * auVar39._4_4_ +
         auVar126._4_4_ * auVar126._4_4_ + auVar116._4_4_ * auVar116._4_4_) * fVar286;
    auVar57._0_4_ =
         (auVar39._0_4_ * auVar39._0_4_ +
         auVar126._0_4_ * auVar126._0_4_ + auVar116._0_4_ * auVar116._0_4_) * fVar258;
    auVar57._8_4_ =
         (auVar39._8_4_ * auVar39._8_4_ +
         auVar126._8_4_ * auVar126._8_4_ + auVar116._8_4_ * auVar116._8_4_) * fVar288;
    auVar57._12_4_ =
         (auVar39._12_4_ * auVar39._12_4_ +
         auVar126._12_4_ * auVar126._12_4_ + auVar116._12_4_ * auVar116._12_4_) * fVar312;
    auVar57._16_4_ =
         (auVar39._16_4_ * auVar39._16_4_ +
         auVar126._16_4_ * auVar126._16_4_ + auVar116._16_4_ * auVar116._16_4_) * fVar315;
    auVar57._20_4_ =
         (auVar39._20_4_ * auVar39._20_4_ +
         auVar126._20_4_ * auVar126._20_4_ + auVar116._20_4_ * auVar116._20_4_) * fVar340;
    auVar57._24_4_ =
         (auVar39._24_4_ * auVar39._24_4_ +
         auVar126._24_4_ * auVar126._24_4_ + auVar116._24_4_ * auVar116._24_4_) * fVar341;
    auVar57._28_4_ = auVar183._28_4_ + auVar246._28_4_;
    auVar183 = vmaxps_avx(auVar56,auVar57);
    auVar126 = vperm2f128_avx(local_660,local_660,1);
    auVar126 = vshufps_avx(auVar126,local_660,0x30);
    auVar29 = vshufps_avx(local_660,auVar126,0x29);
    local_6a0._0_4_ = local_660._0_4_ + fVar225;
    local_6a0._4_4_ = local_660._4_4_ + fVar192;
    local_6a0._8_4_ = local_660._8_4_ + fVar229;
    local_6a0._12_4_ = local_660._12_4_ + fVar252;
    local_6a0._16_4_ = local_660._16_4_ + fVar257;
    local_6a0._20_4_ = local_660._20_4_ + fVar277;
    local_6a0._24_4_ = local_660._24_4_ + fVar287;
    local_6a0._28_4_ = local_660._28_4_ + auVar25._28_4_;
    auVar126 = vmaxps_avx(local_660,local_6a0);
    auVar25 = vmaxps_avx(local_680,auVar29);
    auVar126 = vmaxps_avx(auVar126,auVar25);
    auVar25 = vrsqrtps_avx(auVar220);
    fVar289 = auVar25._0_4_;
    fVar225 = auVar25._4_4_;
    fVar192 = auVar25._8_4_;
    fVar229 = auVar25._12_4_;
    fVar252 = auVar25._16_4_;
    fVar257 = auVar25._20_4_;
    fVar277 = auVar25._24_4_;
    local_600 = fVar289 * 1.5 + fVar289 * fVar289 * fVar289 * auVar220._0_4_ * -0.5;
    fStack_5fc = fVar225 * 1.5 + fVar225 * fVar225 * fVar225 * auVar220._4_4_ * -0.5;
    fStack_5f8 = fVar192 * 1.5 + fVar192 * fVar192 * fVar192 * auVar220._8_4_ * -0.5;
    fStack_5f4 = fVar229 * 1.5 + fVar229 * fVar229 * fVar229 * auVar220._12_4_ * -0.5;
    fStack_5f0 = fVar252 * 1.5 + fVar252 * fVar252 * fVar252 * auVar220._16_4_ * -0.5;
    fStack_5ec = fVar257 * 1.5 + fVar257 * fVar257 * fVar257 * auVar220._20_4_ * -0.5;
    fStack_5e8 = fVar277 * 1.5 + fVar277 * fVar277 * fVar277 * auVar220._24_4_ * -0.5;
    auVar245 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_800 = vsubps_avx(auVar245,local_aa0);
    auVar245 = vsubps_avx(auVar245,local_320);
    fVar349 = auVar245._0_4_;
    fVar359 = auVar245._4_4_;
    fVar360 = auVar245._8_4_;
    fVar361 = auVar245._12_4_;
    fVar362 = auVar245._16_4_;
    fVar363 = auVar245._20_4_;
    fVar364 = auVar245._24_4_;
    fVar225 = local_800._0_4_;
    fVar229 = local_800._4_4_;
    fVar257 = local_800._8_4_;
    fVar287 = local_800._12_4_;
    fVar286 = local_800._16_4_;
    fVar312 = local_800._20_4_;
    fVar340 = local_800._24_4_;
    auVar89._4_4_ = fVar304;
    auVar89._0_4_ = fVar291;
    auVar89._8_4_ = fVar307;
    auVar89._12_4_ = fVar310;
    auVar89._16_4_ = fVar313;
    auVar89._20_4_ = fVar316;
    auVar89._24_4_ = fVar319;
    auVar89._28_4_ = fVar321;
    auVar246 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar245 = vsubps_avx(auVar246,auVar89);
    fVar192 = auVar245._0_4_;
    fVar252 = auVar245._4_4_;
    fVar277 = auVar245._8_4_;
    fVar258 = auVar245._12_4_;
    fVar288 = auVar245._16_4_;
    fVar315 = auVar245._20_4_;
    fVar341 = auVar245._24_4_;
    auVar388._0_4_ =
         (float)local_ac0._0_4_ * fVar192 +
         (float)local_700._0_4_ * fVar225 + fVar349 * (float)local_8a0._0_4_;
    auVar388._4_4_ =
         (float)local_ac0._4_4_ * fVar252 +
         (float)local_700._4_4_ * fVar229 + fVar359 * (float)local_8a0._4_4_;
    auVar388._8_4_ = fStack_ab8 * fVar277 + fStack_6f8 * fVar257 + fVar360 * fStack_898;
    auVar388._12_4_ = fStack_ab4 * fVar258 + fStack_6f4 * fVar287 + fVar361 * fStack_894;
    auVar388._16_4_ = fStack_ab0 * fVar288 + fStack_6f0 * fVar286 + fVar362 * fStack_890;
    auVar388._20_4_ = fStack_aac * fVar315 + fStack_6ec * fVar312 + fVar363 * fStack_88c;
    auVar388._24_4_ = fStack_aa8 * fVar341 + fStack_6e8 * fVar340 + fVar364 * fStack_888;
    auVar388._28_4_ = fVar397 + auVar116._28_4_ + auVar220._28_4_;
    auVar404._0_4_ = fVar192 * fVar192 + fVar225 * fVar225 + fVar349 * fVar349;
    auVar404._4_4_ = fVar252 * fVar252 + fVar229 * fVar229 + fVar359 * fVar359;
    auVar404._8_4_ = fVar277 * fVar277 + fVar257 * fVar257 + fVar360 * fVar360;
    auVar404._12_4_ = fVar258 * fVar258 + fVar287 * fVar287 + fVar361 * fVar361;
    auVar404._16_4_ = fVar288 * fVar288 + fVar286 * fVar286 + fVar362 * fVar362;
    auVar404._20_4_ = fVar315 * fVar315 + fVar312 * fVar312 + fVar363 * fVar363;
    auVar404._24_4_ = fVar341 * fVar341 + fVar340 * fVar340 + fVar364 * fVar364;
    auVar404._28_4_ = local_320._28_4_ + local_320._28_4_ + fVar397;
    local_5a0._0_4_ =
         (float)local_ac0._0_4_ * fVar224 * local_600 +
         local_600 * fVar223 * (float)local_700._0_4_ + fVar104 * local_600 * (float)local_8a0._0_4_
    ;
    local_5a0._4_4_ =
         (float)local_ac0._4_4_ * fVar228 * fStack_5fc +
         fStack_5fc * fVar226 * (float)local_700._4_4_ +
         fVar227 * fStack_5fc * (float)local_8a0._4_4_;
    local_5a0._8_4_ =
         fStack_ab8 * fVar255 * fStack_5f8 +
         fStack_5f8 * fVar253 * fStack_6f8 + fVar254 * fStack_5f8 * fStack_898;
    local_5a0._12_4_ =
         fStack_ab4 * fVar283 * fStack_5f4 +
         fStack_5f4 * fVar279 * fStack_6f4 + fVar281 * fStack_5f4 * fStack_894;
    local_5a0._16_4_ =
         fStack_ab0 * fVar282 * fStack_5f0 +
         fStack_5f0 * fVar278 * fStack_6f0 + fVar280 * fStack_5f0 * fStack_890;
    local_5a0._20_4_ =
         fStack_aac * fVar306 * fStack_5ec +
         fStack_5ec * fVar290 * fStack_6ec + fVar303 * fStack_5ec * fStack_88c;
    local_5a0._24_4_ =
         fStack_aa8 * fVar32 * fStack_5e8 +
         fStack_5e8 * fVar318 * fStack_6e8 + fVar31 * fStack_5e8 * fStack_888;
    local_5a0._28_4_ = fStack_aa4 + fStack_6e4 + fStack_884;
    fVar289 = fStack_aa4 + fStack_6e4 + fStack_884;
    local_620._0_4_ =
         fVar192 * fVar224 * local_600 +
         local_600 * fVar223 * fVar225 + fVar349 * fVar104 * local_600;
    local_620._4_4_ =
         fVar252 * fVar228 * fStack_5fc +
         fStack_5fc * fVar226 * fVar229 + fVar359 * fVar227 * fStack_5fc;
    local_620._8_4_ =
         fVar277 * fVar255 * fStack_5f8 +
         fStack_5f8 * fVar253 * fVar257 + fVar360 * fVar254 * fStack_5f8;
    local_620._12_4_ =
         fVar258 * fVar283 * fStack_5f4 +
         fStack_5f4 * fVar279 * fVar287 + fVar361 * fVar281 * fStack_5f4;
    local_620._16_4_ =
         fVar288 * fVar282 * fStack_5f0 +
         fStack_5f0 * fVar278 * fVar286 + fVar362 * fVar280 * fStack_5f0;
    local_620._20_4_ =
         fVar315 * fVar306 * fStack_5ec +
         fStack_5ec * fVar290 * fVar312 + fVar363 * fVar303 * fStack_5ec;
    local_620._24_4_ =
         fVar341 * fVar32 * fStack_5e8 +
         fStack_5e8 * fVar318 * fVar340 + fVar364 * fVar31 * fStack_5e8;
    local_620._28_4_ = fStack_6e4 + fVar289;
    auVar58._4_4_ = local_5a0._4_4_ * local_620._4_4_;
    auVar58._0_4_ = local_5a0._0_4_ * local_620._0_4_;
    auVar58._8_4_ = local_5a0._8_4_ * local_620._8_4_;
    auVar58._12_4_ = local_5a0._12_4_ * local_620._12_4_;
    auVar58._16_4_ = local_5a0._16_4_ * local_620._16_4_;
    auVar58._20_4_ = local_5a0._20_4_ * local_620._20_4_;
    auVar58._24_4_ = local_5a0._24_4_ * local_620._24_4_;
    auVar58._28_4_ = fVar289;
    auVar245 = vsubps_avx(auVar388,auVar58);
    auVar59._4_4_ = local_620._4_4_ * local_620._4_4_;
    auVar59._0_4_ = local_620._0_4_ * local_620._0_4_;
    auVar59._8_4_ = local_620._8_4_ * local_620._8_4_;
    auVar59._12_4_ = local_620._12_4_ * local_620._12_4_;
    auVar59._16_4_ = local_620._16_4_ * local_620._16_4_;
    auVar59._20_4_ = local_620._20_4_ * local_620._20_4_;
    auVar59._24_4_ = local_620._24_4_ * local_620._24_4_;
    auVar59._28_4_ = fStack_6e4;
    local_6c0 = vsubps_avx(auVar404,auVar59);
    local_300 = vsqrtps_avx(auVar183);
    fVar289 = (local_300._0_4_ + auVar126._0_4_) * 1.0000002;
    fVar397 = (local_300._4_4_ + auVar126._4_4_) * 1.0000002;
    fVar193 = (local_300._8_4_ + auVar126._8_4_) * 1.0000002;
    fVar194 = (local_300._12_4_ + auVar126._12_4_) * 1.0000002;
    fVar195 = (local_300._16_4_ + auVar126._16_4_) * 1.0000002;
    fVar196 = (local_300._20_4_ + auVar126._20_4_) * 1.0000002;
    fVar197 = (local_300._24_4_ + auVar126._24_4_) * 1.0000002;
    auVar60._4_4_ = fVar397 * fVar397;
    auVar60._0_4_ = fVar289 * fVar289;
    auVar60._8_4_ = fVar193 * fVar193;
    auVar60._12_4_ = fVar194 * fVar194;
    auVar60._16_4_ = fVar195 * fVar195;
    auVar60._20_4_ = fVar196 * fVar196;
    auVar60._24_4_ = fVar197 * fVar197;
    auVar60._28_4_ = local_300._28_4_ + auVar126._28_4_;
    local_a20._0_4_ = auVar245._0_4_ + auVar245._0_4_;
    local_a20._4_4_ = auVar245._4_4_ + auVar245._4_4_;
    local_a20._8_4_ = auVar245._8_4_ + auVar245._8_4_;
    local_a20._12_4_ = auVar245._12_4_ + auVar245._12_4_;
    local_a20._16_4_ = auVar245._16_4_ + auVar245._16_4_;
    local_a20._20_4_ = auVar245._20_4_ + auVar245._20_4_;
    local_a20._24_4_ = auVar245._24_4_ + auVar245._24_4_;
    fVar289 = auVar245._28_4_;
    local_a20._28_4_ = fVar289 + fVar289;
    auVar126 = vsubps_avx(local_6c0,auVar60);
    auVar61._4_4_ = local_5a0._4_4_ * local_5a0._4_4_;
    auVar61._0_4_ = local_5a0._0_4_ * local_5a0._0_4_;
    auVar61._8_4_ = local_5a0._8_4_ * local_5a0._8_4_;
    auVar61._12_4_ = local_5a0._12_4_ * local_5a0._12_4_;
    auVar61._16_4_ = local_5a0._16_4_ * local_5a0._16_4_;
    auVar61._20_4_ = local_5a0._20_4_ * local_5a0._20_4_;
    auVar61._24_4_ = local_5a0._24_4_ * local_5a0._24_4_;
    auVar61._28_4_ = fVar289;
    auVar245 = vsubps_avx(local_2c0,auVar61);
    local_6e0._4_4_ = local_a20._4_4_ * local_a20._4_4_;
    local_6e0._0_4_ = (float)local_a20._0_4_ * (float)local_a20._0_4_;
    local_6e0._8_4_ = local_a20._8_4_ * local_a20._8_4_;
    local_6e0._12_4_ = local_a20._12_4_ * local_a20._12_4_;
    local_6e0._16_4_ = local_a20._16_4_ * local_a20._16_4_;
    local_6e0._20_4_ = local_a20._20_4_ * local_a20._20_4_;
    local_6e0._24_4_ = local_a20._24_4_ * local_a20._24_4_;
    local_6e0._28_4_ = local_2c0._28_4_;
    fVar289 = auVar245._0_4_;
    local_2e0 = fVar289 * 4.0;
    fVar397 = auVar245._4_4_;
    fStack_2dc = fVar397 * 4.0;
    fVar193 = auVar245._8_4_;
    fStack_2d8 = fVar193 * 4.0;
    fVar194 = auVar245._12_4_;
    fStack_2d4 = fVar194 * 4.0;
    fVar195 = auVar245._16_4_;
    fStack_2d0 = fVar195 * 4.0;
    fVar196 = auVar245._20_4_;
    fStack_2cc = fVar196 * 4.0;
    fVar197 = auVar245._24_4_;
    fStack_2c8 = fVar197 * 4.0;
    uStack_2c4 = 0x40800000;
    auVar62._4_4_ = auVar126._4_4_ * fStack_2dc;
    auVar62._0_4_ = auVar126._0_4_ * local_2e0;
    auVar62._8_4_ = auVar126._8_4_ * fStack_2d8;
    auVar62._12_4_ = auVar126._12_4_ * fStack_2d4;
    auVar62._16_4_ = auVar126._16_4_ * fStack_2d0;
    auVar62._20_4_ = auVar126._20_4_ * fStack_2cc;
    auVar62._24_4_ = auVar126._24_4_ * fStack_2c8;
    auVar62._28_4_ = 0x40800000;
    auVar38 = vsubps_avx(local_6e0,auVar62);
    auVar183 = vcmpps_avx(auVar38,auVar246,5);
    auVar121._8_4_ = 0x7fffffff;
    auVar121._0_8_ = 0x7fffffff7fffffff;
    auVar121._12_4_ = 0x7fffffff;
    auVar121._16_4_ = 0x7fffffff;
    auVar121._20_4_ = 0x7fffffff;
    auVar121._24_4_ = 0x7fffffff;
    auVar121._28_4_ = 0x7fffffff;
    local_480 = vandps_avx(auVar61,auVar121);
    local_380._0_4_ = fVar289 + fVar289;
    local_380._4_4_ = fVar397 + fVar397;
    local_380._8_4_ = fVar193 + fVar193;
    local_380._12_4_ = fVar194 + fVar194;
    local_380._16_4_ = fVar195 + fVar195;
    local_380._20_4_ = fVar196 + fVar196;
    local_380._24_4_ = fVar197 + fVar197;
    local_380._28_4_ = auVar245._28_4_ + auVar245._28_4_;
    local_a00 = vandps_avx(auVar245,auVar121);
    uVar93 = CONCAT44(local_a20._4_4_,local_a20._0_4_);
    local_360._0_8_ = uVar93 ^ 0x8000000080000000;
    local_360._8_4_ = -local_a20._8_4_;
    local_360._12_4_ = -local_a20._12_4_;
    local_360._16_4_ = -local_a20._16_4_;
    local_360._20_4_ = -local_a20._20_4_;
    local_360._24_4_ = -local_a20._24_4_;
    local_360._28_4_ = -local_a20._28_4_;
    if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar183 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar183 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar183 >> 0x7f,0) == '\0') &&
          (auVar183 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar183 >> 0xbf,0) == '\0') &&
        (auVar183 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar183[0x1f])
    {
      local_940._8_4_ = 0x7f800000;
      local_940._0_8_ = 0x7f8000007f800000;
      local_940._12_4_ = 0x7f800000;
      local_940._16_4_ = 0x7f800000;
      local_940._20_4_ = 0x7f800000;
      local_940._24_4_ = 0x7f800000;
      local_940._28_4_ = 0x7f800000;
      auVar186._8_4_ = 0xff800000;
      auVar186._0_8_ = 0xff800000ff800000;
      auVar186._12_4_ = 0xff800000;
      auVar186._16_4_ = 0xff800000;
      auVar186._20_4_ = 0xff800000;
      auVar186._24_4_ = 0xff800000;
      auVar186._28_4_ = 0xff800000;
    }
    else {
      auVar116 = vsqrtps_avx(auVar38);
      auVar39 = vrcpps_avx(local_380);
      auVar245 = vcmpps_avx(auVar38,auVar246,5);
      fVar289 = auVar39._0_4_;
      fVar397 = auVar39._4_4_;
      auVar63._4_4_ = local_380._4_4_ * fVar397;
      auVar63._0_4_ = local_380._0_4_ * fVar289;
      fVar193 = auVar39._8_4_;
      auVar63._8_4_ = local_380._8_4_ * fVar193;
      fVar194 = auVar39._12_4_;
      auVar63._12_4_ = local_380._12_4_ * fVar194;
      fVar195 = auVar39._16_4_;
      auVar63._16_4_ = local_380._16_4_ * fVar195;
      fVar196 = auVar39._20_4_;
      auVar63._20_4_ = local_380._20_4_ * fVar196;
      fVar197 = auVar39._24_4_;
      auVar63._24_4_ = local_380._24_4_ * fVar197;
      auVar63._28_4_ = auVar38._28_4_;
      auVar122._8_4_ = 0x3f800000;
      auVar122._0_8_ = 0x3f8000003f800000;
      auVar122._12_4_ = 0x3f800000;
      auVar122._16_4_ = 0x3f800000;
      auVar122._20_4_ = 0x3f800000;
      auVar122._24_4_ = 0x3f800000;
      auVar122._28_4_ = 0x3f800000;
      auVar38 = vsubps_avx(auVar122,auVar63);
      fVar289 = fVar289 + fVar289 * auVar38._0_4_;
      fVar397 = fVar397 + fVar397 * auVar38._4_4_;
      fVar193 = fVar193 + fVar193 * auVar38._8_4_;
      fVar194 = fVar194 + fVar194 * auVar38._12_4_;
      fVar195 = fVar195 + fVar195 * auVar38._16_4_;
      fVar196 = fVar196 + fVar196 * auVar38._20_4_;
      fVar197 = fVar197 + fVar197 * auVar38._24_4_;
      auVar246 = vsubps_avx(local_360,auVar116);
      fVar292 = auVar246._0_4_ * fVar289;
      fVar305 = auVar246._4_4_ * fVar397;
      auVar64._4_4_ = fVar305;
      auVar64._0_4_ = fVar292;
      fVar308 = auVar246._8_4_ * fVar193;
      auVar64._8_4_ = fVar308;
      fVar311 = auVar246._12_4_ * fVar194;
      auVar64._12_4_ = fVar311;
      fVar314 = auVar246._16_4_ * fVar195;
      auVar64._16_4_ = fVar314;
      fVar317 = auVar246._20_4_ * fVar196;
      auVar64._20_4_ = fVar317;
      fVar320 = auVar246._24_4_ * fVar197;
      auVar64._24_4_ = fVar320;
      auVar64._28_4_ = auVar246._28_4_;
      auVar246 = vsubps_avx(auVar116,local_a20);
      fVar289 = auVar246._0_4_ * fVar289;
      fVar397 = auVar246._4_4_ * fVar397;
      auVar65._4_4_ = fVar397;
      auVar65._0_4_ = fVar289;
      fVar193 = auVar246._8_4_ * fVar193;
      auVar65._8_4_ = fVar193;
      fVar194 = auVar246._12_4_ * fVar194;
      auVar65._12_4_ = fVar194;
      fVar195 = auVar246._16_4_ * fVar195;
      auVar65._16_4_ = fVar195;
      fVar196 = auVar246._20_4_ * fVar196;
      auVar65._20_4_ = fVar196;
      fVar197 = auVar246._24_4_ * fVar197;
      auVar65._24_4_ = fVar197;
      auVar65._28_4_ = auVar39._28_4_ + auVar38._28_4_;
      fStack_444 = local_620._28_4_ + auVar246._28_4_;
      local_460 = local_600 * (local_620._0_4_ + local_5a0._0_4_ * fVar292);
      fStack_45c = fStack_5fc * (local_620._4_4_ + local_5a0._4_4_ * fVar305);
      fStack_458 = fStack_5f8 * (local_620._8_4_ + local_5a0._8_4_ * fVar308);
      fStack_454 = fStack_5f4 * (local_620._12_4_ + local_5a0._12_4_ * fVar311);
      fStack_450 = fStack_5f0 * (local_620._16_4_ + local_5a0._16_4_ * fVar314);
      fStack_44c = fStack_5ec * (local_620._20_4_ + local_5a0._20_4_ * fVar317);
      fStack_448 = fStack_5e8 * (local_620._24_4_ + local_5a0._24_4_ * fVar320);
      local_440 = local_600 * (local_620._0_4_ + local_5a0._0_4_ * fVar289);
      fStack_43c = fStack_5fc * (local_620._4_4_ + local_5a0._4_4_ * fVar397);
      fStack_438 = fStack_5f8 * (local_620._8_4_ + local_5a0._8_4_ * fVar193);
      fStack_434 = fStack_5f4 * (local_620._12_4_ + local_5a0._12_4_ * fVar194);
      fStack_430 = fStack_5f0 * (local_620._16_4_ + local_5a0._16_4_ * fVar195);
      fStack_42c = fStack_5ec * (local_620._20_4_ + local_5a0._20_4_ * fVar196);
      fStack_428 = fStack_5e8 * (local_620._24_4_ + local_5a0._24_4_ * fVar197);
      fStack_424 = local_620._28_4_ + fStack_444;
      auVar268._8_4_ = 0x7f800000;
      auVar268._0_8_ = 0x7f8000007f800000;
      auVar268._12_4_ = 0x7f800000;
      auVar268._16_4_ = 0x7f800000;
      auVar268._20_4_ = 0x7f800000;
      auVar268._24_4_ = 0x7f800000;
      auVar268._28_4_ = 0x7f800000;
      local_940 = vblendvps_avx(auVar268,auVar64,auVar245);
      auVar269._8_4_ = 0xff800000;
      auVar269._0_8_ = 0xff800000ff800000;
      auVar269._12_4_ = 0xff800000;
      auVar269._16_4_ = 0xff800000;
      auVar269._20_4_ = 0xff800000;
      auVar269._24_4_ = 0xff800000;
      auVar269._28_4_ = 0xff800000;
      auVar186 = vblendvps_avx(auVar269,auVar65,auVar245);
      auVar38 = vmaxps_avx(local_5e0,local_480);
      auVar66._4_4_ = auVar38._4_4_ * 1.9073486e-06;
      auVar66._0_4_ = auVar38._0_4_ * 1.9073486e-06;
      auVar66._8_4_ = auVar38._8_4_ * 1.9073486e-06;
      auVar66._12_4_ = auVar38._12_4_ * 1.9073486e-06;
      auVar66._16_4_ = auVar38._16_4_ * 1.9073486e-06;
      auVar66._20_4_ = auVar38._20_4_ * 1.9073486e-06;
      auVar66._24_4_ = auVar38._24_4_ * 1.9073486e-06;
      auVar66._28_4_ = auVar38._28_4_;
      auVar38 = vcmpps_avx(local_a00,auVar66,1);
      auVar246 = auVar245 & auVar38;
      if ((((((((auVar246 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar246 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar246 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar246 >> 0x7f,0) != '\0') ||
            (auVar246 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar246 >> 0xbf,0) != '\0') ||
          (auVar246 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar246[0x1f] < '\0') {
        auVar183 = vandps_avx(auVar38,auVar245);
        auVar206 = vpackssdw_avx(auVar183._0_16_,auVar183._16_16_);
        auVar38 = vcmpps_avx(auVar126,_DAT_01f7b000,2);
        auVar348._8_4_ = 0xff800000;
        auVar348._0_8_ = 0xff800000ff800000;
        auVar348._12_4_ = 0xff800000;
        auVar348._16_4_ = 0xff800000;
        auVar348._20_4_ = 0xff800000;
        auVar348._24_4_ = 0xff800000;
        auVar348._28_4_ = 0xff800000;
        auVar390._8_4_ = 0x7f800000;
        auVar390._0_8_ = 0x7f8000007f800000;
        auVar390._12_4_ = 0x7f800000;
        auVar390._16_4_ = 0x7f800000;
        auVar390._20_4_ = 0x7f800000;
        auVar390._24_4_ = 0x7f800000;
        auVar390._28_4_ = 0x7f800000;
        auVar126 = vblendvps_avx(auVar390,auVar348,auVar38);
        auVar294 = vpmovsxwd_avx(auVar206);
        auVar206 = vpunpckhwd_avx(auVar206,auVar206);
        auVar301._16_16_ = auVar206;
        auVar301._0_16_ = auVar294;
        local_940 = vblendvps_avx(local_940,auVar126,auVar301);
        auVar126 = vblendvps_avx(auVar348,auVar390,auVar38);
        auVar186 = vblendvps_avx(auVar186,auVar126,auVar301);
        auVar276._0_8_ = auVar183._0_8_ ^ 0xffffffffffffffff;
        auVar276._8_4_ = auVar183._8_4_ ^ 0xffffffff;
        auVar276._12_4_ = auVar183._12_4_ ^ 0xffffffff;
        auVar276._16_4_ = auVar183._16_4_ ^ 0xffffffff;
        auVar276._20_4_ = auVar183._20_4_ ^ 0xffffffff;
        auVar276._24_4_ = auVar183._24_4_ ^ 0xffffffff;
        auVar276._28_4_ = auVar183._28_4_ ^ 0xffffffff;
        auVar183 = vorps_avx(auVar38,auVar276);
        auVar183 = vandps_avx(auVar245,auVar183);
      }
    }
    auVar421 = ZEXT3264(local_960);
    auVar374 = ZEXT3264(local_b40);
    auVar126 = local_540 & auVar183;
    auVar302 = ZEXT3264(local_9e0);
    fVar289 = (float)local_8c0._0_4_;
    fVar397 = (float)local_8c0._4_4_;
    fVar193 = fStack_8b8;
    fVar194 = fStack_8b4;
    fVar195 = fStack_8b0;
    fVar196 = fStack_8ac;
    fVar197 = fStack_8a8;
    fVar292 = fStack_8a4;
    if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar126 >> 0x7f,0) == '\0') &&
          (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar126 >> 0xbf,0) == '\0') &&
        (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar126[0x1f])
    {
      auVar358 = ZEXT3264(local_a60);
    }
    else {
      fStack_5e4 = auVar25._28_4_ + auVar220._28_4_;
      auVar421 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      auVar206 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8f0._0_4_));
      auVar206 = vshufps_avx(auVar206,auVar206,0);
      auVar270._16_16_ = auVar206;
      auVar270._0_16_ = auVar206;
      auVar38 = vminps_avx(auVar270,auVar186);
      auVar123._0_4_ =
           (float)local_ac0._0_4_ * fVar381 +
           (float)local_700._0_4_ * fVar365 + (float)local_8a0._0_4_ * fVar398;
      auVar123._4_4_ =
           (float)local_ac0._4_4_ * fVar391 +
           (float)local_700._4_4_ * fVar375 + (float)local_8a0._4_4_ * fVar405;
      auVar123._8_4_ = fStack_ab8 * fVar392 + fStack_6f8 * fVar376 + fStack_898 * fVar407;
      auVar123._12_4_ = fStack_ab4 * fVar393 + fStack_6f4 * fVar377 + fStack_894 * fVar409;
      auVar123._16_4_ = fStack_ab0 * fVar394 + fStack_6f0 * fVar378 + fStack_890 * fVar411;
      auVar123._20_4_ = fStack_aac * fVar395 + fStack_6ec * fVar379 + fStack_88c * fVar413;
      auVar123._24_4_ = fStack_aa8 * fVar396 + fStack_6e8 * fVar380 + fStack_888 * fVar415;
      auVar123._28_4_ = fVar417 + auVar369._28_4_ + fVar417;
      auVar245 = vrcpps_avx(auVar123);
      fVar417 = auVar245._0_4_;
      fVar305 = auVar245._4_4_;
      auVar67._4_4_ = auVar123._4_4_ * fVar305;
      auVar67._0_4_ = auVar123._0_4_ * fVar417;
      fVar308 = auVar245._8_4_;
      auVar67._8_4_ = auVar123._8_4_ * fVar308;
      fVar311 = auVar245._12_4_;
      auVar67._12_4_ = auVar123._12_4_ * fVar311;
      fVar314 = auVar245._16_4_;
      auVar67._16_4_ = auVar123._16_4_ * fVar314;
      fVar317 = auVar245._20_4_;
      auVar67._20_4_ = auVar123._20_4_ * fVar317;
      fVar320 = auVar245._24_4_;
      auVar67._24_4_ = auVar123._24_4_ * fVar320;
      auVar67._28_4_ = auVar183._28_4_ + auVar206._12_4_;
      auVar357._8_4_ = 0x3f800000;
      auVar357._0_8_ = 0x3f8000003f800000;
      auVar357._12_4_ = 0x3f800000;
      auVar357._16_4_ = 0x3f800000;
      auVar357._20_4_ = 0x3f800000;
      auVar357._24_4_ = 0x3f800000;
      auVar357._28_4_ = 0x3f800000;
      auVar246 = vsubps_avx(auVar357,auVar67);
      auVar299._8_4_ = 0x7fffffff;
      auVar299._0_8_ = 0x7fffffff7fffffff;
      auVar299._12_4_ = 0x7fffffff;
      auVar299._16_4_ = 0x7fffffff;
      auVar299._20_4_ = 0x7fffffff;
      auVar299._24_4_ = 0x7fffffff;
      auVar299._28_4_ = 0x7fffffff;
      auVar126 = vandps_avx(auVar123,auVar299);
      auVar327._8_4_ = 0x219392ef;
      auVar327._0_8_ = 0x219392ef219392ef;
      auVar327._12_4_ = 0x219392ef;
      auVar327._16_4_ = 0x219392ef;
      auVar327._20_4_ = 0x219392ef;
      auVar327._24_4_ = 0x219392ef;
      auVar327._28_4_ = 0x219392ef;
      auVar25 = vcmpps_avx(auVar126,auVar327,1);
      auVar68._4_4_ =
           (fVar305 + fVar305 * auVar246._4_4_) *
           -(fVar252 * fVar391 + fVar375 * fVar229 + fVar359 * fVar405);
      auVar68._0_4_ =
           (fVar417 + fVar417 * auVar246._0_4_) *
           -(fVar192 * fVar381 + fVar365 * fVar225 + fVar349 * fVar398);
      auVar68._8_4_ =
           (fVar308 + fVar308 * auVar246._8_4_) *
           -(fVar277 * fVar392 + fVar376 * fVar257 + fVar360 * fVar407);
      auVar68._12_4_ =
           (fVar311 + fVar311 * auVar246._12_4_) *
           -(fVar258 * fVar393 + fVar377 * fVar287 + fVar361 * fVar409);
      auVar68._16_4_ =
           (fVar314 + fVar314 * auVar246._16_4_) *
           -(fVar288 * fVar394 + fVar378 * fVar286 + fVar362 * fVar411);
      auVar68._20_4_ =
           (fVar317 + fVar317 * auVar246._20_4_) *
           -(fVar315 * fVar395 + fVar379 * fVar312 + fVar363 * fVar413);
      auVar68._24_4_ =
           (fVar320 + fVar320 * auVar246._24_4_) *
           -(fVar341 * fVar396 + fVar380 * fVar340 + fVar364 * fVar415);
      auVar68._28_4_ = auVar245._28_4_ + auVar246._28_4_;
      auVar126 = vcmpps_avx(auVar123,ZEXT832(0) << 0x20,1);
      auVar126 = vorps_avx(auVar25,auVar126);
      auVar347._8_4_ = 0xff800000;
      auVar347._0_8_ = 0xff800000ff800000;
      auVar347._12_4_ = 0xff800000;
      auVar347._16_4_ = 0xff800000;
      auVar347._20_4_ = 0xff800000;
      auVar347._24_4_ = 0xff800000;
      auVar347._28_4_ = 0xff800000;
      auVar126 = vblendvps_avx(auVar68,auVar347,auVar126);
      auVar245 = vcmpps_avx(auVar123,ZEXT832(0) << 0x20,6);
      auVar25 = vorps_avx(auVar25,auVar245);
      auVar389._8_4_ = 0x7f800000;
      auVar389._0_8_ = 0x7f8000007f800000;
      auVar389._12_4_ = 0x7f800000;
      auVar389._16_4_ = 0x7f800000;
      auVar389._20_4_ = 0x7f800000;
      auVar389._24_4_ = 0x7f800000;
      auVar389._28_4_ = 0x7f800000;
      auVar25 = vblendvps_avx(auVar68,auVar389,auVar25);
      auVar245 = vmaxps_avx(local_400,local_940);
      auVar245 = vmaxps_avx(auVar245,auVar126);
      auVar38 = vminps_avx(auVar38,auVar25);
      auVar246 = ZEXT832(0) << 0x20;
      auVar126 = vsubps_avx(auVar246,auVar26);
      auVar25 = vsubps_avx(auVar246,auVar27);
      auVar69._4_4_ = auVar25._4_4_ * -fVar133;
      auVar69._0_4_ = auVar25._0_4_ * -fVar103;
      auVar69._8_4_ = auVar25._8_4_ * -fVar135;
      auVar69._12_4_ = auVar25._12_4_ * -fVar137;
      auVar69._16_4_ = auVar25._16_4_ * -fVar138;
      auVar69._20_4_ = auVar25._20_4_ * -fVar139;
      auVar69._24_4_ = auVar25._24_4_ * -fVar140;
      auVar69._28_4_ = auVar25._28_4_;
      auVar70._4_4_ = fVar230 * auVar126._4_4_;
      auVar70._0_4_ = fVar175 * auVar126._0_4_;
      auVar70._8_4_ = fVar256 * auVar126._8_4_;
      auVar70._12_4_ = fVar285 * auVar126._12_4_;
      auVar70._16_4_ = fVar284 * auVar126._16_4_;
      auVar70._20_4_ = fVar309 * auVar126._20_4_;
      auVar70._24_4_ = fVar423 * auVar126._24_4_;
      auVar70._28_4_ = auVar126._28_4_;
      auVar126 = vsubps_avx(auVar69,auVar70);
      auVar25 = vsubps_avx(auVar246,auVar28);
      auVar71._4_4_ = fVar406 * auVar25._4_4_;
      auVar71._0_4_ = fVar399 * auVar25._0_4_;
      auVar71._8_4_ = fVar408 * auVar25._8_4_;
      auVar71._12_4_ = fVar410 * auVar25._12_4_;
      auVar71._16_4_ = fVar412 * auVar25._16_4_;
      auVar71._20_4_ = fVar414 * auVar25._20_4_;
      uVar8 = auVar25._28_4_;
      auVar71._24_4_ = fVar416 * auVar25._24_4_;
      auVar71._28_4_ = uVar8;
      auVar26 = vsubps_avx(auVar126,auVar71);
      auVar72._4_4_ = (float)local_8a0._4_4_ * -fVar133;
      auVar72._0_4_ = (float)local_8a0._0_4_ * -fVar103;
      auVar72._8_4_ = fStack_898 * -fVar135;
      auVar72._12_4_ = fStack_894 * -fVar137;
      auVar72._16_4_ = fStack_890 * -fVar138;
      auVar72._20_4_ = fStack_88c * -fVar139;
      auVar72._24_4_ = fStack_888 * -fVar140;
      auVar72._28_4_ = local_a80._28_4_ ^ 0x80000000;
      auVar73._4_4_ = (float)local_700._4_4_ * fVar230;
      auVar73._0_4_ = (float)local_700._0_4_ * fVar175;
      auVar73._8_4_ = fStack_6f8 * fVar256;
      auVar73._12_4_ = fStack_6f4 * fVar285;
      auVar73._16_4_ = fStack_6f0 * fVar284;
      auVar73._20_4_ = fStack_6ec * fVar309;
      auVar73._24_4_ = fStack_6e8 * fVar423;
      auVar73._28_4_ = uVar8;
      auVar370._8_4_ = 0x3f800000;
      auVar370._0_8_ = 0x3f8000003f800000;
      auVar370._12_4_ = 0x3f800000;
      auVar370._16_4_ = 0x3f800000;
      auVar370._20_4_ = 0x3f800000;
      auVar370._24_4_ = 0x3f800000;
      auVar370._28_4_ = 0x3f800000;
      auVar126 = vsubps_avx(auVar72,auVar73);
      auVar74._4_4_ = (float)local_ac0._4_4_ * fVar406;
      auVar74._0_4_ = (float)local_ac0._0_4_ * fVar399;
      auVar74._8_4_ = fStack_ab8 * fVar408;
      auVar74._12_4_ = fStack_ab4 * fVar410;
      auVar74._16_4_ = fStack_ab0 * fVar412;
      auVar74._20_4_ = fStack_aac * fVar414;
      auVar74._24_4_ = fStack_aa8 * fVar416;
      auVar74._28_4_ = uVar8;
      auVar27 = vsubps_avx(auVar126,auVar74);
      auVar126 = vrcpps_avx(auVar27);
      fVar175 = auVar126._0_4_;
      auVar271._0_4_ = auVar27._0_4_ * fVar175;
      fVar225 = auVar126._4_4_;
      auVar271._4_4_ = auVar27._4_4_ * fVar225;
      fVar192 = auVar126._8_4_;
      auVar271._8_4_ = auVar27._8_4_ * fVar192;
      fVar230 = auVar126._12_4_;
      auVar271._12_4_ = auVar27._12_4_ * fVar230;
      fVar229 = auVar126._16_4_;
      auVar271._16_4_ = auVar27._16_4_ * fVar229;
      fVar252 = auVar126._20_4_;
      auVar271._20_4_ = auVar27._20_4_ * fVar252;
      fVar256 = auVar126._24_4_;
      auVar271._24_4_ = auVar27._24_4_ * fVar256;
      auVar271._28_4_ = 0;
      auVar28 = vsubps_avx(auVar370,auVar271);
      auVar124._8_4_ = 0x7fffffff;
      auVar124._0_8_ = 0x7fffffff7fffffff;
      auVar124._12_4_ = 0x7fffffff;
      auVar124._16_4_ = 0x7fffffff;
      auVar124._20_4_ = 0x7fffffff;
      auVar124._24_4_ = 0x7fffffff;
      auVar124._28_4_ = 0x7fffffff;
      auVar126 = vandps_avx(auVar27,auVar124);
      auVar25 = vcmpps_avx(auVar126,auVar327,1);
      auVar75._4_4_ = (fVar225 + fVar225 * auVar28._4_4_) * -auVar26._4_4_;
      auVar75._0_4_ = (fVar175 + fVar175 * auVar28._0_4_) * -auVar26._0_4_;
      auVar75._8_4_ = (fVar192 + fVar192 * auVar28._8_4_) * -auVar26._8_4_;
      auVar75._12_4_ = (fVar230 + fVar230 * auVar28._12_4_) * -auVar26._12_4_;
      auVar75._16_4_ = (fVar229 + fVar229 * auVar28._16_4_) * -auVar26._16_4_;
      auVar75._20_4_ = (fVar252 + fVar252 * auVar28._20_4_) * -auVar26._20_4_;
      auVar75._24_4_ = (fVar256 + fVar256 * auVar28._24_4_) * -auVar26._24_4_;
      auVar75._28_4_ = auVar26._28_4_ ^ 0x80000000;
      auVar126 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,1);
      auVar126 = vorps_avx(auVar25,auVar126);
      auVar126 = vblendvps_avx(auVar75,auVar347,auVar126);
      local_720 = vmaxps_avx(auVar245,auVar126);
      auVar126 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,6);
      auVar126 = vorps_avx(auVar25,auVar126);
      auVar126 = vblendvps_avx(auVar75,auVar389,auVar126);
      auVar183 = vandps_avx(local_540,auVar183);
      local_4a0 = vminps_avx(auVar38,auVar126);
      auVar126 = vcmpps_avx(local_720,local_4a0,2);
      auVar25 = auVar183 & auVar126;
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0x7f,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0xbf,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar25[0x1f] < '\0') {
        auVar25 = vminps_avx(local_660,local_6a0);
        auVar26 = vminps_avx(local_680,auVar29);
        auVar25 = vminps_avx(auVar25,auVar26);
        auVar25 = vsubps_avx(auVar25,local_300);
        auVar183 = vandps_avx(auVar126,auVar183);
        auVar90._4_4_ = fStack_45c;
        auVar90._0_4_ = local_460;
        auVar90._8_4_ = fStack_458;
        auVar90._12_4_ = fStack_454;
        auVar90._16_4_ = fStack_450;
        auVar90._20_4_ = fStack_44c;
        auVar90._24_4_ = fStack_448;
        auVar90._28_4_ = fStack_444;
        auVar126 = vminps_avx(auVar90,auVar370);
        auVar241 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar126 = vmaxps_avx(auVar126,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar102 + fVar141 * (auVar126._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar132 + fVar172 * (auVar126._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar134 + fVar173 * (auVar126._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar136 + fVar174 * (auVar126._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar102 + fVar141 * (auVar126._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar132 + fVar172 * (auVar126._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar134 + fVar173 * (auVar126._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar136 + auVar126._28_4_ + 7.0;
        auVar91._4_4_ = fStack_43c;
        auVar91._0_4_ = local_440;
        auVar91._8_4_ = fStack_438;
        auVar91._12_4_ = fStack_434;
        auVar91._16_4_ = fStack_430;
        auVar91._20_4_ = fStack_42c;
        auVar91._24_4_ = fStack_428;
        auVar91._28_4_ = fStack_424;
        auVar126 = vminps_avx(auVar91,auVar370);
        auVar126 = vmaxps_avx(auVar126,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar102 + fVar141 * (auVar126._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar132 + fVar172 * (auVar126._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar134 + fVar173 * (auVar126._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar136 + fVar174 * (auVar126._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar102 + fVar141 * (auVar126._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar132 + fVar172 * (auVar126._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar134 + fVar173 * (auVar126._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar136 + auVar126._28_4_ + 7.0;
        auVar76._4_4_ = auVar25._4_4_ * 0.99999976;
        auVar76._0_4_ = auVar25._0_4_ * 0.99999976;
        auVar76._8_4_ = auVar25._8_4_ * 0.99999976;
        auVar76._12_4_ = auVar25._12_4_ * 0.99999976;
        auVar76._16_4_ = auVar25._16_4_ * 0.99999976;
        auVar76._20_4_ = auVar25._20_4_ * 0.99999976;
        auVar76._24_4_ = auVar25._24_4_ * 0.99999976;
        auVar76._28_4_ = 0x3f7ffffc;
        auVar126 = vmaxps_avx(ZEXT832(0) << 0x20,auVar76);
        auVar77._4_4_ = auVar126._4_4_ * auVar126._4_4_;
        auVar77._0_4_ = auVar126._0_4_ * auVar126._0_4_;
        auVar77._8_4_ = auVar126._8_4_ * auVar126._8_4_;
        auVar77._12_4_ = auVar126._12_4_ * auVar126._12_4_;
        auVar77._16_4_ = auVar126._16_4_ * auVar126._16_4_;
        auVar77._20_4_ = auVar126._20_4_ * auVar126._20_4_;
        auVar77._24_4_ = auVar126._24_4_ * auVar126._24_4_;
        auVar77._28_4_ = auVar126._28_4_;
        local_b00 = vsubps_avx(local_6c0,auVar77);
        auVar78._4_4_ = local_b00._4_4_ * fStack_2dc;
        auVar78._0_4_ = local_b00._0_4_ * local_2e0;
        auVar78._8_4_ = local_b00._8_4_ * fStack_2d8;
        auVar78._12_4_ = local_b00._12_4_ * fStack_2d4;
        auVar78._16_4_ = local_b00._16_4_ * fStack_2d0;
        auVar78._20_4_ = local_b00._20_4_ * fStack_2cc;
        auVar78._24_4_ = local_b00._24_4_ * fStack_2c8;
        auVar78._28_4_ = auVar126._28_4_;
        auVar25 = vsubps_avx(local_6e0,auVar78);
        auVar126 = vcmpps_avx(auVar25,ZEXT832(0) << 0x20,5);
        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar126 >> 0x7f,0) == '\0') &&
              (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar126 >> 0xbf,0) == '\0') &&
            (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar126[0x1f]) {
          auVar297 = ZEXT828(0) << 0x20;
          auVar265 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar422 = SUB6428(ZEXT864(0),0) << 0x20;
          _local_b60 = ZEXT832(0) << 0x20;
          _local_ca0 = local_b60._0_28_;
          auVar328._8_4_ = 0x7f800000;
          auVar328._0_8_ = 0x7f8000007f800000;
          auVar328._12_4_ = 0x7f800000;
          auVar328._16_4_ = 0x7f800000;
          auVar328._20_4_ = 0x7f800000;
          auVar328._24_4_ = 0x7f800000;
          auVar328._28_4_ = 0x7f800000;
          auVar371._8_4_ = 0xff800000;
          auVar371._0_8_ = 0xff800000ff800000;
          auVar371._12_4_ = 0xff800000;
          auVar371._16_4_ = 0xff800000;
          auVar371._20_4_ = 0xff800000;
          auVar371._24_4_ = 0xff800000;
          auVar371._28_4_ = 0xff800000;
          local_b00 = auVar41;
        }
        else {
          auVar26 = vrcpps_avx(local_380);
          fVar175 = auVar26._0_4_;
          auVar247._0_4_ = local_380._0_4_ * fVar175;
          fVar225 = auVar26._4_4_;
          auVar247._4_4_ = local_380._4_4_ * fVar225;
          fVar192 = auVar26._8_4_;
          auVar247._8_4_ = local_380._8_4_ * fVar192;
          fVar230 = auVar26._12_4_;
          auVar247._12_4_ = local_380._12_4_ * fVar230;
          fVar229 = auVar26._16_4_;
          auVar247._16_4_ = local_380._16_4_ * fVar229;
          fVar252 = auVar26._20_4_;
          auVar247._20_4_ = local_380._20_4_ * fVar252;
          fVar256 = auVar26._24_4_;
          auVar247._24_4_ = local_380._24_4_ * fVar256;
          auVar247._28_4_ = 0;
          auVar28 = vsubps_avx(auVar370,auVar247);
          auVar27 = vsqrtps_avx(auVar25);
          fVar175 = fVar175 + fVar175 * auVar28._0_4_;
          fVar225 = fVar225 + fVar225 * auVar28._4_4_;
          fVar192 = fVar192 + fVar192 * auVar28._8_4_;
          fVar230 = fVar230 + fVar230 * auVar28._12_4_;
          fVar229 = fVar229 + fVar229 * auVar28._16_4_;
          fVar252 = fVar252 + fVar252 * auVar28._20_4_;
          fVar256 = fVar256 + fVar256 * auVar28._24_4_;
          auVar29 = vsubps_avx(local_360,auVar27);
          fVar288 = auVar29._0_4_ * fVar175;
          fVar309 = auVar29._4_4_ * fVar225;
          auVar79._4_4_ = fVar309;
          auVar79._0_4_ = fVar288;
          fVar312 = auVar29._8_4_ * fVar192;
          auVar79._8_4_ = fVar312;
          fVar315 = auVar29._12_4_ * fVar230;
          auVar79._12_4_ = fVar315;
          fVar423 = auVar29._16_4_ * fVar229;
          auVar79._16_4_ = fVar423;
          fVar340 = auVar29._20_4_ * fVar252;
          auVar79._20_4_ = fVar340;
          fVar341 = auVar29._24_4_ * fVar256;
          auVar79._24_4_ = fVar341;
          auVar79._28_4_ = fStack_884;
          auVar29 = vsubps_avx(auVar27,local_a20);
          fVar175 = auVar29._0_4_ * fVar175;
          fVar225 = auVar29._4_4_ * fVar225;
          auVar80._4_4_ = fVar225;
          auVar80._0_4_ = fVar175;
          fVar192 = auVar29._8_4_ * fVar192;
          auVar80._8_4_ = fVar192;
          fVar230 = auVar29._12_4_ * fVar230;
          auVar80._12_4_ = fVar230;
          fVar229 = auVar29._16_4_ * fVar229;
          auVar80._16_4_ = fVar229;
          fVar252 = auVar29._20_4_ * fVar252;
          auVar80._20_4_ = fVar252;
          fVar256 = auVar29._24_4_ * fVar256;
          auVar80._24_4_ = fVar256;
          auVar80._28_4_ = fVar174;
          fVar257 = (fVar288 * local_5a0._0_4_ + local_620._0_4_) * local_600;
          fVar277 = (fVar309 * local_5a0._4_4_ + local_620._4_4_) * fStack_5fc;
          fVar285 = (fVar312 * local_5a0._8_4_ + local_620._8_4_) * fStack_5f8;
          fVar287 = (fVar315 * local_5a0._12_4_ + local_620._12_4_) * fStack_5f4;
          fVar258 = (fVar423 * local_5a0._16_4_ + local_620._16_4_) * fStack_5f0;
          fVar284 = (fVar340 * local_5a0._20_4_ + local_620._20_4_) * fStack_5ec;
          fVar286 = (fVar341 * local_5a0._24_4_ + local_620._24_4_) * fStack_5e8;
          auVar187._0_4_ = fVar291 + fVar257 * fVar224;
          auVar187._4_4_ = fVar304 + fVar277 * fVar228;
          auVar187._8_4_ = fVar307 + fVar285 * fVar255;
          auVar187._12_4_ = fVar310 + fVar287 * fVar283;
          auVar187._16_4_ = fVar313 + fVar258 * fVar282;
          auVar187._20_4_ = fVar316 + fVar284 * fVar306;
          auVar187._24_4_ = fVar319 + fVar286 * fVar32;
          auVar187._28_4_ = fVar321 + auVar26._28_4_ + auVar28._28_4_ + local_620._28_4_;
          auVar81._4_4_ = fVar309 * (float)local_ac0._4_4_;
          auVar81._0_4_ = fVar288 * (float)local_ac0._0_4_;
          auVar81._8_4_ = fVar312 * fStack_ab8;
          auVar81._12_4_ = fVar315 * fStack_ab4;
          auVar81._16_4_ = fVar423 * fStack_ab0;
          auVar81._20_4_ = fVar340 * fStack_aac;
          auVar81._24_4_ = fVar341 * fStack_aa8;
          auVar81._28_4_ = auVar27._28_4_;
          local_9c0 = vsubps_avx(auVar81,auVar187);
          auVar272._0_4_ = (float)local_aa0._0_4_ + fVar257 * fVar223;
          auVar272._4_4_ = local_aa0._4_4_ + fVar277 * fVar226;
          auVar272._8_4_ = local_aa0._8_4_ + fVar285 * fVar253;
          auVar272._12_4_ = local_aa0._12_4_ + fVar287 * fVar279;
          auVar272._16_4_ = local_aa0._16_4_ + fVar258 * fVar278;
          auVar272._20_4_ = local_aa0._20_4_ + fVar284 * fVar290;
          auVar272._24_4_ = local_aa0._24_4_ + fVar286 * fVar318;
          auVar272._28_4_ = local_aa0._28_4_ + auVar27._28_4_;
          auVar82._4_4_ = (float)local_700._4_4_ * fVar309;
          auVar82._0_4_ = (float)local_700._0_4_ * fVar288;
          auVar82._8_4_ = fStack_6f8 * fVar312;
          auVar82._12_4_ = fStack_6f4 * fVar315;
          auVar82._16_4_ = fStack_6f0 * fVar423;
          auVar82._20_4_ = fStack_6ec * fVar340;
          auVar82._24_4_ = fStack_6e8 * fVar341;
          auVar82._28_4_ = 0x3e000000;
          auVar26 = vsubps_avx(auVar82,auVar272);
          _local_ca0 = auVar26._0_28_;
          auVar248._0_4_ = local_320._0_4_ + fVar104 * fVar257;
          auVar248._4_4_ = local_320._4_4_ + fVar227 * fVar277;
          auVar248._8_4_ = local_320._8_4_ + fVar254 * fVar285;
          auVar248._12_4_ = local_320._12_4_ + fVar281 * fVar287;
          auVar248._16_4_ = local_320._16_4_ + fVar280 * fVar258;
          auVar248._20_4_ = local_320._20_4_ + fVar303 * fVar284;
          auVar248._24_4_ = local_320._24_4_ + fVar31 * fVar286;
          auVar248._28_4_ = local_320._28_4_ + auVar29._28_4_;
          auVar83._4_4_ = fVar309 * (float)local_8a0._4_4_;
          auVar83._0_4_ = fVar288 * (float)local_8a0._0_4_;
          auVar83._8_4_ = fVar312 * fStack_898;
          auVar83._12_4_ = fVar315 * fStack_894;
          auVar83._16_4_ = fVar423 * fStack_890;
          auVar83._20_4_ = fVar340 * fStack_88c;
          auVar83._24_4_ = fVar341 * fStack_888;
          auVar83._28_4_ = auVar272._28_4_;
          _local_b60 = vsubps_avx(auVar83,auVar248);
          fVar257 = (fVar175 * local_5a0._0_4_ + local_620._0_4_) * local_600;
          fVar277 = (fVar225 * local_5a0._4_4_ + local_620._4_4_) * fStack_5fc;
          fVar285 = (fVar192 * local_5a0._8_4_ + local_620._8_4_) * fStack_5f8;
          fVar287 = (fVar230 * local_5a0._12_4_ + local_620._12_4_) * fStack_5f4;
          fVar258 = (fVar229 * local_5a0._16_4_ + local_620._16_4_) * fStack_5f0;
          fVar284 = (fVar252 * local_5a0._20_4_ + local_620._20_4_) * fStack_5ec;
          fVar286 = (fVar256 * local_5a0._24_4_ + local_620._24_4_) * fStack_5e8;
          auVar249._0_4_ = fVar291 + fVar257 * fVar224;
          auVar249._4_4_ = fVar304 + fVar277 * fVar228;
          auVar249._8_4_ = fVar307 + fVar285 * fVar255;
          auVar249._12_4_ = fVar310 + fVar287 * fVar283;
          auVar249._16_4_ = fVar313 + fVar258 * fVar282;
          auVar249._20_4_ = fVar316 + fVar284 * fVar306;
          auVar249._24_4_ = fVar319 + fVar286 * fVar32;
          auVar249._28_4_ = fVar321 + local_b60._28_4_ + local_620._28_4_;
          auVar84._4_4_ = fVar225 * (float)local_ac0._4_4_;
          auVar84._0_4_ = fVar175 * (float)local_ac0._0_4_;
          auVar84._8_4_ = fVar192 * fStack_ab8;
          auVar84._12_4_ = fVar230 * fStack_ab4;
          auVar84._16_4_ = fVar229 * fStack_ab0;
          auVar84._20_4_ = fVar252 * fStack_aac;
          auVar84._24_4_ = fVar256 * fStack_aa8;
          auVar84._28_4_ = 0x3e000000;
          auVar26 = vsubps_avx(auVar84,auVar249);
          auVar241 = auVar26._0_28_;
          auVar300._0_4_ = (float)local_aa0._0_4_ + fVar257 * fVar223;
          auVar300._4_4_ = local_aa0._4_4_ + fVar277 * fVar226;
          auVar300._8_4_ = local_aa0._8_4_ + fVar285 * fVar253;
          auVar300._12_4_ = local_aa0._12_4_ + fVar287 * fVar279;
          auVar300._16_4_ = local_aa0._16_4_ + fVar258 * fVar278;
          auVar300._20_4_ = local_aa0._20_4_ + fVar284 * fVar290;
          auVar300._24_4_ = local_aa0._24_4_ + fVar286 * fVar318;
          auVar300._28_4_ = local_aa0._28_4_ + 0.125;
          auVar85._4_4_ = (float)local_700._4_4_ * fVar225;
          auVar85._0_4_ = (float)local_700._0_4_ * fVar175;
          auVar85._8_4_ = fStack_6f8 * fVar192;
          auVar85._12_4_ = fStack_6f4 * fVar230;
          auVar85._16_4_ = fStack_6f0 * fVar229;
          auVar85._20_4_ = fStack_6ec * fVar252;
          auVar85._24_4_ = fStack_6e8 * fVar256;
          auVar85._28_4_ = fStack_aa4;
          auVar26 = vsubps_avx(auVar85,auVar300);
          auVar297 = auVar26._0_28_;
          auVar273._0_4_ = local_320._0_4_ + fVar104 * fVar257;
          auVar273._4_4_ = local_320._4_4_ + fVar227 * fVar277;
          auVar273._8_4_ = local_320._8_4_ + fVar254 * fVar285;
          auVar273._12_4_ = local_320._12_4_ + fVar281 * fVar287;
          auVar273._16_4_ = local_320._16_4_ + fVar280 * fVar258;
          auVar273._20_4_ = local_320._20_4_ + fVar303 * fVar284;
          auVar273._24_4_ = local_320._24_4_ + fVar31 * fVar286;
          auVar273._28_4_ = local_320._28_4_ + auVar272._28_4_;
          auVar86._4_4_ = fVar225 * (float)local_8a0._4_4_;
          auVar86._0_4_ = fVar175 * (float)local_8a0._0_4_;
          auVar86._8_4_ = fVar192 * fStack_898;
          auVar86._12_4_ = fVar230 * fStack_894;
          auVar86._16_4_ = fVar229 * fStack_890;
          auVar86._20_4_ = fVar252 * fStack_88c;
          auVar86._24_4_ = fVar256 * fStack_888;
          auVar86._28_4_ = fStack_aa4;
          auVar26 = vsubps_avx(auVar86,auVar273);
          auVar265 = auVar26._0_28_;
          auVar25 = vcmpps_avx(auVar25,ZEXT832(0) << 0x20,5);
          auVar329._8_4_ = 0x7f800000;
          auVar329._0_8_ = 0x7f8000007f800000;
          auVar329._12_4_ = 0x7f800000;
          auVar329._16_4_ = 0x7f800000;
          auVar329._20_4_ = 0x7f800000;
          auVar329._24_4_ = 0x7f800000;
          auVar329._28_4_ = 0x7f800000;
          auVar328 = vblendvps_avx(auVar329,auVar79,auVar25);
          auVar26 = vmaxps_avx(local_5e0,local_480);
          auVar87._4_4_ = auVar26._4_4_ * 1.9073486e-06;
          auVar87._0_4_ = auVar26._0_4_ * 1.9073486e-06;
          auVar87._8_4_ = auVar26._8_4_ * 1.9073486e-06;
          auVar87._12_4_ = auVar26._12_4_ * 1.9073486e-06;
          auVar87._16_4_ = auVar26._16_4_ * 1.9073486e-06;
          auVar87._20_4_ = auVar26._20_4_ * 1.9073486e-06;
          auVar87._24_4_ = auVar26._24_4_ * 1.9073486e-06;
          auVar87._28_4_ = auVar26._28_4_;
          auVar26 = vcmpps_avx(local_a00,auVar87,1);
          auVar372._8_4_ = 0xff800000;
          auVar372._0_8_ = 0xff800000ff800000;
          auVar372._12_4_ = 0xff800000;
          auVar372._16_4_ = 0xff800000;
          auVar372._20_4_ = 0xff800000;
          auVar372._24_4_ = 0xff800000;
          auVar372._28_4_ = 0xff800000;
          auVar371 = vblendvps_avx(auVar372,auVar80,auVar25);
          auVar27 = auVar25 & auVar26;
          if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0x7f,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar27 >> 0xbf,0) != '\0') ||
              (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar27[0x1f] < '\0') {
            auVar126 = vandps_avx(auVar26,auVar25);
            auVar206 = vpackssdw_avx(auVar126._0_16_,auVar126._16_16_);
            auVar27 = vcmpps_avx(local_b00,_DAT_01f7b000,2);
            auVar171._8_4_ = 0xff800000;
            auVar171._0_8_ = 0xff800000ff800000;
            auVar171._12_4_ = 0xff800000;
            auVar171._16_4_ = 0xff800000;
            auVar171._20_4_ = 0xff800000;
            auVar171._24_4_ = 0xff800000;
            auVar171._28_4_ = 0xff800000;
            auVar191._8_4_ = 0x7f800000;
            auVar191._0_8_ = 0x7f8000007f800000;
            auVar191._12_4_ = 0x7f800000;
            auVar191._16_4_ = 0x7f800000;
            auVar191._20_4_ = 0x7f800000;
            auVar191._24_4_ = 0x7f800000;
            auVar191._28_4_ = 0x7f800000;
            auVar26 = vblendvps_avx(auVar191,auVar171,auVar27);
            auVar294 = vpmovsxwd_avx(auVar206);
            auVar206 = vpunpckhwd_avx(auVar206,auVar206);
            auVar420._16_16_ = auVar206;
            auVar420._0_16_ = auVar294;
            auVar328 = vblendvps_avx(auVar328,auVar26,auVar420);
            auVar26 = vblendvps_avx(auVar171,auVar191,auVar27);
            auVar371 = vblendvps_avx(auVar371,auVar26,auVar420);
            auVar222._0_8_ = auVar126._0_8_ ^ 0xffffffffffffffff;
            auVar222._8_4_ = auVar126._8_4_ ^ 0xffffffff;
            auVar222._12_4_ = auVar126._12_4_ ^ 0xffffffff;
            auVar222._16_4_ = auVar126._16_4_ ^ 0xffffffff;
            auVar222._20_4_ = auVar126._20_4_ ^ 0xffffffff;
            auVar222._24_4_ = auVar126._24_4_ ^ 0xffffffff;
            auVar222._28_4_ = auVar126._28_4_ ^ 0xffffffff;
            auVar126 = vorps_avx(auVar27,auVar222);
            auVar126 = vandps_avx(auVar25,auVar126);
          }
          auVar422 = local_9c0._0_28_;
        }
        _local_500 = local_720;
        local_4e0 = vminps_avx(local_4a0,auVar328);
        _local_820 = vmaxps_avx(local_720,auVar371);
        _local_4c0 = _local_820;
        auVar25 = vcmpps_avx(local_720,local_4e0,2);
        local_660 = vandps_avx(auVar183,auVar25);
        auVar25 = vcmpps_avx(_local_820,local_4a0,2);
        local_860 = vandps_avx(auVar183,auVar25);
        auVar183 = vorps_avx(local_860,local_660);
        if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar183 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar183 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar183 >> 0x7f,0) != '\0') ||
              (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar183 >> 0xbf,0) != '\0') ||
            (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar183[0x1f] < '\0') {
          auVar163._0_8_ = auVar126._0_8_ ^ 0xffffffffffffffff;
          auVar163._8_4_ = auVar126._8_4_ ^ 0xffffffff;
          auVar163._12_4_ = auVar126._12_4_ ^ 0xffffffff;
          auVar163._16_4_ = auVar126._16_4_ ^ 0xffffffff;
          auVar163._20_4_ = auVar126._20_4_ ^ 0xffffffff;
          auVar163._24_4_ = auVar126._24_4_ ^ 0xffffffff;
          fVar289 = auVar126._28_4_;
          auVar163._28_4_ = (uint)fVar289 ^ 0xffffffff;
          auVar127._0_4_ =
               (float)local_ac0._0_4_ * auVar241._0_4_ +
               (float)local_700._0_4_ * auVar297._0_4_ + (float)local_8a0._0_4_ * auVar265._0_4_;
          auVar127._4_4_ =
               (float)local_ac0._4_4_ * auVar241._4_4_ +
               (float)local_700._4_4_ * auVar297._4_4_ + (float)local_8a0._4_4_ * auVar265._4_4_;
          auVar127._8_4_ =
               fStack_ab8 * auVar241._8_4_ +
               fStack_6f8 * auVar297._8_4_ + fStack_898 * auVar265._8_4_;
          auVar127._12_4_ =
               fStack_ab4 * auVar241._12_4_ +
               fStack_6f4 * auVar297._12_4_ + fStack_894 * auVar265._12_4_;
          auVar127._16_4_ =
               fStack_ab0 * auVar241._16_4_ +
               fStack_6f0 * auVar297._16_4_ + fStack_890 * auVar265._16_4_;
          auVar127._20_4_ =
               fStack_aac * auVar241._20_4_ +
               fStack_6ec * auVar297._20_4_ + fStack_88c * auVar265._20_4_;
          auVar127._24_4_ =
               fStack_aa8 * auVar241._24_4_ +
               fStack_6e8 * auVar297._24_4_ + fStack_888 * auVar265._24_4_;
          auVar127._28_4_ = fVar289 + local_860._28_4_ + auVar183._28_4_;
          auVar250._8_4_ = 0x7fffffff;
          auVar250._0_8_ = 0x7fffffff7fffffff;
          auVar250._12_4_ = 0x7fffffff;
          auVar250._16_4_ = 0x7fffffff;
          auVar250._20_4_ = 0x7fffffff;
          auVar250._24_4_ = 0x7fffffff;
          auVar250._28_4_ = 0x7fffffff;
          auVar183 = vandps_avx(auVar127,auVar250);
          auVar274._8_4_ = 0x3e99999a;
          auVar274._0_8_ = 0x3e99999a3e99999a;
          auVar274._12_4_ = 0x3e99999a;
          auVar274._16_4_ = 0x3e99999a;
          auVar274._20_4_ = 0x3e99999a;
          auVar274._24_4_ = 0x3e99999a;
          auVar274._28_4_ = 0x3e99999a;
          auVar183 = vcmpps_avx(auVar183,auVar274,1);
          local_6a0 = vorps_avx(auVar183,auVar163);
          auVar128._0_4_ =
               auVar422._0_4_ * (float)local_ac0._0_4_ +
               (float)local_700._0_4_ * (float)local_ca0._0_4_ +
               (float)local_8a0._0_4_ * (float)local_b60._0_4_;
          auVar128._4_4_ =
               auVar422._4_4_ * (float)local_ac0._4_4_ +
               (float)local_700._4_4_ * (float)local_ca0._4_4_ +
               (float)local_8a0._4_4_ * (float)local_b60._4_4_;
          auVar128._8_4_ =
               auVar422._8_4_ * fStack_ab8 + fStack_6f8 * fStack_c98 + fStack_898 * fStack_b58;
          auVar128._12_4_ =
               auVar422._12_4_ * fStack_ab4 + fStack_6f4 * fStack_c94 + fStack_894 * fStack_b54;
          auVar128._16_4_ =
               auVar422._16_4_ * fStack_ab0 + fStack_6f0 * fStack_c90 + fStack_890 * fStack_b50;
          auVar128._20_4_ =
               auVar422._20_4_ * fStack_aac + fStack_6ec * fStack_c8c + fStack_88c * fStack_b4c;
          auVar128._24_4_ =
               auVar422._24_4_ * fStack_aa8 + fStack_6e8 * fStack_c88 + fStack_888 * fStack_b48;
          auVar128._28_4_ = local_6a0._28_4_ + local_660._28_4_ + fVar289;
          auVar183 = vandps_avx(auVar128,auVar250);
          auVar183 = vcmpps_avx(auVar183,auVar274,1);
          auVar183 = vorps_avx(auVar183,auVar163);
          auVar164._8_4_ = 3;
          auVar164._0_8_ = 0x300000003;
          auVar164._12_4_ = 3;
          auVar164._16_4_ = 3;
          auVar164._20_4_ = 3;
          auVar164._24_4_ = 3;
          auVar164._28_4_ = 3;
          auVar189._8_4_ = 2;
          auVar189._0_8_ = 0x200000002;
          auVar189._12_4_ = 2;
          auVar189._16_4_ = 2;
          auVar189._20_4_ = 2;
          auVar189._24_4_ = 2;
          auVar189._28_4_ = 2;
          auVar183 = vblendvps_avx(auVar189,auVar164,auVar183);
          local_6c0 = ZEXT432(uVar98);
          auVar294 = vpshufd_avx(ZEXT416(uVar98),0);
          auVar206 = vpcmpgtd_avx(auVar183._16_16_,auVar294);
          local_6e0._0_16_ = auVar294;
          auVar294 = vpcmpgtd_avx(auVar183._0_16_,auVar294);
          auVar165._16_16_ = auVar206;
          auVar165._0_16_ = auVar294;
          local_680 = vblendps_avx(ZEXT1632(auVar294),auVar165,0xf0);
          auVar183 = vandnps_avx(local_680,local_660);
          local_840._4_4_ = local_720._4_4_ + (float)local_8c0._4_4_;
          local_840._0_4_ = local_720._0_4_ + (float)local_8c0._0_4_;
          fStack_838 = local_720._8_4_ + fStack_8b8;
          fStack_834 = local_720._12_4_ + fStack_8b4;
          fStack_830 = local_720._16_4_ + fStack_8b0;
          fStack_82c = local_720._20_4_ + fStack_8ac;
          fStack_828 = local_720._24_4_ + fStack_8a8;
          fStack_824 = local_720._28_4_ + fStack_8a4;
          while( true ) {
            local_520 = auVar183;
            local_c50._0_4_ = auVar34._0_4_;
            local_c50._4_4_ = auVar34._4_4_;
            fStack_c48 = auVar34._8_4_;
            fStack_c44 = auVar34._12_4_;
            local_c70 = auVar35._0_4_;
            fStack_c6c = auVar35._4_4_;
            fStack_c68 = auVar35._8_4_;
            fStack_c64 = auVar35._12_4_;
            if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar183 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar183 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar183 >> 0x7f,0) == '\0') &&
                  (auVar183 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar183 >> 0xbf,0) == '\0') &&
                (auVar183 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar183[0x1f]) break;
            auVar166._8_4_ = 0x7f800000;
            auVar166._0_8_ = 0x7f8000007f800000;
            auVar166._12_4_ = 0x7f800000;
            auVar166._16_4_ = 0x7f800000;
            auVar166._20_4_ = 0x7f800000;
            auVar166._24_4_ = 0x7f800000;
            auVar166._28_4_ = 0x7f800000;
            auVar126 = vblendvps_avx(auVar166,local_720,auVar183);
            auVar25 = vshufps_avx(auVar126,auVar126,0xb1);
            auVar25 = vminps_avx(auVar126,auVar25);
            auVar26 = vshufpd_avx(auVar25,auVar25,5);
            auVar25 = vminps_avx(auVar25,auVar26);
            auVar26 = vperm2f128_avx(auVar25,auVar25,1);
            auVar25 = vminps_avx(auVar25,auVar26);
            auVar126 = vcmpps_avx(auVar126,auVar25,0);
            auVar25 = auVar183 & auVar126;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar183 = vandps_avx(auVar126,auVar183);
            }
            uVar92 = vmovmskps_avx(auVar183);
            uVar100 = 0;
            if (uVar92 != 0) {
              for (; (uVar92 >> uVar100 & 1) == 0; uVar100 = uVar100 + 1) {
              }
            }
            uVar93 = (ulong)uVar100;
            *(undefined4 *)(local_520 + uVar93 * 4) = 0;
            fVar289 = local_1a0[uVar93];
            uVar100 = *(uint *)(local_500 + uVar93 * 4);
            fVar223 = auVar144._0_4_;
            if ((float)local_a40._0_4_ < 0.0) {
              fVar223 = sqrtf((float)local_a40._0_4_);
            }
            auVar294 = vminps_avx(auVar34,_local_980);
            auVar206 = vmaxps_avx(auVar34,_local_980);
            auVar209 = vminps_avx(auVar35,_local_9a0);
            auVar108 = vminps_avx(auVar294,auVar209);
            auVar294 = vmaxps_avx(auVar35,_local_9a0);
            auVar209 = vmaxps_avx(auVar206,auVar294);
            auVar201._8_4_ = 0x7fffffff;
            auVar201._0_8_ = 0x7fffffff7fffffff;
            auVar201._12_4_ = 0x7fffffff;
            auVar206 = vandps_avx(auVar108,auVar201);
            auVar294 = vandps_avx(auVar209,auVar201);
            auVar206 = vmaxps_avx(auVar206,auVar294);
            auVar294 = vmovshdup_avx(auVar206);
            auVar294 = vmaxss_avx(auVar294,auVar206);
            auVar206 = vshufpd_avx(auVar206,auVar206,1);
            auVar206 = vmaxss_avx(auVar206,auVar294);
            local_aa0._0_4_ = auVar206._0_4_ * 1.9073486e-06;
            local_b00._0_4_ = fVar223 * 1.9073486e-06;
            local_a20._0_16_ = vshufps_avx(auVar209,auVar209,0xff);
            auVar206 = vinsertps_avx(ZEXT416(uVar100),ZEXT416((uint)fVar289),0x10);
            auVar302 = ZEXT1664(auVar206);
            lVar95 = 5;
            do {
              do {
                bVar101 = lVar95 == 0;
                lVar95 = lVar95 + -1;
                if (bVar101) goto LAB_00a9eb79;
                auVar294 = auVar302._0_16_;
                auVar206 = vmovshdup_avx(auVar294);
                fVar253 = auVar206._0_4_;
                fVar175 = 1.0 - fVar253;
                auVar206 = vshufps_avx(auVar294,auVar294,0x55);
                fVar289 = auVar206._0_4_;
                fVar223 = auVar206._4_4_;
                fVar104 = auVar206._8_4_;
                fVar224 = auVar206._12_4_;
                auVar206 = vshufps_avx(ZEXT416((uint)fVar175),ZEXT416((uint)fVar175),0);
                fVar225 = auVar206._0_4_;
                fVar192 = auVar206._4_4_;
                fVar226 = auVar206._8_4_;
                fVar227 = auVar206._12_4_;
                fVar228 = local_c70 * fVar289 + (float)local_980._0_4_ * fVar225;
                fVar230 = fStack_c6c * fVar223 + (float)local_980._4_4_ * fVar192;
                fVar229 = fStack_c68 * fVar104 + fStack_978 * fVar226;
                fVar252 = fStack_c64 * fVar224 + fStack_974 * fVar227;
                auVar260._0_4_ =
                     fVar225 * ((float)local_980._0_4_ * fVar289 + fVar225 * (float)local_c50._0_4_)
                     + fVar289 * fVar228;
                auVar260._4_4_ =
                     fVar192 * ((float)local_980._4_4_ * fVar223 + fVar192 * (float)local_c50._4_4_)
                     + fVar223 * fVar230;
                auVar260._8_4_ =
                     fVar226 * (fStack_978 * fVar104 + fVar226 * fStack_c48) + fVar104 * fVar229;
                auVar260._12_4_ =
                     fVar227 * (fStack_974 * fVar224 + fVar227 * fStack_c44) + fVar224 * fVar252;
                auVar202._0_4_ =
                     fVar225 * fVar228 +
                     fVar289 * (fVar289 * (float)local_9a0._0_4_ + local_c70 * fVar225);
                auVar202._4_4_ =
                     fVar192 * fVar230 +
                     fVar223 * (fVar223 * (float)local_9a0._4_4_ + fStack_c6c * fVar192);
                auVar202._8_4_ =
                     fVar226 * fVar229 + fVar104 * (fVar104 * fStack_998 + fStack_c68 * fVar226);
                auVar202._12_4_ =
                     fVar227 * fVar252 + fVar224 * (fVar224 * fStack_994 + fStack_c64 * fVar227);
                auVar206 = vshufps_avx(auVar294,auVar294,0);
                auVar146._0_4_ = auVar206._0_4_ * (float)local_a30._0_4_ + 0.0;
                auVar146._4_4_ = auVar206._4_4_ * (float)local_a30._4_4_ + 0.0;
                auVar146._8_4_ = auVar206._8_4_ * fStack_a28 + 0.0;
                auVar146._12_4_ = auVar206._12_4_ * fStack_a24 + 0.0;
                auVar107._0_4_ = fVar225 * auVar260._0_4_ + fVar289 * auVar202._0_4_;
                auVar107._4_4_ = fVar192 * auVar260._4_4_ + fVar223 * auVar202._4_4_;
                auVar107._8_4_ = fVar226 * auVar260._8_4_ + fVar104 * auVar202._8_4_;
                auVar107._12_4_ = fVar227 * auVar260._12_4_ + fVar224 * auVar202._12_4_;
                local_9c0._0_16_ = auVar107;
                auVar206 = vsubps_avx(auVar146,auVar107);
                _local_b60 = auVar206;
                auVar206 = vdpps_avx(auVar206,auVar206,0x7f);
                fVar289 = auVar206._0_4_;
                if (fVar289 < 0.0) {
                  local_b20._0_16_ = auVar202;
                  fVar223 = sqrtf(fVar289);
                  auVar302 = ZEXT1664(auVar294);
                  auVar202 = local_b20._0_16_;
                }
                else {
                  auVar209 = vsqrtss_avx(auVar206,auVar206);
                  fVar223 = auVar209._0_4_;
                }
                auVar209 = vsubps_avx(auVar202,auVar260);
                auVar322._0_4_ = auVar209._0_4_ * 3.0;
                auVar322._4_4_ = auVar209._4_4_ * 3.0;
                auVar322._8_4_ = auVar209._8_4_ * 3.0;
                auVar322._12_4_ = auVar209._12_4_ * 3.0;
                auVar209 = vshufps_avx(ZEXT416((uint)(fVar253 * 6.0)),ZEXT416((uint)(fVar253 * 6.0))
                                       ,0);
                auVar108 = ZEXT416((uint)((fVar175 - (fVar253 + fVar253)) * 6.0));
                auVar178 = vshufps_avx(auVar108,auVar108,0);
                auVar108 = ZEXT416((uint)((fVar253 - (fVar175 + fVar175)) * 6.0));
                auVar203 = vshufps_avx(auVar108,auVar108,0);
                auVar36 = vshufps_avx(ZEXT416((uint)(fVar175 * 6.0)),ZEXT416((uint)(fVar175 * 6.0)),
                                      0);
                auVar108 = vdpps_avx(auVar322,auVar322,0x7f);
                auVar147._0_4_ =
                     auVar36._0_4_ * (float)local_c50._0_4_ +
                     auVar203._0_4_ * (float)local_980._0_4_ +
                     auVar209._0_4_ * (float)local_9a0._0_4_ + auVar178._0_4_ * local_c70;
                auVar147._4_4_ =
                     auVar36._4_4_ * (float)local_c50._4_4_ +
                     auVar203._4_4_ * (float)local_980._4_4_ +
                     auVar209._4_4_ * (float)local_9a0._4_4_ + auVar178._4_4_ * fStack_c6c;
                auVar147._8_4_ =
                     auVar36._8_4_ * fStack_c48 +
                     auVar203._8_4_ * fStack_978 +
                     auVar209._8_4_ * fStack_998 + auVar178._8_4_ * fStack_c68;
                auVar147._12_4_ =
                     auVar36._12_4_ * fStack_c44 +
                     auVar203._12_4_ * fStack_974 +
                     auVar209._12_4_ * fStack_994 + auVar178._12_4_ * fStack_c64;
                auVar209 = vblendps_avx(auVar108,_DAT_01f45a50,0xe);
                auVar178 = vrsqrtss_avx(auVar209,auVar209);
                fVar224 = auVar178._0_4_;
                fVar104 = auVar108._0_4_;
                auVar178 = vdpps_avx(auVar322,auVar147,0x7f);
                auVar203 = vshufps_avx(auVar108,auVar108,0);
                auVar148._0_4_ = auVar147._0_4_ * auVar203._0_4_;
                auVar148._4_4_ = auVar147._4_4_ * auVar203._4_4_;
                auVar148._8_4_ = auVar147._8_4_ * auVar203._8_4_;
                auVar148._12_4_ = auVar147._12_4_ * auVar203._12_4_;
                auVar178 = vshufps_avx(auVar178,auVar178,0);
                auVar233._0_4_ = auVar322._0_4_ * auVar178._0_4_;
                auVar233._4_4_ = auVar322._4_4_ * auVar178._4_4_;
                auVar233._8_4_ = auVar322._8_4_ * auVar178._8_4_;
                auVar233._12_4_ = auVar322._12_4_ * auVar178._12_4_;
                auVar36 = vsubps_avx(auVar148,auVar233);
                auVar178 = vrcpss_avx(auVar209,auVar209);
                auVar209 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                      ZEXT416((uint)(auVar302._0_4_ * (float)local_b00._0_4_)));
                auVar178 = ZEXT416((uint)(auVar178._0_4_ * (2.0 - fVar104 * auVar178._0_4_)));
                auVar178 = vshufps_avx(auVar178,auVar178,0);
                uVar93 = CONCAT44(auVar322._4_4_,auVar322._0_4_);
                auVar261._0_8_ = uVar93 ^ 0x8000000080000000;
                auVar261._8_4_ = -auVar322._8_4_;
                auVar261._12_4_ = -auVar322._12_4_;
                auVar203 = ZEXT416((uint)(fVar224 * 1.5 +
                                         fVar104 * -0.5 * fVar224 * fVar224 * fVar224));
                auVar203 = vshufps_avx(auVar203,auVar203,0);
                auVar204._0_4_ = auVar203._0_4_ * auVar36._0_4_ * auVar178._0_4_;
                auVar204._4_4_ = auVar203._4_4_ * auVar36._4_4_ * auVar178._4_4_;
                auVar204._8_4_ = auVar203._8_4_ * auVar36._8_4_ * auVar178._8_4_;
                auVar204._12_4_ = auVar203._12_4_ * auVar36._12_4_ * auVar178._12_4_;
                auVar295._0_4_ = auVar322._0_4_ * auVar203._0_4_;
                auVar295._4_4_ = auVar322._4_4_ * auVar203._4_4_;
                auVar295._8_4_ = auVar322._8_4_ * auVar203._8_4_;
                auVar295._12_4_ = auVar322._12_4_ * auVar203._12_4_;
                if (fVar104 < 0.0) {
                  local_b20._0_16_ = auVar261;
                  local_920._0_16_ = auVar295;
                  local_a80._0_16_ = auVar204;
                  fVar104 = sqrtf(fVar104);
                  auVar204 = local_a80._0_16_;
                  auVar261 = local_b20._0_16_;
                  auVar295 = local_920._0_16_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar108,auVar108);
                  fVar104 = auVar108._0_4_;
                }
                auVar108 = vdpps_avx(_local_b60,auVar295,0x7f);
                fVar223 = ((float)local_aa0._0_4_ / fVar104) * (fVar223 + 1.0) +
                          auVar209._0_4_ + fVar223 * (float)local_aa0._0_4_;
                auVar178 = vdpps_avx(auVar261,auVar295,0x7f);
                auVar203 = vdpps_avx(_local_b60,auVar204,0x7f);
                auVar36 = vdpps_avx(_local_a30,auVar295,0x7f);
                auVar37 = vdpps_avx(_local_b60,auVar261,0x7f);
                fVar104 = auVar178._0_4_ + auVar203._0_4_;
                fVar224 = auVar108._0_4_;
                auVar109._0_4_ = fVar224 * fVar224;
                auVar109._4_4_ = auVar108._4_4_ * auVar108._4_4_;
                auVar109._8_4_ = auVar108._8_4_ * auVar108._8_4_;
                auVar109._12_4_ = auVar108._12_4_ * auVar108._12_4_;
                auVar203 = vsubps_avx(auVar206,auVar109);
                auVar178 = vdpps_avx(_local_b60,_local_a30,0x7f);
                fVar175 = auVar37._0_4_ - fVar224 * fVar104;
                fVar225 = auVar178._0_4_ - fVar224 * auVar36._0_4_;
                auVar178 = vrsqrtss_avx(auVar203,auVar203);
                fVar192 = auVar203._0_4_;
                fVar224 = auVar178._0_4_;
                fVar224 = fVar224 * 1.5 + fVar192 * -0.5 * fVar224 * fVar224 * fVar224;
                if (fVar192 < 0.0) {
                  local_b20._0_4_ = fVar223;
                  local_920._0_16_ = auVar36;
                  local_a80._0_16_ = ZEXT416((uint)fVar104);
                  local_800._0_4_ = fVar175;
                  local_940._0_4_ = fVar225;
                  local_a00._0_4_ = fVar224;
                  fVar192 = sqrtf(fVar192);
                  fVar224 = (float)local_a00._0_4_;
                  fVar175 = (float)local_800._0_4_;
                  fVar225 = (float)local_940._0_4_;
                  auVar36 = local_920._0_16_;
                  fVar223 = (float)local_b20._0_4_;
                  auVar178 = local_a80._0_16_;
                }
                else {
                  auVar178 = vsqrtss_avx(auVar203,auVar203);
                  fVar192 = auVar178._0_4_;
                  auVar178 = ZEXT416((uint)fVar104);
                }
                auVar37 = vpermilps_avx(local_9c0._0_16_,0xff);
                auVar114 = vshufps_avx(auVar322,auVar322,0xff);
                fVar104 = fVar175 * fVar224 - auVar114._0_4_;
                auVar234._0_8_ = auVar36._0_8_ ^ 0x8000000080000000;
                auVar234._8_4_ = auVar36._8_4_ ^ 0x80000000;
                auVar234._12_4_ = auVar36._12_4_ ^ 0x80000000;
                auVar262._0_4_ = -fVar104;
                auVar262._4_4_ = 0x80000000;
                auVar262._8_4_ = 0x80000000;
                auVar262._12_4_ = 0x80000000;
                auVar203 = vinsertps_avx(auVar262,ZEXT416((uint)(fVar225 * fVar224)),0x1c);
                auVar36 = vmovsldup_avx(ZEXT416((uint)(auVar178._0_4_ * fVar225 * fVar224 -
                                                      auVar36._0_4_ * fVar104)));
                auVar203 = vdivps_avx(auVar203,auVar36);
                auVar178 = vinsertps_avx(auVar178,auVar234,0x10);
                auVar178 = vdivps_avx(auVar178,auVar36);
                auVar36 = vmovsldup_avx(auVar108);
                auVar110 = ZEXT416((uint)(fVar192 - auVar37._0_4_));
                auVar37 = vmovsldup_avx(auVar110);
                auVar179._0_4_ = auVar36._0_4_ * auVar203._0_4_ + auVar37._0_4_ * auVar178._0_4_;
                auVar179._4_4_ = auVar36._4_4_ * auVar203._4_4_ + auVar37._4_4_ * auVar178._4_4_;
                auVar179._8_4_ = auVar36._8_4_ * auVar203._8_4_ + auVar37._8_4_ * auVar178._8_4_;
                auVar179._12_4_ =
                     auVar36._12_4_ * auVar203._12_4_ + auVar37._12_4_ * auVar178._12_4_;
                auVar178 = vsubps_avx(auVar294,auVar179);
                auVar302 = ZEXT1664(auVar178);
                auVar180._8_4_ = 0x7fffffff;
                auVar180._0_8_ = 0x7fffffff7fffffff;
                auVar180._12_4_ = 0x7fffffff;
                auVar294 = vandps_avx(auVar108,auVar180);
              } while (fVar223 <= auVar294._0_4_);
              auVar205._8_4_ = 0x7fffffff;
              auVar205._0_8_ = 0x7fffffff7fffffff;
              auVar205._12_4_ = 0x7fffffff;
              auVar294 = vandps_avx(auVar110,auVar205);
            } while ((float)local_a20._0_4_ * 1.9073486e-06 + auVar209._0_4_ + fVar223 <=
                     auVar294._0_4_);
            fVar223 = auVar178._0_4_ + (float)local_8f0._0_4_;
            if ((fVar198 <= fVar223) &&
               (fVar104 = *(float *)(ray + k * 4 + 0x80), fVar223 <= fVar104)) {
              auVar294 = vmovshdup_avx(auVar178);
              fVar224 = auVar294._0_4_;
              if ((0.0 <= fVar224) && (fVar224 <= 1.0)) {
                auVar206 = vrsqrtss_avx(auVar206,auVar206);
                fVar175 = auVar206._0_4_;
                pGVar19 = (context->scene->geometries).items[uVar96].ptr;
                if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar206 = ZEXT416((uint)(fVar175 * 1.5 +
                                           fVar289 * -0.5 * fVar175 * fVar175 * fVar175));
                  auVar206 = vshufps_avx(auVar206,auVar206,0);
                  auVar207._0_4_ = auVar206._0_4_ * (float)local_b60._0_4_;
                  auVar207._4_4_ = auVar206._4_4_ * (float)local_b60._4_4_;
                  auVar207._8_4_ = auVar206._8_4_ * fStack_b58;
                  auVar207._12_4_ = auVar206._12_4_ * fStack_b54;
                  auVar149._0_4_ = auVar322._0_4_ + auVar114._0_4_ * auVar207._0_4_;
                  auVar149._4_4_ = auVar322._4_4_ + auVar114._4_4_ * auVar207._4_4_;
                  auVar149._8_4_ = auVar322._8_4_ + auVar114._8_4_ * auVar207._8_4_;
                  auVar149._12_4_ = auVar322._12_4_ + auVar114._12_4_ * auVar207._12_4_;
                  auVar206 = vshufps_avx(auVar207,auVar207,0xc9);
                  auVar294 = vshufps_avx(auVar322,auVar322,0xc9);
                  auVar208._0_4_ = auVar294._0_4_ * auVar207._0_4_;
                  auVar208._4_4_ = auVar294._4_4_ * auVar207._4_4_;
                  auVar208._8_4_ = auVar294._8_4_ * auVar207._8_4_;
                  auVar208._12_4_ = auVar294._12_4_ * auVar207._12_4_;
                  auVar235._0_4_ = auVar322._0_4_ * auVar206._0_4_;
                  auVar235._4_4_ = auVar322._4_4_ * auVar206._4_4_;
                  auVar235._8_4_ = auVar322._8_4_ * auVar206._8_4_;
                  auVar235._12_4_ = auVar322._12_4_ * auVar206._12_4_;
                  auVar209 = vsubps_avx(auVar235,auVar208);
                  auVar206 = vshufps_avx(auVar209,auVar209,0xc9);
                  auVar294 = vshufps_avx(auVar149,auVar149,0xc9);
                  auVar236._0_4_ = auVar294._0_4_ * auVar206._0_4_;
                  auVar236._4_4_ = auVar294._4_4_ * auVar206._4_4_;
                  auVar236._8_4_ = auVar294._8_4_ * auVar206._8_4_;
                  auVar236._12_4_ = auVar294._12_4_ * auVar206._12_4_;
                  auVar206 = vshufps_avx(auVar209,auVar209,0xd2);
                  auVar150._0_4_ = auVar149._0_4_ * auVar206._0_4_;
                  auVar150._4_4_ = auVar149._4_4_ * auVar206._4_4_;
                  auVar150._8_4_ = auVar149._8_4_ * auVar206._8_4_;
                  auVar150._12_4_ = auVar149._12_4_ * auVar206._12_4_;
                  auVar206 = vsubps_avx(auVar236,auVar150);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar223;
                    uVar8 = vextractps_avx(auVar206,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                    uVar8 = vextractps_avx(auVar206,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                    *(int *)(ray + k * 4 + 0xe0) = auVar206._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar224;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_ac8;
                    *(uint *)(ray + k * 4 + 0x120) = uVar96;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_790 = vshufps_avx(auVar178,auVar178,0x55);
                    auVar294 = vshufps_avx(auVar206,auVar206,0x55);
                    auStack_7b0 = vshufps_avx(auVar206,auVar206,0xaa);
                    local_7a0 = vshufps_avx(auVar206,auVar206,0);
                    local_7c0 = (RTCHitN  [16])auVar294;
                    local_780 = ZEXT816(0) << 0x20;
                    local_770 = local_7e0._0_8_;
                    uStack_768 = local_7e0._8_8_;
                    local_760 = local_7d0;
                    vcmpps_avx(ZEXT1632(local_7d0),ZEXT1632(local_7d0),0xf);
                    uStack_74c = context->user->instID[0];
                    local_750 = uStack_74c;
                    uStack_748 = uStack_74c;
                    uStack_744 = uStack_74c;
                    uVar100 = context->user->instPrimID[0];
                    auVar151._4_4_ = uVar100;
                    auVar151._0_4_ = uVar100;
                    auVar151._8_4_ = uVar100;
                    auVar151._12_4_ = uVar100;
                    auStack_740 = auVar151;
                    *(float *)(ray + k * 4 + 0x80) = fVar223;
                    local_880._0_16_ = *local_ad0;
                    local_b90.valid = (int *)local_880;
                    local_b90.geometryUserPtr = pGVar19->userPtr;
                    local_b90.context = context->user;
                    local_b90.hit = local_7c0;
                    local_b90.N = 4;
                    auVar206 = *local_ad0;
                    local_b90.ray = (RTCRayN *)ray;
                    if (pGVar19->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar19->intersectionFilterN)(&local_b90);
                      auVar358._8_56_ = extraout_var;
                      auVar358._0_8_ = extraout_XMM1_Qa;
                      auVar151 = auVar358._0_16_;
                      auVar206 = local_880._0_16_;
                    }
                    if (auVar206 == (undefined1  [16])0x0) {
                      auVar294 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar206 = vpcmpeqd_avx(auVar151,auVar151);
                      auVar294 = auVar294 ^ auVar206;
                    }
                    else {
                      p_Var24 = context->args->filter;
                      auVar209 = vpcmpeqd_avx(auVar294,auVar294);
                      if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var24)(&local_b90);
                        auVar209 = vpcmpeqd_avx(auVar209,auVar209);
                        auVar206 = local_880._0_16_;
                      }
                      auVar108 = vpcmpeqd_avx(auVar206,_DAT_01f45a50);
                      auVar294 = auVar108 ^ auVar209;
                      if (auVar206 != (undefined1  [16])0x0) {
                        auVar108 = auVar108 ^ auVar209;
                        auVar206 = vmaskmovps_avx(auVar108,*(undefined1 (*) [16])local_b90.hit);
                        *(undefined1 (*) [16])(local_b90.ray + 0xc0) = auVar206;
                        auVar206 = vmaskmovps_avx(auVar108,*(undefined1 (*) [16])
                                                            (local_b90.hit + 0x10));
                        *(undefined1 (*) [16])(local_b90.ray + 0xd0) = auVar206;
                        auVar206 = vmaskmovps_avx(auVar108,*(undefined1 (*) [16])
                                                            (local_b90.hit + 0x20));
                        *(undefined1 (*) [16])(local_b90.ray + 0xe0) = auVar206;
                        auVar206 = vmaskmovps_avx(auVar108,*(undefined1 (*) [16])
                                                            (local_b90.hit + 0x30));
                        *(undefined1 (*) [16])(local_b90.ray + 0xf0) = auVar206;
                        auVar206 = vmaskmovps_avx(auVar108,*(undefined1 (*) [16])
                                                            (local_b90.hit + 0x40));
                        *(undefined1 (*) [16])(local_b90.ray + 0x100) = auVar206;
                        auVar206 = vmaskmovps_avx(auVar108,*(undefined1 (*) [16])
                                                            (local_b90.hit + 0x50));
                        *(undefined1 (*) [16])(local_b90.ray + 0x110) = auVar206;
                        auVar206 = vmaskmovps_avx(auVar108,*(undefined1 (*) [16])
                                                            (local_b90.hit + 0x60));
                        *(undefined1 (*) [16])(local_b90.ray + 0x120) = auVar206;
                        auVar206 = vmaskmovps_avx(auVar108,*(undefined1 (*) [16])
                                                            (local_b90.hit + 0x70));
                        *(undefined1 (*) [16])(local_b90.ray + 0x130) = auVar206;
                        auVar206 = vmaskmovps_avx(auVar108,*(undefined1 (*) [16])
                                                            (local_b90.hit + 0x80));
                        *(undefined1 (*) [16])(local_b90.ray + 0x140) = auVar206;
                      }
                    }
                    auVar111._8_8_ = 0x100000001;
                    auVar111._0_8_ = 0x100000001;
                    if ((auVar111 & auVar294) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar104;
                    }
                  }
                }
              }
            }
LAB_00a9eb79:
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar338._4_4_ = uVar8;
            auVar338._0_4_ = uVar8;
            auVar338._8_4_ = uVar8;
            auVar338._12_4_ = uVar8;
            auVar338._16_4_ = uVar8;
            auVar338._20_4_ = uVar8;
            auVar338._24_4_ = uVar8;
            auVar338._28_4_ = uVar8;
            auVar421 = ZEXT3264(auVar338);
            auVar183 = vcmpps_avx(_local_840,auVar338,2);
            auVar183 = vandps_avx(auVar183,local_520);
          }
          auVar129._0_4_ = (float)local_8c0._0_4_ + (float)local_820._0_4_;
          auVar129._4_4_ = (float)local_8c0._4_4_ + (float)local_820._4_4_;
          auVar129._8_4_ = fStack_8b8 + fStack_818;
          auVar129._12_4_ = fStack_8b4 + fStack_814;
          auVar129._16_4_ = fStack_8b0 + fStack_810;
          auVar129._20_4_ = fStack_8ac + fStack_80c;
          auVar129._24_4_ = fStack_8a8 + fStack_808;
          auVar129._28_4_ = fStack_8a4 + fStack_804;
          auVar206 = vshufps_avx(auVar421._0_16_,auVar421._0_16_,0);
          auVar167._16_16_ = auVar206;
          auVar167._0_16_ = auVar206;
          auVar183 = vcmpps_avx(auVar129,auVar167,2);
          _local_840 = vandps_avx(auVar183,local_860);
          auVar130._8_4_ = 3;
          auVar130._0_8_ = 0x300000003;
          auVar130._12_4_ = 3;
          auVar130._16_4_ = 3;
          auVar130._20_4_ = 3;
          auVar130._24_4_ = 3;
          auVar130._28_4_ = 3;
          auVar168._8_4_ = 2;
          auVar168._0_8_ = 0x200000002;
          auVar168._12_4_ = 2;
          auVar168._16_4_ = 2;
          auVar168._20_4_ = 2;
          auVar168._24_4_ = 2;
          auVar168._28_4_ = 2;
          auVar183 = vblendvps_avx(auVar168,auVar130,local_6a0);
          auVar206 = vpcmpgtd_avx(auVar183._16_16_,local_6e0._0_16_);
          auVar294 = vpshufd_avx(local_6c0._0_16_,0);
          auVar294 = vpcmpgtd_avx(auVar183._0_16_,auVar294);
          auVar169._16_16_ = auVar206;
          auVar169._0_16_ = auVar294;
          local_860 = vblendps_avx(ZEXT1632(auVar294),auVar169,0xf0);
          local_880 = vandnps_avx(local_860,_local_840);
          local_720 = _local_4c0;
          local_820._4_4_ = (float)local_8c0._4_4_ + (float)local_4c0._4_4_;
          local_820._0_4_ = (float)local_8c0._0_4_ + (float)local_4c0._0_4_;
          fStack_818 = fStack_8b8 + fStack_4b8;
          fStack_814 = fStack_8b4 + fStack_4b4;
          fStack_810 = fStack_8b0 + fStack_4b0;
          fStack_80c = fStack_8ac + fStack_4ac;
          fStack_808 = fStack_8a8 + fStack_4a8;
          fStack_804 = fStack_8a4 + fStack_4a4;
          auVar358 = ZEXT3264(local_a60);
          auVar374 = ZEXT3264(local_b40);
          auVar302 = ZEXT3264(local_9e0);
          for (; (((((((local_880 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_880 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_880 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_880 >> 0x7f,0) != '\0') ||
                   (local_880 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_880 >> 0xbf,0) != '\0') ||
                 (local_880 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_880[0x1f] < '\0'; local_880 = vandps_avx(auVar183,local_880)) {
            auVar170._8_4_ = 0x7f800000;
            auVar170._0_8_ = 0x7f8000007f800000;
            auVar170._12_4_ = 0x7f800000;
            auVar170._16_4_ = 0x7f800000;
            auVar170._20_4_ = 0x7f800000;
            auVar170._24_4_ = 0x7f800000;
            auVar170._28_4_ = 0x7f800000;
            auVar183 = vblendvps_avx(auVar170,local_720,local_880);
            auVar126 = vshufps_avx(auVar183,auVar183,0xb1);
            auVar126 = vminps_avx(auVar183,auVar126);
            auVar25 = vshufpd_avx(auVar126,auVar126,5);
            auVar126 = vminps_avx(auVar126,auVar25);
            auVar25 = vperm2f128_avx(auVar126,auVar126,1);
            auVar126 = vminps_avx(auVar126,auVar25);
            auVar126 = vcmpps_avx(auVar183,auVar126,0);
            auVar25 = local_880 & auVar126;
            auVar183 = local_880;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar183 = vandps_avx(auVar126,local_880);
            }
            uVar92 = vmovmskps_avx(auVar183);
            uVar100 = 0;
            if (uVar92 != 0) {
              for (; (uVar92 >> uVar100 & 1) == 0; uVar100 = uVar100 + 1) {
              }
            }
            uVar93 = (ulong)uVar100;
            *(undefined4 *)(local_880 + uVar93 * 4) = 0;
            fVar289 = local_1c0[uVar93];
            uVar100 = *(uint *)(local_4a0 + uVar93 * 4);
            fVar223 = auVar33._0_4_;
            if ((float)local_a40._0_4_ < 0.0) {
              fVar223 = sqrtf((float)local_a40._0_4_);
              auVar302 = ZEXT3264(local_9e0);
              auVar374 = ZEXT3264(local_b40);
              auVar358 = ZEXT3264(local_a60);
            }
            auVar294 = vminps_avx(auVar34,_local_980);
            auVar206 = vmaxps_avx(auVar34,_local_980);
            auVar209 = vminps_avx(auVar35,_local_9a0);
            auVar108 = vminps_avx(auVar294,auVar209);
            auVar294 = vmaxps_avx(auVar35,_local_9a0);
            auVar209 = vmaxps_avx(auVar206,auVar294);
            auVar210._8_4_ = 0x7fffffff;
            auVar210._0_8_ = 0x7fffffff7fffffff;
            auVar210._12_4_ = 0x7fffffff;
            auVar206 = vandps_avx(auVar108,auVar210);
            auVar294 = vandps_avx(auVar209,auVar210);
            auVar206 = vmaxps_avx(auVar206,auVar294);
            auVar294 = vmovshdup_avx(auVar206);
            auVar294 = vmaxss_avx(auVar294,auVar206);
            auVar206 = vshufpd_avx(auVar206,auVar206,1);
            auVar206 = vmaxss_avx(auVar206,auVar294);
            local_aa0._0_4_ = auVar206._0_4_ * 1.9073486e-06;
            local_920._0_4_ = fVar223 * 1.9073486e-06;
            local_a20._0_16_ = vshufps_avx(auVar209,auVar209,0xff);
            auVar206 = vinsertps_avx(ZEXT416(uVar100),ZEXT416((uint)fVar289),0x10);
            auVar421 = ZEXT1664(auVar206);
            lVar95 = 5;
            do {
              do {
                bVar101 = lVar95 == 0;
                lVar95 = lVar95 + -1;
                if (bVar101) goto LAB_00a9f6ec;
                auVar294 = auVar421._0_16_;
                auVar206 = vmovshdup_avx(auVar294);
                fVar253 = auVar206._0_4_;
                fVar175 = 1.0 - fVar253;
                auVar206 = vshufps_avx(auVar294,auVar294,0x55);
                fVar289 = auVar206._0_4_;
                fVar223 = auVar206._4_4_;
                fVar104 = auVar206._8_4_;
                fVar224 = auVar206._12_4_;
                auVar206 = vshufps_avx(ZEXT416((uint)fVar175),ZEXT416((uint)fVar175),0);
                fVar225 = auVar206._0_4_;
                fVar192 = auVar206._4_4_;
                fVar226 = auVar206._8_4_;
                fVar227 = auVar206._12_4_;
                fVar228 = local_c70 * fVar289 + (float)local_980._0_4_ * fVar225;
                fVar230 = fStack_c6c * fVar223 + (float)local_980._4_4_ * fVar192;
                fVar229 = fStack_c68 * fVar104 + fStack_978 * fVar226;
                fVar252 = fStack_c64 * fVar224 + fStack_974 * fVar227;
                auVar263._0_4_ =
                     fVar225 * ((float)local_980._0_4_ * fVar289 + fVar225 * (float)local_c50._0_4_)
                     + fVar289 * fVar228;
                auVar263._4_4_ =
                     fVar192 * ((float)local_980._4_4_ * fVar223 + fVar192 * (float)local_c50._4_4_)
                     + fVar223 * fVar230;
                auVar263._8_4_ =
                     fVar226 * (fStack_978 * fVar104 + fVar226 * fStack_c48) + fVar104 * fVar229;
                auVar263._12_4_ =
                     fVar227 * (fStack_974 * fVar224 + fVar227 * fStack_c44) + fVar224 * fVar252;
                auVar211._0_4_ =
                     fVar225 * fVar228 +
                     fVar289 * (fVar289 * (float)local_9a0._0_4_ + local_c70 * fVar225);
                auVar211._4_4_ =
                     fVar192 * fVar230 +
                     fVar223 * (fVar223 * (float)local_9a0._4_4_ + fStack_c6c * fVar192);
                auVar211._8_4_ =
                     fVar226 * fVar229 + fVar104 * (fVar104 * fStack_998 + fStack_c68 * fVar226);
                auVar211._12_4_ =
                     fVar227 * fVar252 + fVar224 * (fVar224 * fStack_994 + fStack_c64 * fVar227);
                auVar206 = vshufps_avx(auVar294,auVar294,0);
                auVar152._0_4_ = auVar206._0_4_ * (float)local_a30._0_4_ + 0.0;
                auVar152._4_4_ = auVar206._4_4_ * (float)local_a30._4_4_ + 0.0;
                auVar152._8_4_ = auVar206._8_4_ * fStack_a28 + 0.0;
                auVar152._12_4_ = auVar206._12_4_ * fStack_a24 + 0.0;
                auVar112._0_4_ = fVar225 * auVar263._0_4_ + fVar289 * auVar211._0_4_;
                auVar112._4_4_ = fVar192 * auVar263._4_4_ + fVar223 * auVar211._4_4_;
                auVar112._8_4_ = fVar226 * auVar263._8_4_ + fVar104 * auVar211._8_4_;
                auVar112._12_4_ = fVar227 * auVar263._12_4_ + fVar224 * auVar211._12_4_;
                local_9c0._0_16_ = auVar112;
                auVar206 = vsubps_avx(auVar152,auVar112);
                _local_b60 = auVar206;
                auVar206 = vdpps_avx(auVar206,auVar206,0x7f);
                fVar289 = auVar206._0_4_;
                if (fVar289 < 0.0) {
                  local_b00._0_16_ = auVar263;
                  fVar223 = sqrtf(fVar289);
                  auVar421 = ZEXT1664(auVar294);
                  auVar263 = local_b00._0_16_;
                }
                else {
                  auVar209 = vsqrtss_avx(auVar206,auVar206);
                  fVar223 = auVar209._0_4_;
                }
                auVar209 = vsubps_avx(auVar211,auVar263);
                auVar296._0_4_ = auVar209._0_4_ * 3.0;
                auVar296._4_4_ = auVar209._4_4_ * 3.0;
                auVar296._8_4_ = auVar209._8_4_ * 3.0;
                auVar296._12_4_ = auVar209._12_4_ * 3.0;
                auVar209 = vshufps_avx(ZEXT416((uint)(fVar253 * 6.0)),ZEXT416((uint)(fVar253 * 6.0))
                                       ,0);
                auVar108 = ZEXT416((uint)((fVar175 - (fVar253 + fVar253)) * 6.0));
                auVar178 = vshufps_avx(auVar108,auVar108,0);
                auVar108 = ZEXT416((uint)((fVar253 - (fVar175 + fVar175)) * 6.0));
                auVar203 = vshufps_avx(auVar108,auVar108,0);
                auVar36 = vshufps_avx(ZEXT416((uint)(fVar175 * 6.0)),ZEXT416((uint)(fVar175 * 6.0)),
                                      0);
                auVar108 = vdpps_avx(auVar296,auVar296,0x7f);
                auVar153._0_4_ =
                     auVar36._0_4_ * (float)local_c50._0_4_ +
                     auVar203._0_4_ * (float)local_980._0_4_ +
                     auVar209._0_4_ * (float)local_9a0._0_4_ + auVar178._0_4_ * local_c70;
                auVar153._4_4_ =
                     auVar36._4_4_ * (float)local_c50._4_4_ +
                     auVar203._4_4_ * (float)local_980._4_4_ +
                     auVar209._4_4_ * (float)local_9a0._4_4_ + auVar178._4_4_ * fStack_c6c;
                auVar153._8_4_ =
                     auVar36._8_4_ * fStack_c48 +
                     auVar203._8_4_ * fStack_978 +
                     auVar209._8_4_ * fStack_998 + auVar178._8_4_ * fStack_c68;
                auVar153._12_4_ =
                     auVar36._12_4_ * fStack_c44 +
                     auVar203._12_4_ * fStack_974 +
                     auVar209._12_4_ * fStack_994 + auVar178._12_4_ * fStack_c64;
                auVar209 = vblendps_avx(auVar108,_DAT_01f45a50,0xe);
                auVar178 = vrsqrtss_avx(auVar209,auVar209);
                fVar224 = auVar178._0_4_;
                fVar104 = auVar108._0_4_;
                auVar178 = vdpps_avx(auVar296,auVar153,0x7f);
                auVar203 = vshufps_avx(auVar108,auVar108,0);
                auVar154._0_4_ = auVar153._0_4_ * auVar203._0_4_;
                auVar154._4_4_ = auVar153._4_4_ * auVar203._4_4_;
                auVar154._8_4_ = auVar153._8_4_ * auVar203._8_4_;
                auVar154._12_4_ = auVar153._12_4_ * auVar203._12_4_;
                auVar178 = vshufps_avx(auVar178,auVar178,0);
                auVar237._0_4_ = auVar296._0_4_ * auVar178._0_4_;
                auVar237._4_4_ = auVar296._4_4_ * auVar178._4_4_;
                auVar237._8_4_ = auVar296._8_4_ * auVar178._8_4_;
                auVar237._12_4_ = auVar296._12_4_ * auVar178._12_4_;
                auVar36 = vsubps_avx(auVar154,auVar237);
                auVar178 = vrcpss_avx(auVar209,auVar209);
                auVar209 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                      ZEXT416((uint)(auVar421._0_4_ * (float)local_920._0_4_)));
                auVar178 = ZEXT416((uint)(auVar178._0_4_ * (2.0 - fVar104 * auVar178._0_4_)));
                auVar178 = vshufps_avx(auVar178,auVar178,0);
                uVar93 = CONCAT44(auVar296._4_4_,auVar296._0_4_);
                auVar330._0_8_ = uVar93 ^ 0x8000000080000000;
                auVar330._8_4_ = -auVar296._8_4_;
                auVar330._12_4_ = -auVar296._12_4_;
                auVar203 = ZEXT416((uint)(fVar224 * 1.5 +
                                         fVar104 * -0.5 * fVar224 * fVar224 * fVar224));
                auVar203 = vshufps_avx(auVar203,auVar203,0);
                auVar212._0_4_ = auVar203._0_4_ * auVar36._0_4_ * auVar178._0_4_;
                auVar212._4_4_ = auVar203._4_4_ * auVar36._4_4_ * auVar178._4_4_;
                auVar212._8_4_ = auVar203._8_4_ * auVar36._8_4_ * auVar178._8_4_;
                auVar212._12_4_ = auVar203._12_4_ * auVar36._12_4_ * auVar178._12_4_;
                local_b20._0_4_ = auVar296._0_4_ * auVar203._0_4_;
                local_b20._4_4_ = auVar296._4_4_ * auVar203._4_4_;
                local_b20._8_4_ = auVar296._8_4_ * auVar203._8_4_;
                local_b20._12_4_ = auVar296._12_4_ * auVar203._12_4_;
                if (fVar104 < 0.0) {
                  local_b00._0_4_ = fVar223;
                  local_a80._0_16_ = auVar212;
                  fVar104 = sqrtf(fVar104);
                  auVar212 = local_a80._0_16_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar108,auVar108);
                  fVar104 = auVar108._0_4_;
                  local_b00._0_4_ = fVar223;
                }
                auVar108 = vdpps_avx(_local_b60,local_b20._0_16_,0x7f);
                fVar223 = ((float)local_aa0._0_4_ / fVar104) * ((float)local_b00._0_4_ + 1.0) +
                          auVar209._0_4_ + (float)local_b00._0_4_ * (float)local_aa0._0_4_;
                auVar178 = vdpps_avx(auVar330,local_b20._0_16_,0x7f);
                auVar203 = vdpps_avx(_local_b60,auVar212,0x7f);
                auVar36 = vdpps_avx(_local_a30,local_b20._0_16_,0x7f);
                auVar37 = vdpps_avx(_local_b60,auVar330,0x7f);
                fVar104 = auVar178._0_4_ + auVar203._0_4_;
                fVar224 = auVar108._0_4_;
                auVar113._0_4_ = fVar224 * fVar224;
                auVar113._4_4_ = auVar108._4_4_ * auVar108._4_4_;
                auVar113._8_4_ = auVar108._8_4_ * auVar108._8_4_;
                auVar113._12_4_ = auVar108._12_4_ * auVar108._12_4_;
                auVar203 = vsubps_avx(auVar206,auVar113);
                local_b20._0_16_ = ZEXT416((uint)fVar104);
                auVar178 = vdpps_avx(_local_b60,_local_a30,0x7f);
                fVar175 = auVar37._0_4_ - fVar224 * fVar104;
                local_b00._0_16_ = auVar108;
                fVar224 = auVar178._0_4_ - fVar224 * auVar36._0_4_;
                auVar108 = vrsqrtss_avx(auVar203,auVar203);
                fVar225 = auVar203._0_4_;
                fVar104 = auVar108._0_4_;
                fVar104 = fVar104 * 1.5 + fVar225 * -0.5 * fVar104 * fVar104 * fVar104;
                if (fVar225 < 0.0) {
                  local_a80._0_16_ = auVar36;
                  local_800._0_4_ = fVar175;
                  local_940._0_4_ = fVar224;
                  local_a00._0_4_ = fVar104;
                  fVar225 = sqrtf(fVar225);
                  fVar104 = (float)local_a00._0_4_;
                  fVar175 = (float)local_800._0_4_;
                  fVar224 = (float)local_940._0_4_;
                  auVar36 = local_a80._0_16_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar203,auVar203);
                  fVar225 = auVar108._0_4_;
                }
                auVar358 = ZEXT3264(local_a60);
                auVar374 = ZEXT3264(local_b40);
                auVar114 = vpermilps_avx(local_9c0._0_16_,0xff);
                auVar37 = vshufps_avx(auVar296,auVar296,0xff);
                fVar175 = fVar175 * fVar104 - auVar37._0_4_;
                auVar238._0_8_ = auVar36._0_8_ ^ 0x8000000080000000;
                auVar238._8_4_ = auVar36._8_4_ ^ 0x80000000;
                auVar238._12_4_ = auVar36._12_4_ ^ 0x80000000;
                auVar264._0_4_ = -fVar175;
                auVar264._4_4_ = 0x80000000;
                auVar264._8_4_ = 0x80000000;
                auVar264._12_4_ = 0x80000000;
                auVar108 = vinsertps_avx(auVar264,ZEXT416((uint)(fVar224 * fVar104)),0x1c);
                auVar203 = vmovsldup_avx(ZEXT416((uint)(local_b20._0_4_ * fVar224 * fVar104 -
                                                       auVar36._0_4_ * fVar175)));
                auVar108 = vdivps_avx(auVar108,auVar203);
                auVar178 = vinsertps_avx(local_b20._0_16_,auVar238,0x10);
                auVar178 = vdivps_avx(auVar178,auVar203);
                auVar203 = vmovsldup_avx(local_b00._0_16_);
                auVar114 = ZEXT416((uint)(fVar225 - auVar114._0_4_));
                auVar36 = vmovsldup_avx(auVar114);
                auVar181._0_4_ = auVar203._0_4_ * auVar108._0_4_ + auVar36._0_4_ * auVar178._0_4_;
                auVar181._4_4_ = auVar203._4_4_ * auVar108._4_4_ + auVar36._4_4_ * auVar178._4_4_;
                auVar181._8_4_ = auVar203._8_4_ * auVar108._8_4_ + auVar36._8_4_ * auVar178._8_4_;
                auVar181._12_4_ =
                     auVar203._12_4_ * auVar108._12_4_ + auVar36._12_4_ * auVar178._12_4_;
                auVar108 = vsubps_avx(auVar294,auVar181);
                auVar421 = ZEXT1664(auVar108);
                auVar182._8_4_ = 0x7fffffff;
                auVar182._0_8_ = 0x7fffffff7fffffff;
                auVar182._12_4_ = 0x7fffffff;
                auVar294 = vandps_avx(local_b00._0_16_,auVar182);
                auVar302 = ZEXT3264(local_9e0);
              } while (fVar223 <= auVar294._0_4_);
              auVar213._8_4_ = 0x7fffffff;
              auVar213._0_8_ = 0x7fffffff7fffffff;
              auVar213._12_4_ = 0x7fffffff;
              auVar294 = vandps_avx(auVar114,auVar213);
            } while ((float)local_a20._0_4_ * 1.9073486e-06 + auVar209._0_4_ + fVar223 <=
                     auVar294._0_4_);
            fVar223 = auVar108._0_4_ + (float)local_8f0._0_4_;
            if ((fVar198 <= fVar223) &&
               (fVar104 = *(float *)(ray + k * 4 + 0x80), fVar223 <= fVar104)) {
              auVar294 = vmovshdup_avx(auVar108);
              fVar224 = auVar294._0_4_;
              if ((0.0 <= fVar224) && (fVar224 <= 1.0)) {
                auVar206 = vrsqrtss_avx(auVar206,auVar206);
                fVar175 = auVar206._0_4_;
                pGVar19 = (context->scene->geometries).items[uVar96].ptr;
                if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar206 = ZEXT416((uint)(fVar175 * 1.5 +
                                           fVar289 * -0.5 * fVar175 * fVar175 * fVar175));
                  auVar206 = vshufps_avx(auVar206,auVar206,0);
                  auVar214._0_4_ = auVar206._0_4_ * (float)local_b60._0_4_;
                  auVar214._4_4_ = auVar206._4_4_ * (float)local_b60._4_4_;
                  auVar214._8_4_ = auVar206._8_4_ * fStack_b58;
                  auVar214._12_4_ = auVar206._12_4_ * fStack_b54;
                  auVar155._0_4_ = auVar296._0_4_ + auVar37._0_4_ * auVar214._0_4_;
                  auVar155._4_4_ = auVar296._4_4_ + auVar37._4_4_ * auVar214._4_4_;
                  auVar155._8_4_ = auVar296._8_4_ + auVar37._8_4_ * auVar214._8_4_;
                  auVar155._12_4_ = auVar296._12_4_ + auVar37._12_4_ * auVar214._12_4_;
                  auVar206 = vshufps_avx(auVar214,auVar214,0xc9);
                  auVar294 = vshufps_avx(auVar296,auVar296,0xc9);
                  auVar215._0_4_ = auVar294._0_4_ * auVar214._0_4_;
                  auVar215._4_4_ = auVar294._4_4_ * auVar214._4_4_;
                  auVar215._8_4_ = auVar294._8_4_ * auVar214._8_4_;
                  auVar215._12_4_ = auVar294._12_4_ * auVar214._12_4_;
                  auVar239._0_4_ = auVar296._0_4_ * auVar206._0_4_;
                  auVar239._4_4_ = auVar296._4_4_ * auVar206._4_4_;
                  auVar239._8_4_ = auVar296._8_4_ * auVar206._8_4_;
                  auVar239._12_4_ = auVar296._12_4_ * auVar206._12_4_;
                  auVar209 = vsubps_avx(auVar239,auVar215);
                  auVar206 = vshufps_avx(auVar209,auVar209,0xc9);
                  auVar294 = vshufps_avx(auVar155,auVar155,0xc9);
                  auVar240._0_4_ = auVar294._0_4_ * auVar206._0_4_;
                  auVar240._4_4_ = auVar294._4_4_ * auVar206._4_4_;
                  auVar240._8_4_ = auVar294._8_4_ * auVar206._8_4_;
                  auVar240._12_4_ = auVar294._12_4_ * auVar206._12_4_;
                  auVar206 = vshufps_avx(auVar209,auVar209,0xd2);
                  auVar156._0_4_ = auVar155._0_4_ * auVar206._0_4_;
                  auVar156._4_4_ = auVar155._4_4_ * auVar206._4_4_;
                  auVar156._8_4_ = auVar155._8_4_ * auVar206._8_4_;
                  auVar156._12_4_ = auVar155._12_4_ * auVar206._12_4_;
                  auVar206 = vsubps_avx(auVar240,auVar156);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar223;
                    uVar8 = vextractps_avx(auVar206,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                    uVar8 = vextractps_avx(auVar206,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                    *(int *)(ray + k * 4 + 0xe0) = auVar206._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar224;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_ac8;
                    *(uint *)(ray + k * 4 + 0x120) = uVar96;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_790 = vshufps_avx(auVar108,auVar108,0x55);
                    auVar294 = vshufps_avx(auVar206,auVar206,0x55);
                    auStack_7b0 = vshufps_avx(auVar206,auVar206,0xaa);
                    local_7a0 = vshufps_avx(auVar206,auVar206,0);
                    local_7c0 = (RTCHitN  [16])auVar294;
                    local_780 = ZEXT816(0) << 0x20;
                    local_770 = local_7e0._0_8_;
                    uStack_768 = local_7e0._8_8_;
                    local_760 = local_7d0;
                    vcmpps_avx(ZEXT1632(local_7d0),ZEXT1632(local_7d0),0xf);
                    uStack_74c = context->user->instID[0];
                    local_750 = uStack_74c;
                    uStack_748 = uStack_74c;
                    uStack_744 = uStack_74c;
                    uVar100 = context->user->instPrimID[0];
                    auVar157._4_4_ = uVar100;
                    auVar157._0_4_ = uVar100;
                    auVar157._8_4_ = uVar100;
                    auVar157._12_4_ = uVar100;
                    auStack_740 = auVar157;
                    *(float *)(ray + k * 4 + 0x80) = fVar223;
                    local_8e0 = *local_ad0;
                    local_b90.valid = (int *)local_8e0;
                    local_b90.geometryUserPtr = pGVar19->userPtr;
                    local_b90.context = context->user;
                    local_b90.hit = local_7c0;
                    local_b90.N = 4;
                    local_b90.ray = (RTCRayN *)ray;
                    if (pGVar19->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar19->intersectionFilterN)(&local_b90);
                      auVar302._8_56_ = extraout_var_00;
                      auVar302._0_8_ = extraout_XMM1_Qa_00;
                      auVar157 = auVar302._0_16_;
                      auVar302 = ZEXT3264(local_9e0);
                      auVar374 = ZEXT3264(local_b40);
                      auVar358 = ZEXT3264(local_a60);
                    }
                    if (local_8e0 == (undefined1  [16])0x0) {
                      auVar206 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar294 = vpcmpeqd_avx(auVar157,auVar157);
                      auVar206 = auVar206 ^ auVar294;
                    }
                    else {
                      p_Var24 = context->args->filter;
                      auVar294 = vpcmpeqd_avx(auVar294,auVar294);
                      if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var24)(&local_b90);
                        auVar302 = ZEXT3264(local_9e0);
                        auVar374 = ZEXT3264(local_b40);
                        auVar358 = ZEXT3264(local_a60);
                        auVar294 = vpcmpeqd_avx(auVar294,auVar294);
                      }
                      auVar209 = vpcmpeqd_avx(local_8e0,_DAT_01f45a50);
                      auVar206 = auVar209 ^ auVar294;
                      if (local_8e0 != (undefined1  [16])0x0) {
                        auVar209 = auVar209 ^ auVar294;
                        auVar294 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])local_b90.hit);
                        *(undefined1 (*) [16])(local_b90.ray + 0xc0) = auVar294;
                        auVar294 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                            (local_b90.hit + 0x10));
                        *(undefined1 (*) [16])(local_b90.ray + 0xd0) = auVar294;
                        auVar294 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                            (local_b90.hit + 0x20));
                        *(undefined1 (*) [16])(local_b90.ray + 0xe0) = auVar294;
                        auVar294 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                            (local_b90.hit + 0x30));
                        *(undefined1 (*) [16])(local_b90.ray + 0xf0) = auVar294;
                        auVar294 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                            (local_b90.hit + 0x40));
                        *(undefined1 (*) [16])(local_b90.ray + 0x100) = auVar294;
                        auVar294 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                            (local_b90.hit + 0x50));
                        *(undefined1 (*) [16])(local_b90.ray + 0x110) = auVar294;
                        auVar294 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                            (local_b90.hit + 0x60));
                        *(undefined1 (*) [16])(local_b90.ray + 0x120) = auVar294;
                        auVar294 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                            (local_b90.hit + 0x70));
                        *(undefined1 (*) [16])(local_b90.ray + 0x130) = auVar294;
                        auVar294 = vmaskmovps_avx(auVar209,*(undefined1 (*) [16])
                                                            (local_b90.hit + 0x80));
                        *(undefined1 (*) [16])(local_b90.ray + 0x140) = auVar294;
                      }
                    }
                    auVar115._8_8_ = 0x100000001;
                    auVar115._0_8_ = 0x100000001;
                    if ((auVar115 & auVar206) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar104;
                    }
                  }
                }
              }
            }
LAB_00a9f6ec:
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar339._4_4_ = uVar8;
            auVar339._0_4_ = uVar8;
            auVar339._8_4_ = uVar8;
            auVar339._12_4_ = uVar8;
            auVar339._16_4_ = uVar8;
            auVar339._20_4_ = uVar8;
            auVar339._24_4_ = uVar8;
            auVar339._28_4_ = uVar8;
            auVar421 = ZEXT3264(auVar339);
            auVar183 = vcmpps_avx(_local_820,auVar339,2);
          }
          auVar183 = vandps_avx(local_680,local_660);
          auVar126 = vandps_avx(local_860,_local_840);
          auVar190._0_4_ = (float)local_8c0._0_4_ + local_500._0_4_;
          auVar190._4_4_ = (float)local_8c0._4_4_ + local_500._4_4_;
          auVar190._8_4_ = fStack_8b8 + local_500._8_4_;
          auVar190._12_4_ = fStack_8b4 + local_500._12_4_;
          auVar190._16_4_ = fStack_8b0 + local_500._16_4_;
          auVar190._20_4_ = fStack_8ac + local_500._20_4_;
          auVar190._24_4_ = fStack_8a8 + local_500._24_4_;
          auVar190._28_4_ = fStack_8a4 + local_500._28_4_;
          auVar206 = vshufps_avx(auVar421._0_16_,auVar421._0_16_,0);
          auVar251._16_16_ = auVar206;
          auVar251._0_16_ = auVar206;
          auVar25 = vcmpps_avx(auVar190,auVar251,2);
          auVar183 = vandps_avx(auVar25,auVar183);
          auVar275._0_4_ = (float)local_8c0._0_4_ + local_4c0._0_4_;
          auVar275._4_4_ = (float)local_8c0._4_4_ + local_4c0._4_4_;
          auVar275._8_4_ = fStack_8b8 + local_4c0._8_4_;
          auVar275._12_4_ = fStack_8b4 + local_4c0._12_4_;
          auVar275._16_4_ = fStack_8b0 + local_4c0._16_4_;
          auVar275._20_4_ = fStack_8ac + local_4c0._20_4_;
          auVar275._24_4_ = fStack_8a8 + local_4c0._24_4_;
          auVar275._28_4_ = fStack_8a4 + local_4c0._28_4_;
          auVar25 = vcmpps_avx(auVar275,auVar251,2);
          auVar126 = vandps_avx(auVar25,auVar126);
          auVar126 = vorps_avx(auVar183,auVar126);
          if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar126 >> 0x7f,0) != '\0') ||
                (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar126 >> 0xbf,0) != '\0') ||
              (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar126[0x1f] < '\0') {
            uVar94 = (ulong)uVar99;
            *(undefined1 (*) [32])(auStack_180 + uVar94 * 0x60) = auVar126;
            auVar183 = vblendvps_avx(_local_4c0,_local_500,auVar183);
            *(undefined1 (*) [32])(auStack_160 + uVar94 * 0x60) = auVar183;
            uVar93 = vmovlps_avx(local_630);
            (&uStack_140)[uVar94 * 0xc] = uVar93;
            auStack_138[uVar94 * 0x18] = uVar98 + 1;
            uVar99 = uVar99 + 1;
          }
          auVar421 = ZEXT3264(local_960);
          fVar289 = (float)local_8c0._0_4_;
          fVar397 = (float)local_8c0._4_4_;
          fVar193 = fStack_8b8;
          fVar194 = fStack_8b4;
          fVar195 = fStack_8b0;
          fVar196 = fStack_8ac;
          fVar197 = fStack_8a8;
          fVar292 = fStack_8a4;
          goto LAB_00a9e16f;
        }
      }
      auVar358 = ZEXT3264(local_a60);
      auVar421 = ZEXT3264(local_960);
      auVar374 = ZEXT3264(local_b40);
      auVar302 = ZEXT3264(local_9e0);
    }
LAB_00a9e16f:
    do {
      uVar100 = uVar99;
      auVar298 = local_5c0;
      if (uVar100 == 0) {
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar131._4_4_ = uVar8;
        auVar131._0_4_ = uVar8;
        auVar131._8_4_ = uVar8;
        auVar131._12_4_ = uVar8;
        auVar131._16_4_ = uVar8;
        auVar131._20_4_ = uVar8;
        auVar131._24_4_ = uVar8;
        auVar131._28_4_ = uVar8;
        auVar183 = vcmpps_avx(local_420,auVar131,2);
        uVar96 = vmovmskps_avx(auVar183);
        uVar96 = (uint)local_8c8 - 1 & (uint)local_8c8 & uVar96;
        goto LAB_00a9cfa5;
      }
      uVar93 = (ulong)(uVar100 - 1);
      lVar95 = uVar93 * 0x60;
      auVar183 = *(undefined1 (*) [32])(auStack_160 + lVar95);
      auVar125._0_4_ = fVar289 + auVar183._0_4_;
      auVar125._4_4_ = fVar397 + auVar183._4_4_;
      auVar125._8_4_ = fVar193 + auVar183._8_4_;
      auVar125._12_4_ = fVar194 + auVar183._12_4_;
      auVar125._16_4_ = fVar195 + auVar183._16_4_;
      auVar125._20_4_ = fVar196 + auVar183._20_4_;
      auVar125._24_4_ = fVar197 + auVar183._24_4_;
      auVar125._28_4_ = fVar292 + auVar183._28_4_;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar221._4_4_ = uVar8;
      auVar221._0_4_ = uVar8;
      auVar221._8_4_ = uVar8;
      auVar221._12_4_ = uVar8;
      auVar221._16_4_ = uVar8;
      auVar221._20_4_ = uVar8;
      auVar221._24_4_ = uVar8;
      auVar221._28_4_ = uVar8;
      auVar25 = vcmpps_avx(auVar125,auVar221,2);
      auVar126 = vandps_avx(auVar25,*(undefined1 (*) [32])(auStack_180 + lVar95));
      _local_7c0 = auVar126;
      auVar25 = *(undefined1 (*) [32])(auStack_180 + lVar95) & auVar25;
      uVar99 = uVar100 - 1;
    } while ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar25 >> 0x7f,0) == '\0') &&
               (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar25 >> 0xbf,0) == '\0') &&
             (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             -1 < auVar25[0x1f]);
    auVar188._8_4_ = 0x7f800000;
    auVar188._0_8_ = 0x7f8000007f800000;
    auVar188._12_4_ = 0x7f800000;
    auVar188._16_4_ = 0x7f800000;
    auVar188._20_4_ = 0x7f800000;
    auVar188._24_4_ = 0x7f800000;
    auVar188._28_4_ = 0x7f800000;
    auVar183 = vblendvps_avx(auVar188,auVar183,auVar126);
    auVar25 = vshufps_avx(auVar183,auVar183,0xb1);
    auVar25 = vminps_avx(auVar183,auVar25);
    auVar26 = vshufpd_avx(auVar25,auVar25,5);
    auVar25 = vminps_avx(auVar25,auVar26);
    auVar26 = vperm2f128_avx(auVar25,auVar25,1);
    auVar25 = vminps_avx(auVar25,auVar26);
    auVar183 = vcmpps_avx(auVar183,auVar25,0);
    auVar25 = auVar126 & auVar183;
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0x7f,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0xbf,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0')
    {
      auVar126 = vandps_avx(auVar183,auVar126);
    }
    auVar145._8_8_ = 0;
    auVar145._0_8_ = (&uStack_140)[uVar93 * 0xc];
    uVar98 = auStack_138[uVar93 * 0x18];
    uVar99 = vmovmskps_avx(auVar126);
    uVar92 = 0;
    if (uVar99 != 0) {
      for (; (uVar99 >> uVar92 & 1) == 0; uVar92 = uVar92 + 1) {
      }
    }
    *(undefined4 *)(local_7c0 + (ulong)uVar92 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar95) = _local_7c0;
    uVar99 = uVar100 - 1;
    if ((((((((_local_7c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_7c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_7c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_7c0 >> 0x7f,0) != '\0') ||
          (_local_7c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_7c0 >> 0xbf,0) != '\0') ||
        (_local_7c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_7c0[0x1f] < '\0') {
      uVar99 = uVar100;
    }
    auVar206 = vshufps_avx(auVar145,auVar145,0);
    auVar294 = vshufps_avx(auVar145,auVar145,0x55);
    auVar294 = vsubps_avx(auVar294,auVar206);
    local_500._4_4_ = auVar206._4_4_ + auVar294._4_4_ * 0.14285715;
    local_500._0_4_ = auVar206._0_4_ + auVar294._0_4_ * 0.0;
    fStack_4f8 = auVar206._8_4_ + auVar294._8_4_ * 0.2857143;
    fStack_4f4 = auVar206._12_4_ + auVar294._12_4_ * 0.42857146;
    fStack_4f0 = auVar206._0_4_ + auVar294._0_4_ * 0.5714286;
    fStack_4ec = auVar206._4_4_ + auVar294._4_4_ * 0.71428573;
    fStack_4e8 = auVar206._8_4_ + auVar294._8_4_ * 0.8571429;
    fStack_4e4 = auVar206._12_4_ + auVar294._12_4_;
    local_630._8_8_ = 0;
    local_630._0_8_ = *(ulong *)(local_500 + (ulong)uVar92 * 4);
    auVar373 = auVar374._0_32_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }